

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersectorK<8,4>::
     intersect_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  Geometry *pGVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  uint uVar73;
  ulong uVar74;
  ulong uVar75;
  long lVar76;
  ulong uVar77;
  uint uVar78;
  uint uVar79;
  undefined4 uVar80;
  undefined8 unaff_R13;
  uint uVar81;
  bool bVar82;
  float fVar83;
  float fVar114;
  float fVar116;
  __m128 a;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar118;
  undefined1 auVar101 [32];
  float fVar84;
  undefined1 auVar102 [32];
  float fVar115;
  float fVar117;
  float fVar119;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar113 [32];
  float fVar123;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar156;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar155;
  float fVar157;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar171;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar172;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar162 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar200;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [28];
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar226;
  float fVar228;
  undefined1 auVar212 [32];
  float fVar225;
  float fVar227;
  float fVar229;
  undefined1 auVar213 [32];
  float fVar230;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar231;
  float fVar232;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [28];
  float fVar251;
  float fVar253;
  float fVar257;
  float fVar259;
  undefined1 auVar239 [32];
  float fVar252;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar258;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float fVar263;
  float fVar281;
  float fVar285;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [28];
  float fVar293;
  float fVar297;
  undefined1 auVar273 [32];
  float fVar289;
  float fVar301;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar282;
  float fVar283;
  float fVar286;
  float fVar287;
  float fVar290;
  float fVar291;
  float fVar294;
  float fVar295;
  float fVar298;
  float fVar299;
  float fVar302;
  float fVar303;
  float fVar305;
  undefined1 auVar276 [32];
  float fVar284;
  float fVar288;
  float fVar292;
  float fVar296;
  float fVar300;
  float fVar304;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [64];
  undefined1 auVar313 [32];
  undefined1 auVar306 [16];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar317 [64];
  undefined1 auVar318 [16];
  float fVar324;
  float fVar325;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar333 [32];
  float fVar331;
  undefined1 auVar334 [32];
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  undefined1 auVar332 [32];
  undefined1 auVar335 [64];
  float fVar342;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar352;
  float fVar353;
  float fVar354;
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  float fVar351;
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar356 [16];
  float fVar355;
  float fVar362;
  float fVar363;
  float fVar365;
  float fVar366;
  float fVar367;
  float in_register_0000151c;
  undefined1 auVar357 [32];
  float fVar364;
  float fVar368;
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [64];
  float fVar369;
  float fVar370;
  undefined1 auVar371 [16];
  float fVar374;
  float fVar376;
  float fVar380;
  float fVar382;
  float fVar384;
  undefined1 auVar372 [32];
  float fVar375;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar381;
  float fVar383;
  float fVar385;
  float fVar386;
  undefined1 auVar373 [32];
  float in_register_0000159c;
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [16];
  undefined1 auVar392 [28];
  float in_register_000015dc;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c68;
  float local_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  float local_b40;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float local_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 (*local_a28) [16];
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  Primitive *local_8a8;
  ulong local_8a0;
  undefined1 auStack_898 [24];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  RTCHitN local_760 [16];
  undefined1 auStack_750 [16];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined8 local_710;
  undefined8 uStack_708;
  undefined1 local_700 [16];
  uint local_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  undefined1 auStack_6e0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined4 uStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5d0 [16];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar6 = prim[1];
  uVar74 = (ulong)(byte)PVar6;
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar126 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar126 = vinsertps_avx(auVar126,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar16 = vsubps_avx(auVar16,*(undefined1 (*) [16])(prim + uVar74 * 0x19 + 6));
  fVar200 = *(float *)(prim + uVar74 * 0x19 + 0x12);
  auVar124._0_4_ = fVar200 * auVar16._0_4_;
  auVar124._4_4_ = fVar200 * auVar16._4_4_;
  auVar124._8_4_ = fVar200 * auVar16._8_4_;
  auVar124._12_4_ = fVar200 * auVar16._12_4_;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 4 + 6)));
  auVar267._0_4_ = fVar200 * auVar126._0_4_;
  auVar267._4_4_ = fVar200 * auVar126._4_4_;
  auVar267._8_4_ = fVar200 * auVar126._8_4_;
  auVar267._12_4_ = fVar200 * auVar126._12_4_;
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 4 + 10)));
  auVar97._16_16_ = auVar126;
  auVar97._0_16_ = auVar16;
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 5 + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 5 + 10)));
  auVar163._16_16_ = auVar126;
  auVar163._0_16_ = auVar16;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 6 + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 6 + 10)));
  auVar108 = vcvtdq2ps_avx(auVar163);
  auVar191._16_16_ = auVar126;
  auVar191._0_16_ = auVar16;
  auVar10 = vcvtdq2ps_avx(auVar191);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0xb + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0xb + 10)));
  auVar192._16_16_ = auVar126;
  auVar192._0_16_ = auVar16;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0xc + 6)));
  auVar11 = vcvtdq2ps_avx(auVar192);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0xc + 10)));
  auVar239._16_16_ = auVar126;
  auVar239._0_16_ = auVar16;
  auVar12 = vcvtdq2ps_avx(auVar239);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0xd + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0xd + 10)));
  auVar307._16_16_ = auVar126;
  auVar307._0_16_ = auVar16;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x12 + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x12 + 10)));
  auVar13 = vcvtdq2ps_avx(auVar307);
  auVar308._16_16_ = auVar126;
  auVar308._0_16_ = auVar16;
  auVar14 = vcvtdq2ps_avx(auVar308);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x13 + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x13 + 10)));
  auVar326._16_16_ = auVar126;
  auVar326._0_16_ = auVar16;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x14 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar326);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x14 + 10)));
  auVar332._16_16_ = auVar126;
  auVar332._0_16_ = auVar16;
  auVar214 = vcvtdq2ps_avx(auVar332);
  auVar16 = vshufps_avx(auVar267,auVar267,0);
  auVar126 = vshufps_avx(auVar267,auVar267,0x55);
  auVar20 = vshufps_avx(auVar267,auVar267,0xaa);
  fVar200 = auVar20._0_4_;
  fVar231 = auVar20._4_4_;
  fVar221 = auVar20._8_4_;
  fVar251 = auVar20._12_4_;
  fVar222 = auVar126._0_4_;
  fVar253 = auVar126._4_4_;
  fVar223 = auVar126._8_4_;
  fVar255 = auVar126._12_4_;
  fVar224 = auVar16._0_4_;
  fVar257 = auVar16._4_4_;
  fVar226 = auVar16._8_4_;
  fVar259 = auVar16._12_4_;
  auVar357._0_4_ = fVar224 * auVar97._0_4_ + fVar222 * auVar108._0_4_ + fVar200 * auVar10._0_4_;
  auVar357._4_4_ = fVar257 * auVar97._4_4_ + fVar253 * auVar108._4_4_ + fVar231 * auVar10._4_4_;
  auVar357._8_4_ = fVar226 * auVar97._8_4_ + fVar223 * auVar108._8_4_ + fVar221 * auVar10._8_4_;
  auVar357._12_4_ = fVar259 * auVar97._12_4_ + fVar255 * auVar108._12_4_ + fVar251 * auVar10._12_4_;
  auVar357._16_4_ = fVar224 * auVar97._16_4_ + fVar222 * auVar108._16_4_ + fVar200 * auVar10._16_4_;
  auVar357._20_4_ = fVar257 * auVar97._20_4_ + fVar253 * auVar108._20_4_ + fVar231 * auVar10._20_4_;
  auVar357._24_4_ = fVar226 * auVar97._24_4_ + fVar223 * auVar108._24_4_ + fVar221 * auVar10._24_4_;
  auVar357._28_4_ = fVar255 + in_register_000015dc + in_register_0000151c;
  auVar343._0_4_ = fVar224 * auVar11._0_4_ + fVar222 * auVar12._0_4_ + auVar13._0_4_ * fVar200;
  auVar343._4_4_ = fVar257 * auVar11._4_4_ + fVar253 * auVar12._4_4_ + auVar13._4_4_ * fVar231;
  auVar343._8_4_ = fVar226 * auVar11._8_4_ + fVar223 * auVar12._8_4_ + auVar13._8_4_ * fVar221;
  auVar343._12_4_ = fVar259 * auVar11._12_4_ + fVar255 * auVar12._12_4_ + auVar13._12_4_ * fVar251;
  auVar343._16_4_ = fVar224 * auVar11._16_4_ + fVar222 * auVar12._16_4_ + auVar13._16_4_ * fVar200;
  auVar343._20_4_ = fVar257 * auVar11._20_4_ + fVar253 * auVar12._20_4_ + auVar13._20_4_ * fVar231;
  auVar343._24_4_ = fVar226 * auVar11._24_4_ + fVar223 * auVar12._24_4_ + auVar13._24_4_ * fVar221;
  auVar343._28_4_ = fVar255 + in_register_000015dc + in_register_0000159c;
  auVar273._0_4_ = fVar224 * auVar14._0_4_ + fVar222 * auVar15._0_4_ + auVar214._0_4_ * fVar200;
  auVar273._4_4_ = fVar257 * auVar14._4_4_ + fVar253 * auVar15._4_4_ + auVar214._4_4_ * fVar231;
  auVar273._8_4_ = fVar226 * auVar14._8_4_ + fVar223 * auVar15._8_4_ + auVar214._8_4_ * fVar221;
  auVar273._12_4_ = fVar259 * auVar14._12_4_ + fVar255 * auVar15._12_4_ + auVar214._12_4_ * fVar251;
  auVar273._16_4_ = fVar224 * auVar14._16_4_ + fVar222 * auVar15._16_4_ + auVar214._16_4_ * fVar200;
  auVar273._20_4_ = fVar257 * auVar14._20_4_ + fVar253 * auVar15._20_4_ + auVar214._20_4_ * fVar231;
  auVar273._24_4_ = fVar226 * auVar14._24_4_ + fVar223 * auVar15._24_4_ + auVar214._24_4_ * fVar221;
  auVar273._28_4_ = fVar259 + fVar255 + fVar251;
  auVar16 = vshufps_avx(auVar124,auVar124,0);
  auVar126 = vshufps_avx(auVar124,auVar124,0x55);
  auVar20 = vshufps_avx(auVar124,auVar124,0xaa);
  fVar231 = auVar20._0_4_;
  fVar221 = auVar20._4_4_;
  fVar251 = auVar20._8_4_;
  fVar222 = auVar20._12_4_;
  fVar257 = auVar126._0_4_;
  fVar226 = auVar126._4_4_;
  fVar259 = auVar126._8_4_;
  fVar228 = auVar126._12_4_;
  fVar253 = auVar16._0_4_;
  fVar223 = auVar16._4_4_;
  fVar255 = auVar16._8_4_;
  fVar224 = auVar16._12_4_;
  fVar200 = auVar97._28_4_;
  auVar140._0_4_ = fVar253 * auVar97._0_4_ + fVar257 * auVar108._0_4_ + fVar231 * auVar10._0_4_;
  auVar140._4_4_ = fVar223 * auVar97._4_4_ + fVar226 * auVar108._4_4_ + fVar221 * auVar10._4_4_;
  auVar140._8_4_ = fVar255 * auVar97._8_4_ + fVar259 * auVar108._8_4_ + fVar251 * auVar10._8_4_;
  auVar140._12_4_ = fVar224 * auVar97._12_4_ + fVar228 * auVar108._12_4_ + fVar222 * auVar10._12_4_;
  auVar140._16_4_ = fVar253 * auVar97._16_4_ + fVar257 * auVar108._16_4_ + fVar231 * auVar10._16_4_;
  auVar140._20_4_ = fVar223 * auVar97._20_4_ + fVar226 * auVar108._20_4_ + fVar221 * auVar10._20_4_;
  auVar140._24_4_ = fVar255 * auVar97._24_4_ + fVar259 * auVar108._24_4_ + fVar251 * auVar10._24_4_;
  auVar140._28_4_ = fVar200 + auVar108._28_4_ + auVar10._28_4_;
  auVar193._0_4_ = fVar253 * auVar11._0_4_ + auVar13._0_4_ * fVar231 + fVar257 * auVar12._0_4_;
  auVar193._4_4_ = fVar223 * auVar11._4_4_ + auVar13._4_4_ * fVar221 + fVar226 * auVar12._4_4_;
  auVar193._8_4_ = fVar255 * auVar11._8_4_ + auVar13._8_4_ * fVar251 + fVar259 * auVar12._8_4_;
  auVar193._12_4_ = fVar224 * auVar11._12_4_ + auVar13._12_4_ * fVar222 + fVar228 * auVar12._12_4_;
  auVar193._16_4_ = fVar253 * auVar11._16_4_ + auVar13._16_4_ * fVar231 + fVar257 * auVar12._16_4_;
  auVar193._20_4_ = fVar223 * auVar11._20_4_ + auVar13._20_4_ * fVar221 + fVar226 * auVar12._20_4_;
  auVar193._24_4_ = fVar255 * auVar11._24_4_ + auVar13._24_4_ * fVar251 + fVar259 * auVar12._24_4_;
  auVar193._28_4_ = fVar200 + auVar13._28_4_ + auVar10._28_4_;
  auVar309._8_4_ = 0x7fffffff;
  auVar309._0_8_ = 0x7fffffff7fffffff;
  auVar309._12_4_ = 0x7fffffff;
  auVar309._16_4_ = 0x7fffffff;
  auVar309._20_4_ = 0x7fffffff;
  auVar309._24_4_ = 0x7fffffff;
  auVar309._28_4_ = 0x7fffffff;
  auVar164._0_4_ = fVar253 * auVar14._0_4_ + fVar257 * auVar15._0_4_ + auVar214._0_4_ * fVar231;
  auVar164._4_4_ = fVar223 * auVar14._4_4_ + fVar226 * auVar15._4_4_ + auVar214._4_4_ * fVar221;
  auVar164._8_4_ = fVar255 * auVar14._8_4_ + fVar259 * auVar15._8_4_ + auVar214._8_4_ * fVar251;
  auVar164._12_4_ = fVar224 * auVar14._12_4_ + fVar228 * auVar15._12_4_ + auVar214._12_4_ * fVar222;
  auVar164._16_4_ = fVar253 * auVar14._16_4_ + fVar257 * auVar15._16_4_ + auVar214._16_4_ * fVar231;
  auVar164._20_4_ = fVar223 * auVar14._20_4_ + fVar226 * auVar15._20_4_ + auVar214._20_4_ * fVar221;
  auVar164._24_4_ = fVar255 * auVar14._24_4_ + fVar259 * auVar15._24_4_ + auVar214._24_4_ * fVar251;
  auVar164._28_4_ = fVar200 + auVar12._28_4_ + fVar222;
  auVar97 = vandps_avx(auVar357,auVar309);
  auVar319._8_4_ = 0x219392ef;
  auVar319._0_8_ = 0x219392ef219392ef;
  auVar319._12_4_ = 0x219392ef;
  auVar319._16_4_ = 0x219392ef;
  auVar319._20_4_ = 0x219392ef;
  auVar319._24_4_ = 0x219392ef;
  auVar319._28_4_ = 0x219392ef;
  auVar97 = vcmpps_avx(auVar97,auVar319,1);
  auVar108 = vblendvps_avx(auVar357,auVar319,auVar97);
  auVar97 = vandps_avx(auVar343,auVar309);
  auVar97 = vcmpps_avx(auVar97,auVar319,1);
  auVar10 = vblendvps_avx(auVar343,auVar319,auVar97);
  auVar97 = vandps_avx(auVar273,auVar309);
  auVar97 = vcmpps_avx(auVar97,auVar319,1);
  auVar11 = vrcpps_avx(auVar108);
  auVar97 = vblendvps_avx(auVar273,auVar319,auVar97);
  auVar327._8_4_ = 0x3f800000;
  auVar327._0_8_ = 0x3f8000003f800000;
  auVar327._12_4_ = 0x3f800000;
  auVar327._16_4_ = 0x3f800000;
  auVar327._20_4_ = 0x3f800000;
  auVar327._24_4_ = 0x3f800000;
  auVar327._28_4_ = 0x3f800000;
  fVar200 = auVar11._0_4_;
  fVar221 = auVar11._4_4_;
  auVar12._4_4_ = auVar108._4_4_ * fVar221;
  auVar12._0_4_ = auVar108._0_4_ * fVar200;
  fVar222 = auVar11._8_4_;
  auVar12._8_4_ = auVar108._8_4_ * fVar222;
  fVar223 = auVar11._12_4_;
  auVar12._12_4_ = auVar108._12_4_ * fVar223;
  fVar224 = auVar11._16_4_;
  auVar12._16_4_ = auVar108._16_4_ * fVar224;
  fVar226 = auVar11._20_4_;
  auVar12._20_4_ = auVar108._20_4_ * fVar226;
  fVar228 = auVar11._24_4_;
  auVar12._24_4_ = auVar108._24_4_ * fVar228;
  auVar12._28_4_ = auVar108._28_4_;
  auVar108 = vsubps_avx(auVar327,auVar12);
  fVar200 = fVar200 + fVar200 * auVar108._0_4_;
  fVar221 = fVar221 + fVar221 * auVar108._4_4_;
  fVar222 = fVar222 + fVar222 * auVar108._8_4_;
  fVar223 = fVar223 + fVar223 * auVar108._12_4_;
  fVar224 = fVar224 + fVar224 * auVar108._16_4_;
  fVar226 = fVar226 + fVar226 * auVar108._20_4_;
  fVar228 = fVar228 + fVar228 * auVar108._24_4_;
  auVar108 = vrcpps_avx(auVar10);
  fVar263 = auVar108._0_4_;
  fVar281 = auVar108._4_4_;
  auVar11._4_4_ = fVar281 * auVar10._4_4_;
  auVar11._0_4_ = fVar263 * auVar10._0_4_;
  fVar285 = auVar108._8_4_;
  auVar11._8_4_ = fVar285 * auVar10._8_4_;
  fVar289 = auVar108._12_4_;
  auVar11._12_4_ = fVar289 * auVar10._12_4_;
  fVar293 = auVar108._16_4_;
  auVar11._16_4_ = fVar293 * auVar10._16_4_;
  fVar297 = auVar108._20_4_;
  auVar11._20_4_ = fVar297 * auVar10._20_4_;
  fVar301 = auVar108._24_4_;
  auVar11._24_4_ = fVar301 * auVar10._24_4_;
  auVar11._28_4_ = auVar10._28_4_;
  auVar11 = vsubps_avx(auVar327,auVar11);
  auVar10 = vrcpps_avx(auVar97);
  fVar263 = fVar263 + fVar263 * auVar11._0_4_;
  fVar281 = fVar281 + fVar281 * auVar11._4_4_;
  fVar285 = fVar285 + fVar285 * auVar11._8_4_;
  fVar289 = fVar289 + fVar289 * auVar11._12_4_;
  fVar293 = fVar293 + fVar293 * auVar11._16_4_;
  fVar297 = fVar297 + fVar297 * auVar11._20_4_;
  fVar301 = fVar301 + fVar301 * auVar11._24_4_;
  fVar231 = auVar10._0_4_;
  fVar251 = auVar10._4_4_;
  auVar13._4_4_ = auVar97._4_4_ * fVar251;
  auVar13._0_4_ = auVar97._0_4_ * fVar231;
  fVar253 = auVar10._8_4_;
  auVar13._8_4_ = auVar97._8_4_ * fVar253;
  fVar255 = auVar10._12_4_;
  auVar13._12_4_ = auVar97._12_4_ * fVar255;
  fVar257 = auVar10._16_4_;
  auVar13._16_4_ = auVar97._16_4_ * fVar257;
  fVar259 = auVar10._20_4_;
  auVar13._20_4_ = auVar97._20_4_ * fVar259;
  fVar261 = auVar10._24_4_;
  auVar13._24_4_ = auVar97._24_4_ * fVar261;
  auVar13._28_4_ = auVar108._28_4_;
  auVar97 = vsubps_avx(auVar327,auVar13);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar74 * 7 + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  fVar231 = fVar231 + fVar231 * auVar97._0_4_;
  fVar251 = fVar251 + fVar251 * auVar97._4_4_;
  fVar253 = fVar253 + fVar253 * auVar97._8_4_;
  fVar255 = fVar255 + fVar255 * auVar97._12_4_;
  fVar257 = fVar257 + fVar257 * auVar97._16_4_;
  fVar259 = fVar259 + fVar259 * auVar97._20_4_;
  fVar261 = fVar261 + fVar261 * auVar97._24_4_;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = *(ulong *)(prim + uVar74 * 7 + 0xe);
  auVar126 = vpmovsxwd_avx(auVar126);
  auVar98._16_16_ = auVar126;
  auVar98._0_16_ = auVar16;
  auVar97 = vcvtdq2ps_avx(auVar98);
  auVar97 = vsubps_avx(auVar97,auVar140);
  auVar85._0_4_ = fVar200 * auVar97._0_4_;
  auVar85._4_4_ = fVar221 * auVar97._4_4_;
  auVar85._8_4_ = fVar222 * auVar97._8_4_;
  auVar85._12_4_ = fVar223 * auVar97._12_4_;
  auVar10._16_4_ = fVar224 * auVar97._16_4_;
  auVar10._0_16_ = auVar85;
  auVar10._20_4_ = fVar226 * auVar97._20_4_;
  auVar10._24_4_ = fVar228 * auVar97._24_4_;
  auVar10._28_4_ = auVar97._28_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar74 * 9 + 6);
  auVar16 = vpmovsxwd_avx(auVar20);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar74 * 9 + 0xe);
  auVar126 = vpmovsxwd_avx(auVar2);
  auVar310._16_16_ = auVar126;
  auVar310._0_16_ = auVar16;
  auVar97 = vcvtdq2ps_avx(auVar310);
  auVar97 = vsubps_avx(auVar97,auVar140);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *(ulong *)(prim + uVar74 * 0xe + 6);
  auVar16 = vpmovsxwd_avx(auVar181);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar74 * 0xe + 0xe);
  auVar126 = vpmovsxwd_avx(auVar3);
  auVar125._0_4_ = fVar200 * auVar97._0_4_;
  auVar125._4_4_ = fVar221 * auVar97._4_4_;
  auVar125._8_4_ = fVar222 * auVar97._8_4_;
  auVar125._12_4_ = fVar223 * auVar97._12_4_;
  auVar14._16_4_ = fVar224 * auVar97._16_4_;
  auVar14._0_16_ = auVar125;
  auVar14._20_4_ = fVar226 * auVar97._20_4_;
  auVar14._24_4_ = fVar228 * auVar97._24_4_;
  auVar14._28_4_ = auVar97._28_4_;
  auVar212._16_16_ = auVar126;
  auVar212._0_16_ = auVar16;
  auVar97 = vcvtdq2ps_avx(auVar212);
  auVar97 = vsubps_avx(auVar97,auVar193);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar16 = vpmovsxwd_avx(auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 0xe);
  auVar126 = vpmovsxwd_avx(auVar5);
  auVar201._0_4_ = fVar263 * auVar97._0_4_;
  auVar201._4_4_ = fVar281 * auVar97._4_4_;
  auVar201._8_4_ = fVar285 * auVar97._8_4_;
  auVar201._12_4_ = fVar289 * auVar97._12_4_;
  auVar15._16_4_ = fVar293 * auVar97._16_4_;
  auVar15._0_16_ = auVar201;
  auVar15._20_4_ = fVar297 * auVar97._20_4_;
  auVar15._24_4_ = fVar301 * auVar97._24_4_;
  auVar15._28_4_ = auVar97._28_4_;
  auVar311._16_16_ = auVar126;
  auVar311._0_16_ = auVar16;
  auVar97 = vcvtdq2ps_avx(auVar311);
  auVar97 = vsubps_avx(auVar97,auVar193);
  auVar269._8_8_ = 0;
  auVar269._0_8_ = *(ulong *)(prim + uVar74 * 0x15 + 6);
  auVar16 = vpmovsxwd_avx(auVar269);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + uVar74 * 0x15 + 0xe);
  auVar126 = vpmovsxwd_avx(auVar184);
  auVar91._0_4_ = fVar263 * auVar97._0_4_;
  auVar91._4_4_ = fVar281 * auVar97._4_4_;
  auVar91._8_4_ = fVar285 * auVar97._8_4_;
  auVar91._12_4_ = fVar289 * auVar97._12_4_;
  auVar214._16_4_ = fVar293 * auVar97._16_4_;
  auVar214._0_16_ = auVar91;
  auVar214._20_4_ = fVar297 * auVar97._20_4_;
  auVar214._24_4_ = fVar301 * auVar97._24_4_;
  auVar214._28_4_ = auVar97._28_4_;
  auVar274._16_16_ = auVar126;
  auVar274._0_16_ = auVar16;
  auVar97 = vcvtdq2ps_avx(auVar274);
  auVar97 = vsubps_avx(auVar97,auVar164);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar74 * 0x17 + 6);
  auVar16 = vpmovsxwd_avx(auVar89);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + uVar74 * 0x17 + 0xe);
  auVar126 = vpmovsxwd_avx(auVar158);
  auVar268._0_4_ = fVar231 * auVar97._0_4_;
  auVar268._4_4_ = fVar251 * auVar97._4_4_;
  auVar268._8_4_ = fVar253 * auVar97._8_4_;
  auVar268._12_4_ = fVar255 * auVar97._12_4_;
  auVar244._16_4_ = fVar257 * auVar97._16_4_;
  auVar244._0_16_ = auVar268;
  auVar244._20_4_ = fVar259 * auVar97._20_4_;
  auVar244._24_4_ = fVar261 * auVar97._24_4_;
  auVar244._28_4_ = auVar97._28_4_;
  auVar312._16_16_ = auVar126;
  auVar312._0_16_ = auVar16;
  auVar97 = vcvtdq2ps_avx(auVar312);
  auVar97 = vsubps_avx(auVar97,auVar164);
  auVar95._0_4_ = fVar231 * auVar97._0_4_;
  auVar95._4_4_ = fVar251 * auVar97._4_4_;
  auVar95._8_4_ = fVar253 * auVar97._8_4_;
  auVar95._12_4_ = fVar255 * auVar97._12_4_;
  auVar215._16_4_ = fVar257 * auVar97._16_4_;
  auVar215._0_16_ = auVar95;
  auVar215._20_4_ = fVar259 * auVar97._20_4_;
  auVar215._24_4_ = fVar261 * auVar97._24_4_;
  auVar215._28_4_ = auVar97._28_4_;
  auVar16 = vpminsd_avx(auVar10._16_16_,auVar14._16_16_);
  auVar126 = vpminsd_avx(auVar85,auVar125);
  auVar320._16_16_ = auVar16;
  auVar320._0_16_ = auVar126;
  auVar16 = vpminsd_avx(auVar15._16_16_,auVar214._16_16_);
  auVar126 = vpminsd_avx(auVar201,auVar91);
  auVar328._16_16_ = auVar16;
  auVar328._0_16_ = auVar126;
  auVar97 = vmaxps_avx(auVar320,auVar328);
  auVar16 = vpminsd_avx(auVar244._16_16_,auVar215._16_16_);
  auVar126 = vpminsd_avx(auVar268,auVar95);
  auVar372._16_16_ = auVar16;
  auVar372._0_16_ = auVar126;
  uVar80 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar387._4_4_ = uVar80;
  auVar387._0_4_ = uVar80;
  auVar387._8_4_ = uVar80;
  auVar387._12_4_ = uVar80;
  auVar387._16_4_ = uVar80;
  auVar387._20_4_ = uVar80;
  auVar387._24_4_ = uVar80;
  auVar387._28_4_ = uVar80;
  auVar108 = vmaxps_avx(auVar372,auVar387);
  auVar97 = vmaxps_avx(auVar97,auVar108);
  local_3e0._4_4_ = auVar97._4_4_ * 0.99999964;
  local_3e0._0_4_ = auVar97._0_4_ * 0.99999964;
  local_3e0._8_4_ = auVar97._8_4_ * 0.99999964;
  local_3e0._12_4_ = auVar97._12_4_ * 0.99999964;
  local_3e0._16_4_ = auVar97._16_4_ * 0.99999964;
  local_3e0._20_4_ = auVar97._20_4_ * 0.99999964;
  local_3e0._24_4_ = auVar97._24_4_ * 0.99999964;
  local_3e0._28_4_ = auVar97._28_4_;
  auVar16 = vpmaxsd_avx(auVar10._16_16_,auVar14._16_16_);
  auVar126 = vpmaxsd_avx(auVar85,auVar125);
  auVar99._16_16_ = auVar16;
  auVar99._0_16_ = auVar126;
  auVar16 = vpmaxsd_avx(auVar15._16_16_,auVar214._16_16_);
  auVar126 = vpmaxsd_avx(auVar201,auVar91);
  auVar141._16_16_ = auVar16;
  auVar141._0_16_ = auVar126;
  auVar97 = vminps_avx(auVar99,auVar141);
  auVar16 = vpmaxsd_avx(auVar244._16_16_,auVar215._16_16_);
  auVar126 = vpmaxsd_avx(auVar268,auVar95);
  uVar80 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar194._4_4_ = uVar80;
  auVar194._0_4_ = uVar80;
  auVar194._8_4_ = uVar80;
  auVar194._12_4_ = uVar80;
  auVar194._16_4_ = uVar80;
  auVar194._20_4_ = uVar80;
  auVar194._24_4_ = uVar80;
  auVar194._28_4_ = uVar80;
  auVar142._16_16_ = auVar16;
  auVar142._0_16_ = auVar126;
  auVar108 = vminps_avx(auVar142,auVar194);
  auVar97 = vminps_avx(auVar97,auVar108);
  auVar108._4_4_ = auVar97._4_4_ * 1.0000004;
  auVar108._0_4_ = auVar97._0_4_ * 1.0000004;
  auVar108._8_4_ = auVar97._8_4_ * 1.0000004;
  auVar108._12_4_ = auVar97._12_4_ * 1.0000004;
  auVar108._16_4_ = auVar97._16_4_ * 1.0000004;
  auVar108._20_4_ = auVar97._20_4_ * 1.0000004;
  auVar108._24_4_ = auVar97._24_4_ * 1.0000004;
  auVar108._28_4_ = auVar97._28_4_;
  auVar97 = vcmpps_avx(local_3e0,auVar108,2);
  auVar16 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar143._16_16_ = auVar16;
  auVar143._0_16_ = auVar16;
  auVar108 = vcvtdq2ps_avx(auVar143);
  auVar108 = vcmpps_avx(_DAT_01f7b060,auVar108,1);
  auVar97 = vandps_avx(auVar97,auVar108);
  auVar144._16_16_ = mm_lookupmask_ps._240_16_;
  auVar144._0_16_ = mm_lookupmask_ps._240_16_;
  uVar80 = vmovmskps_avx(auVar97);
  uVar74 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar80);
  local_500 = vblendps_avx(auVar144,ZEXT832(0) << 0x20,0x80);
  local_a28 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_8a8 = prim;
LAB_009d4a1b:
  if (uVar74 == 0) {
    return;
  }
  lVar76 = 0;
  if (uVar74 != 0) {
    for (; (uVar74 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
    }
  }
  uVar79 = *(uint *)(local_8a8 + 2);
  local_8a0 = (ulong)*(uint *)(local_8a8 + lVar76 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar79].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar75 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           local_8a0 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar16 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar75);
  auVar126 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * (uVar75 + 1));
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar2 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar200 = *(float *)(ray + k * 4 + 0x40);
  auVar356._4_4_ = fVar200;
  auVar356._0_4_ = fVar200;
  auVar356._8_4_ = fVar200;
  auVar356._12_4_ = fVar200;
  fStack_a10 = fVar200;
  _local_a20 = auVar356;
  fStack_a0c = fVar200;
  fStack_a08 = fVar200;
  fStack_a04 = fVar200;
  fVar231 = *(float *)(ray + k * 4 + 0x50);
  auVar371._4_4_ = fVar231;
  auVar371._0_4_ = fVar231;
  auVar371._8_4_ = fVar231;
  auVar371._12_4_ = fVar231;
  fStack_670 = fVar231;
  _local_680 = auVar371;
  fStack_66c = fVar231;
  fStack_668 = fVar231;
  fStack_664 = fVar231;
  auVar20 = vunpcklps_avx(auVar356,auVar371);
  fVar221 = *(float *)(ray + k * 4 + 0x60);
  auVar391._4_4_ = fVar221;
  auVar391._0_4_ = fVar221;
  auVar391._8_4_ = fVar221;
  auVar391._12_4_ = fVar221;
  fStack_910 = fVar221;
  _local_920 = auVar391;
  fStack_90c = fVar221;
  fStack_908 = fVar221;
  fStack_904 = fVar221;
  _local_9b0 = vinsertps_avx(auVar20,auVar391,0x28);
  pfVar1 = (float *)(pGVar7[2].intersectionFilterN + uVar75 * (long)pGVar7[2].pointQueryFunc);
  auVar202._0_4_ = auVar16._0_4_ + *pfVar1 * 0.33333334;
  auVar202._4_4_ = auVar16._4_4_ + pfVar1[1] * 0.33333334;
  auVar202._8_4_ = auVar16._8_4_ + pfVar1[2] * 0.33333334;
  auVar202._12_4_ = auVar16._12_4_ + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * (uVar75 + 1));
  auVar86._0_4_ = *pfVar1 * 0.33333334;
  auVar86._4_4_ = pfVar1[1] * 0.33333334;
  auVar86._8_4_ = pfVar1[2] * 0.33333334;
  auVar86._12_4_ = pfVar1[3] * 0.33333334;
  auVar3 = vsubps_avx(auVar126,auVar86);
  auVar87._0_4_ = (auVar126._0_4_ + auVar16._0_4_ + auVar202._0_4_ + auVar3._0_4_) * 0.25;
  auVar87._4_4_ = (auVar126._4_4_ + auVar16._4_4_ + auVar202._4_4_ + auVar3._4_4_) * 0.25;
  auVar87._8_4_ = (auVar126._8_4_ + auVar16._8_4_ + auVar202._8_4_ + auVar3._8_4_) * 0.25;
  auVar87._12_4_ = (auVar126._12_4_ + auVar16._12_4_ + auVar202._12_4_ + auVar3._12_4_) * 0.25;
  auVar20 = vsubps_avx(auVar87,auVar2);
  auVar20 = vdpps_avx(auVar20,_local_9b0,0x7f);
  local_9c0 = vdpps_avx(_local_9b0,_local_9b0,0x7f);
  auVar181 = vrcpss_avx(local_9c0,local_9c0);
  fVar251 = auVar20._0_4_ * auVar181._0_4_ * (2.0 - local_9c0._0_4_ * auVar181._0_4_);
  auVar181 = vshufps_avx(ZEXT416((uint)fVar251),ZEXT416((uint)fVar251),0);
  auVar176._0_4_ = auVar2._0_4_ + local_9b0._0_4_ * auVar181._0_4_;
  auVar176._4_4_ = auVar2._4_4_ + local_9b0._4_4_ * auVar181._4_4_;
  auVar176._8_4_ = auVar2._8_4_ + local_9b0._8_4_ * auVar181._8_4_;
  auVar176._12_4_ = auVar2._12_4_ + local_9b0._12_4_ * auVar181._12_4_;
  auVar20 = vblendps_avx(auVar176,_DAT_01f45a50,8);
  auVar2 = vsubps_avx(auVar16,auVar20);
  auVar3 = vsubps_avx(auVar3,auVar20);
  auVar4 = vsubps_avx(auVar202,auVar20);
  auVar5 = vsubps_avx(auVar126,auVar20);
  auVar16 = vshufps_avx(auVar2,auVar2,0);
  register0x00001250 = auVar16;
  _local_1e0 = auVar16;
  auVar16 = vshufps_avx(auVar2,auVar2,0x55);
  local_360._16_16_ = auVar16;
  local_360._0_16_ = auVar16;
  auVar16 = vshufps_avx(auVar2,auVar2,0xaa);
  auVar126 = vshufps_avx(auVar2,auVar2,0xff);
  local_820._16_16_ = auVar126;
  local_820._0_16_ = auVar126;
  auVar361 = ZEXT3264(local_820);
  auVar126 = vshufps_avx(auVar4,auVar4,0);
  auVar275._16_16_ = auVar126;
  auVar275._0_16_ = auVar126;
  auVar126 = vshufps_avx(auVar4,auVar4,0x55);
  local_9e0._16_16_ = auVar126;
  local_9e0._0_16_ = auVar126;
  auVar126 = vshufps_avx(auVar4,auVar4,0xaa);
  local_aa0._16_16_ = auVar126;
  local_aa0._0_16_ = auVar126;
  auVar126 = vshufps_avx(auVar4,auVar4,0xff);
  local_960._16_16_ = auVar126;
  local_960._0_16_ = auVar126;
  auVar126 = vshufps_avx(auVar3,auVar3,0);
  local_380._16_16_ = auVar126;
  local_380._0_16_ = auVar126;
  auVar126 = vshufps_avx(auVar3,auVar3,0x55);
  local_3a0._16_16_ = auVar126;
  local_3a0._0_16_ = auVar126;
  auVar126 = vshufps_avx(auVar3,auVar3,0xaa);
  register0x00001290 = auVar126;
  _local_200 = auVar126;
  auVar126 = vshufps_avx(auVar3,auVar3,0xff);
  auVar280 = ZEXT3264(local_960);
  register0x00001290 = auVar126;
  _local_220 = auVar126;
  auVar126 = vshufps_avx(auVar5,auVar5,0);
  register0x00001290 = auVar126;
  _local_240 = auVar126;
  auVar126 = vshufps_avx(auVar5,auVar5,0x55);
  register0x00001290 = auVar126;
  _local_260 = auVar126;
  auVar126 = vshufps_avx(auVar5,auVar5,0xaa);
  register0x00001290 = auVar126;
  _local_280 = auVar126;
  auVar126 = vshufps_avx(auVar5,auVar5,0xff);
  register0x00001290 = auVar126;
  _local_2a0 = auVar126;
  auVar126 = ZEXT416((uint)(fVar200 * fVar200 + fVar231 * fVar231 + fVar221 * fVar221));
  auVar126 = vshufps_avx(auVar126,auVar126,0);
  local_2c0._16_16_ = auVar126;
  local_2c0._0_16_ = auVar126;
  fVar200 = *(float *)(ray + k * 4 + 0x30);
  local_8d0 = ZEXT416((uint)fVar251);
  auVar317 = ZEXT3264(local_aa0);
  auVar126 = vshufps_avx(ZEXT416((uint)(fVar200 - fVar251)),ZEXT416((uint)(fVar200 - fVar251)),0);
  local_3c0._16_16_ = auVar126;
  local_3c0._0_16_ = auVar126;
  local_770 = vpshufd_avx(ZEXT416(uVar79),0);
  local_780 = vpshufd_avx(ZEXT416(*(uint *)(local_8a8 + lVar76 * 4 + 6)),0);
  register0x00001210 = auVar181;
  _local_880 = auVar181;
  uVar75 = 0;
  local_c68 = 1;
  auVar100._8_4_ = 0x7fffffff;
  auVar100._0_8_ = 0x7fffffff7fffffff;
  auVar100._12_4_ = 0x7fffffff;
  auVar100._16_4_ = 0x7fffffff;
  auVar100._20_4_ = 0x7fffffff;
  auVar100._24_4_ = 0x7fffffff;
  auVar100._28_4_ = 0x7fffffff;
  local_580 = vandps_avx(local_2c0,auVar100);
  auVar126 = vsqrtss_avx(local_9c0,local_9c0);
  auVar20 = vsqrtss_avx(local_9c0,local_9c0);
  auVar335 = ZEXT3264(local_9e0);
  local_5d0 = ZEXT816(0x3f80000000000000);
  local_560 = auVar275;
  do {
    auVar195._8_4_ = 0x3f800000;
    auVar195._0_8_ = 0x3f8000003f800000;
    auVar195._12_4_ = 0x3f800000;
    auVar195._16_4_ = 0x3f800000;
    auVar195._20_4_ = 0x3f800000;
    auVar195._24_4_ = 0x3f800000;
    auVar195._28_4_ = 0x3f800000;
    auVar181 = vmovshdup_avx(local_5d0);
    auVar184 = vsubps_avx(auVar181,local_5d0);
    auVar181 = vshufps_avx(local_5d0,local_5d0,0);
    local_7a0._16_16_ = auVar181;
    local_7a0._0_16_ = auVar181;
    auVar269 = vshufps_avx(auVar184,auVar184,0);
    local_7c0._16_16_ = auVar269;
    local_7c0._0_16_ = auVar269;
    fVar123 = auVar269._0_4_;
    fVar155 = auVar269._4_4_;
    fVar156 = auVar269._8_4_;
    fVar157 = auVar269._12_4_;
    fVar83 = auVar181._0_4_;
    auVar145._0_4_ = fVar83 + fVar123 * 0.0;
    fVar114 = auVar181._4_4_;
    auVar145._4_4_ = fVar114 + fVar155 * 0.14285715;
    fVar116 = auVar181._8_4_;
    auVar145._8_4_ = fVar116 + fVar156 * 0.2857143;
    fVar118 = auVar181._12_4_;
    auVar145._12_4_ = fVar118 + fVar157 * 0.42857146;
    auVar145._16_4_ = fVar83 + fVar123 * 0.5714286;
    auVar145._20_4_ = fVar114 + fVar155 * 0.71428573;
    auVar145._24_4_ = fVar116 + fVar156 * 0.8571429;
    auVar145._28_4_ = fVar118 + fVar157;
    auVar97 = vsubps_avx(auVar195,auVar145);
    fVar231 = auVar275._28_4_;
    fVar221 = auVar97._0_4_;
    fVar251 = auVar97._4_4_;
    fVar222 = auVar97._8_4_;
    fVar253 = auVar97._12_4_;
    fVar223 = auVar97._16_4_;
    fVar255 = auVar97._20_4_;
    fVar224 = auVar97._24_4_;
    fVar350 = auVar16._12_4_;
    fVar285 = auVar280._28_4_ + fVar231 + auVar317._28_4_ + 1.0 + 1.0;
    fVar264 = local_380._0_4_ * auVar145._0_4_ + auVar275._0_4_ * fVar221;
    fVar282 = local_380._4_4_ * auVar145._4_4_ + auVar275._4_4_ * fVar251;
    fVar286 = local_380._8_4_ * auVar145._8_4_ + auVar275._8_4_ * fVar222;
    fVar290 = local_380._12_4_ * auVar145._12_4_ + auVar275._12_4_ * fVar253;
    fVar294 = local_380._16_4_ * auVar145._16_4_ + auVar275._16_4_ * fVar223;
    fVar298 = local_380._20_4_ * auVar145._20_4_ + auVar275._20_4_ * fVar255;
    fVar302 = local_380._24_4_ * auVar145._24_4_ + auVar275._24_4_ * fVar224;
    fVar257 = local_3a0._0_4_ * auVar145._0_4_ + auVar335._0_4_ * fVar221;
    fVar226 = local_3a0._4_4_ * auVar145._4_4_ + auVar335._4_4_ * fVar251;
    fVar259 = local_3a0._8_4_ * auVar145._8_4_ + auVar335._8_4_ * fVar222;
    fVar228 = local_3a0._12_4_ * auVar145._12_4_ + auVar335._12_4_ * fVar253;
    fVar261 = local_3a0._16_4_ * auVar145._16_4_ + auVar335._16_4_ * fVar223;
    fVar263 = local_3a0._20_4_ * auVar145._20_4_ + auVar335._20_4_ * fVar255;
    fVar281 = local_3a0._24_4_ * auVar145._24_4_ + auVar335._24_4_ * fVar224;
    fVar289 = (float)local_200._0_4_ * auVar145._0_4_ + auVar317._0_4_ * fVar221;
    fVar293 = (float)local_200._4_4_ * auVar145._4_4_ + auVar317._4_4_ * fVar251;
    fVar297 = fStack_1f8 * auVar145._8_4_ + auVar317._8_4_ * fVar222;
    fVar301 = fStack_1f4 * auVar145._12_4_ + auVar317._12_4_ * fVar253;
    fVar225 = fStack_1f0 * auVar145._16_4_ + auVar317._16_4_ * fVar223;
    fVar227 = fStack_1ec * auVar145._20_4_ + auVar317._20_4_ * fVar255;
    fVar229 = fStack_1e8 * auVar145._24_4_ + auVar317._24_4_ * fVar224;
    fVar232 = (float)local_220._0_4_ * auVar145._0_4_ + auVar280._0_4_ * fVar221;
    fVar252 = (float)local_220._4_4_ * auVar145._4_4_ + auVar280._4_4_ * fVar251;
    fVar254 = fStack_218 * auVar145._8_4_ + auVar280._8_4_ * fVar222;
    fVar256 = fStack_214 * auVar145._12_4_ + auVar280._12_4_ * fVar253;
    fVar258 = fStack_210 * auVar145._16_4_ + auVar280._16_4_ * fVar223;
    fVar260 = fStack_20c * auVar145._20_4_ + auVar280._20_4_ * fVar255;
    fVar262 = fStack_208 * auVar145._24_4_ + auVar280._24_4_ * fVar224;
    fVar386 = fVar350 + fVar231;
    fVar368 = auVar361._28_4_ + fVar350;
    auVar321._0_4_ =
         fVar221 * (auVar275._0_4_ * auVar145._0_4_ + fVar221 * (float)local_1e0._0_4_) +
         auVar145._0_4_ * fVar264;
    auVar321._4_4_ =
         fVar251 * (auVar275._4_4_ * auVar145._4_4_ + fVar251 * (float)local_1e0._4_4_) +
         auVar145._4_4_ * fVar282;
    auVar321._8_4_ =
         fVar222 * (auVar275._8_4_ * auVar145._8_4_ + fVar222 * fStack_1d8) +
         auVar145._8_4_ * fVar286;
    auVar321._12_4_ =
         fVar253 * (auVar275._12_4_ * auVar145._12_4_ + fVar253 * fStack_1d4) +
         auVar145._12_4_ * fVar290;
    auVar321._16_4_ =
         fVar223 * (auVar275._16_4_ * auVar145._16_4_ + fVar223 * fStack_1d0) +
         auVar145._16_4_ * fVar294;
    auVar321._20_4_ =
         fVar255 * (auVar275._20_4_ * auVar145._20_4_ + fVar255 * fStack_1cc) +
         auVar145._20_4_ * fVar298;
    auVar321._24_4_ =
         fVar224 * (auVar275._24_4_ * auVar145._24_4_ + fVar224 * fStack_1c8) +
         auVar145._24_4_ * fVar302;
    auVar321._28_4_ = local_380._28_4_ + fVar350;
    auVar333._0_4_ =
         fVar221 * (auVar335._0_4_ * auVar145._0_4_ + local_360._0_4_ * fVar221) +
         auVar145._0_4_ * fVar257;
    auVar333._4_4_ =
         fVar251 * (auVar335._4_4_ * auVar145._4_4_ + local_360._4_4_ * fVar251) +
         auVar145._4_4_ * fVar226;
    auVar333._8_4_ =
         fVar222 * (auVar335._8_4_ * auVar145._8_4_ + local_360._8_4_ * fVar222) +
         auVar145._8_4_ * fVar259;
    auVar333._12_4_ =
         fVar253 * (auVar335._12_4_ * auVar145._12_4_ + local_360._12_4_ * fVar253) +
         auVar145._12_4_ * fVar228;
    auVar333._16_4_ =
         fVar223 * (auVar335._16_4_ * auVar145._16_4_ + local_360._16_4_ * fVar223) +
         auVar145._16_4_ * fVar261;
    auVar333._20_4_ =
         fVar255 * (auVar335._20_4_ * auVar145._20_4_ + local_360._20_4_ * fVar255) +
         auVar145._20_4_ * fVar263;
    auVar333._24_4_ =
         fVar224 * (auVar335._24_4_ * auVar145._24_4_ + local_360._24_4_ * fVar224) +
         auVar145._24_4_ * fVar281;
    auVar333._28_4_ = local_3a0._28_4_ + fVar350;
    auVar344._0_4_ =
         fVar221 * (auVar317._0_4_ * auVar145._0_4_ + auVar16._0_4_ * fVar221) +
         auVar145._0_4_ * fVar289;
    auVar344._4_4_ =
         fVar251 * (auVar317._4_4_ * auVar145._4_4_ + auVar16._4_4_ * fVar251) +
         auVar145._4_4_ * fVar293;
    auVar344._8_4_ =
         fVar222 * (auVar317._8_4_ * auVar145._8_4_ + auVar16._8_4_ * fVar222) +
         auVar145._8_4_ * fVar297;
    auVar344._12_4_ =
         fVar253 * (auVar317._12_4_ * auVar145._12_4_ + fVar350 * fVar253) +
         auVar145._12_4_ * fVar301;
    auVar344._16_4_ =
         fVar223 * (auVar317._16_4_ * auVar145._16_4_ + auVar16._0_4_ * fVar223) +
         auVar145._16_4_ * fVar225;
    auVar344._20_4_ =
         fVar255 * (auVar317._20_4_ * auVar145._20_4_ + auVar16._4_4_ * fVar255) +
         auVar145._20_4_ * fVar227;
    auVar344._24_4_ =
         fVar224 * (auVar317._24_4_ * auVar145._24_4_ + auVar16._8_4_ * fVar224) +
         auVar145._24_4_ * fVar229;
    auVar344._28_4_ = fStack_1e4 + fVar350;
    auVar313._0_4_ =
         auVar145._0_4_ * fVar232 +
         fVar221 * (auVar280._0_4_ * auVar145._0_4_ + auVar361._0_4_ * fVar221);
    auVar313._4_4_ =
         auVar145._4_4_ * fVar252 +
         fVar251 * (auVar280._4_4_ * auVar145._4_4_ + auVar361._4_4_ * fVar251);
    auVar313._8_4_ =
         auVar145._8_4_ * fVar254 +
         fVar222 * (auVar280._8_4_ * auVar145._8_4_ + auVar361._8_4_ * fVar222);
    auVar313._12_4_ =
         auVar145._12_4_ * fVar256 +
         fVar253 * (auVar280._12_4_ * auVar145._12_4_ + auVar361._12_4_ * fVar253);
    auVar313._16_4_ =
         auVar145._16_4_ * fVar258 +
         fVar223 * (auVar280._16_4_ * auVar145._16_4_ + auVar361._16_4_ * fVar223);
    auVar313._20_4_ =
         auVar145._20_4_ * fVar260 +
         fVar255 * (auVar280._20_4_ * auVar145._20_4_ + auVar361._20_4_ * fVar255);
    auVar313._24_4_ =
         auVar145._24_4_ * fVar262 +
         fVar224 * (auVar280._24_4_ * auVar145._24_4_ + auVar361._24_4_ * fVar224);
    auVar313._28_4_ = fStack_1e4 + fStack_204;
    auVar101._0_4_ =
         (auVar145._0_4_ * (float)local_240._0_4_ + local_380._0_4_ * fVar221) * auVar145._0_4_ +
         fVar221 * fVar264;
    auVar101._4_4_ =
         (auVar145._4_4_ * (float)local_240._4_4_ + local_380._4_4_ * fVar251) * auVar145._4_4_ +
         fVar251 * fVar282;
    auVar101._8_4_ =
         (auVar145._8_4_ * fStack_238 + local_380._8_4_ * fVar222) * auVar145._8_4_ +
         fVar222 * fVar286;
    auVar101._12_4_ =
         (auVar145._12_4_ * fStack_234 + local_380._12_4_ * fVar253) * auVar145._12_4_ +
         fVar253 * fVar290;
    auVar101._16_4_ =
         (auVar145._16_4_ * fStack_230 + local_380._16_4_ * fVar223) * auVar145._16_4_ +
         fVar223 * fVar294;
    auVar101._20_4_ =
         (auVar145._20_4_ * fStack_22c + local_380._20_4_ * fVar255) * auVar145._20_4_ +
         fVar255 * fVar298;
    auVar101._24_4_ =
         (auVar145._24_4_ * fStack_228 + local_380._24_4_ * fVar224) * auVar145._24_4_ +
         fVar224 * fVar302;
    auVar101._28_4_ = fStack_1e4 + fVar285 + auVar280._28_4_;
    auVar196._0_4_ =
         (auVar145._0_4_ * (float)local_260._0_4_ + local_3a0._0_4_ * fVar221) * auVar145._0_4_ +
         fVar221 * fVar257;
    auVar196._4_4_ =
         (auVar145._4_4_ * (float)local_260._4_4_ + local_3a0._4_4_ * fVar251) * auVar145._4_4_ +
         fVar251 * fVar226;
    auVar196._8_4_ =
         (auVar145._8_4_ * fStack_258 + local_3a0._8_4_ * fVar222) * auVar145._8_4_ +
         fVar222 * fVar259;
    auVar196._12_4_ =
         (auVar145._12_4_ * fStack_254 + local_3a0._12_4_ * fVar253) * auVar145._12_4_ +
         fVar253 * fVar228;
    auVar196._16_4_ =
         (auVar145._16_4_ * fStack_250 + local_3a0._16_4_ * fVar223) * auVar145._16_4_ +
         fVar223 * fVar261;
    auVar196._20_4_ =
         (auVar145._20_4_ * fStack_24c + local_3a0._20_4_ * fVar255) * auVar145._20_4_ +
         fVar255 * fVar263;
    auVar196._24_4_ =
         (auVar145._24_4_ * fStack_248 + local_3a0._24_4_ * fVar224) * auVar145._24_4_ +
         fVar224 * fVar281;
    auVar196._28_4_ = fStack_1e4 + fVar285 + 1.0;
    auVar213._0_4_ =
         (auVar145._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar221) *
         auVar145._0_4_ + fVar221 * fVar289;
    auVar213._4_4_ =
         (auVar145._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar251) *
         auVar145._4_4_ + fVar251 * fVar293;
    auVar213._8_4_ =
         (auVar145._8_4_ * fStack_278 + fStack_1f8 * fVar222) * auVar145._8_4_ + fVar222 * fVar297;
    auVar213._12_4_ =
         (auVar145._12_4_ * fStack_274 + fStack_1f4 * fVar253) * auVar145._12_4_ + fVar253 * fVar301
    ;
    auVar213._16_4_ =
         (auVar145._16_4_ * fStack_270 + fStack_1f0 * fVar223) * auVar145._16_4_ + fVar223 * fVar225
    ;
    auVar213._20_4_ =
         (auVar145._20_4_ * fStack_26c + fStack_1ec * fVar255) * auVar145._20_4_ + fVar255 * fVar227
    ;
    auVar213._24_4_ =
         (auVar145._24_4_ * fStack_268 + fStack_1e8 * fVar224) * auVar145._24_4_ + fVar224 * fVar229
    ;
    auVar213._28_4_ = fVar368 + fVar231 + 1.0;
    auVar240._0_4_ =
         (auVar145._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar221) *
         auVar145._0_4_ + fVar221 * fVar232;
    auVar240._4_4_ =
         (auVar145._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar251) *
         auVar145._4_4_ + fVar251 * fVar252;
    auVar240._8_4_ =
         (auVar145._8_4_ * fStack_298 + fStack_218 * fVar222) * auVar145._8_4_ + fVar222 * fVar254;
    auVar240._12_4_ =
         (auVar145._12_4_ * fStack_294 + fStack_214 * fVar253) * auVar145._12_4_ + fVar253 * fVar256
    ;
    auVar240._16_4_ =
         (auVar145._16_4_ * fStack_290 + fStack_210 * fVar223) * auVar145._16_4_ + fVar223 * fVar258
    ;
    auVar240._20_4_ =
         (auVar145._20_4_ * fStack_28c + fStack_20c * fVar255) * auVar145._20_4_ + fVar255 * fVar260
    ;
    auVar240._24_4_ =
         (auVar145._24_4_ * fStack_288 + fStack_208 * fVar224) * auVar145._24_4_ + fVar224 * fVar262
    ;
    auVar240._28_4_ = fVar386 + fVar350 + fVar231;
    fVar265 = auVar321._0_4_ * fVar221 + auVar145._0_4_ * auVar101._0_4_;
    fVar283 = auVar321._4_4_ * fVar251 + auVar145._4_4_ * auVar101._4_4_;
    fVar287 = auVar321._8_4_ * fVar222 + auVar145._8_4_ * auVar101._8_4_;
    fVar291 = auVar321._12_4_ * fVar253 + auVar145._12_4_ * auVar101._12_4_;
    fVar295 = auVar321._16_4_ * fVar223 + auVar145._16_4_ * auVar101._16_4_;
    fVar299 = auVar321._20_4_ * fVar255 + auVar145._20_4_ * auVar101._20_4_;
    fVar303 = auVar321._24_4_ * fVar224 + auVar145._24_4_ * auVar101._24_4_;
    fVar305 = fVar386 + fStack_1e4;
    auVar388._0_4_ = auVar333._0_4_ * fVar221 + auVar145._0_4_ * auVar196._0_4_;
    auVar388._4_4_ = auVar333._4_4_ * fVar251 + auVar145._4_4_ * auVar196._4_4_;
    auVar388._8_4_ = auVar333._8_4_ * fVar222 + auVar145._8_4_ * auVar196._8_4_;
    auVar388._12_4_ = auVar333._12_4_ * fVar253 + auVar145._12_4_ * auVar196._12_4_;
    auVar388._16_4_ = auVar333._16_4_ * fVar223 + auVar145._16_4_ * auVar196._16_4_;
    auVar388._20_4_ = auVar333._20_4_ * fVar255 + auVar145._20_4_ * auVar196._20_4_;
    auVar388._24_4_ = auVar333._24_4_ * fVar224 + auVar145._24_4_ * auVar196._24_4_;
    auVar388._28_4_ = fStack_1e4 + fVar368;
    local_2e0._0_4_ = auVar344._0_4_ * fVar221 + auVar145._0_4_ * auVar213._0_4_;
    local_2e0._4_4_ = auVar344._4_4_ * fVar251 + auVar145._4_4_ * auVar213._4_4_;
    local_2e0._8_4_ = auVar344._8_4_ * fVar222 + auVar145._8_4_ * auVar213._8_4_;
    local_2e0._12_4_ = auVar344._12_4_ * fVar253 + auVar145._12_4_ * auVar213._12_4_;
    local_2e0._16_4_ = auVar344._16_4_ * fVar223 + auVar145._16_4_ * auVar213._16_4_;
    local_2e0._20_4_ = auVar344._20_4_ * fVar255 + auVar145._20_4_ * auVar213._20_4_;
    local_2e0._24_4_ = auVar344._24_4_ * fVar224 + auVar145._24_4_ * auVar213._24_4_;
    local_2e0._28_4_ = fVar368 + fStack_1e4;
    local_ac0._0_4_ = auVar184._0_4_;
    auVar276._0_4_ = fVar221 * auVar313._0_4_ + auVar145._0_4_ * auVar240._0_4_;
    auVar276._4_4_ = fVar251 * auVar313._4_4_ + auVar145._4_4_ * auVar240._4_4_;
    auVar276._8_4_ = fVar222 * auVar313._8_4_ + auVar145._8_4_ * auVar240._8_4_;
    auVar276._12_4_ = fVar253 * auVar313._12_4_ + auVar145._12_4_ * auVar240._12_4_;
    auVar276._16_4_ = fVar223 * auVar313._16_4_ + auVar145._16_4_ * auVar240._16_4_;
    auVar276._20_4_ = fVar255 * auVar313._20_4_ + auVar145._20_4_ * auVar240._20_4_;
    auVar276._24_4_ = fVar224 * auVar313._24_4_ + auVar145._24_4_ * auVar240._24_4_;
    auVar276._28_4_ = auVar97._28_4_ + auVar145._28_4_;
    auVar97 = vsubps_avx(auVar101,auVar321);
    auVar214 = vsubps_avx(auVar196,auVar333);
    auVar108 = vsubps_avx(auVar213,auVar344);
    auVar10 = vsubps_avx(auVar240,auVar313);
    auVar181 = vshufps_avx(ZEXT416((uint)((float)local_ac0._0_4_ * 0.04761905)),
                           ZEXT416((uint)((float)local_ac0._0_4_ * 0.04761905)),0);
    fVar293 = auVar181._0_4_;
    fVar355 = fVar293 * auVar97._0_4_ * 3.0;
    fVar297 = auVar181._4_4_;
    fVar362 = fVar297 * auVar97._4_4_ * 3.0;
    auVar21._4_4_ = fVar362;
    auVar21._0_4_ = fVar355;
    fVar232 = auVar181._8_4_;
    fVar363 = fVar232 * auVar97._8_4_ * 3.0;
    auVar21._8_4_ = fVar363;
    fVar261 = auVar181._12_4_;
    fVar364 = fVar261 * auVar97._12_4_ * 3.0;
    auVar21._12_4_ = fVar364;
    fVar365 = fVar293 * auVar97._16_4_ * 3.0;
    auVar21._16_4_ = fVar365;
    fVar366 = fVar297 * auVar97._20_4_ * 3.0;
    auVar21._20_4_ = fVar366;
    fVar367 = fVar232 * auVar97._24_4_ * 3.0;
    auVar21._24_4_ = fVar367;
    auVar21._28_4_ = fVar368;
    fVar342 = fVar293 * auVar214._0_4_ * 3.0;
    fVar348 = fVar297 * auVar214._4_4_ * 3.0;
    local_940._4_4_ = fVar348;
    local_940._0_4_ = fVar342;
    fVar349 = fVar232 * auVar214._8_4_ * 3.0;
    local_940._8_4_ = fVar349;
    fVar351 = fVar261 * auVar214._12_4_ * 3.0;
    local_940._12_4_ = fVar351;
    fVar352 = fVar293 * auVar214._16_4_ * 3.0;
    local_940._16_4_ = fVar352;
    fVar353 = fVar297 * auVar214._20_4_ * 3.0;
    local_940._20_4_ = fVar353;
    fVar354 = fVar232 * auVar214._24_4_ * 3.0;
    local_940._24_4_ = fVar354;
    local_940._28_4_ = auVar344._28_4_;
    fVar369 = fVar293 * auVar108._0_4_ * 3.0;
    fVar374 = fVar297 * auVar108._4_4_ * 3.0;
    auVar22._4_4_ = fVar374;
    auVar22._0_4_ = fVar369;
    fVar376 = fVar232 * auVar108._8_4_ * 3.0;
    auVar22._8_4_ = fVar376;
    fVar378 = fVar261 * auVar108._12_4_ * 3.0;
    auVar22._12_4_ = fVar378;
    fVar380 = fVar293 * auVar108._16_4_ * 3.0;
    auVar22._16_4_ = fVar380;
    fVar382 = fVar297 * auVar108._20_4_ * 3.0;
    auVar22._20_4_ = fVar382;
    fVar384 = fVar232 * auVar108._24_4_ * 3.0;
    auVar22._24_4_ = fVar384;
    auVar22._28_4_ = fVar386;
    fVar223 = fVar293 * auVar10._0_4_ * 3.0;
    fVar255 = fVar297 * auVar10._4_4_ * 3.0;
    auVar23._4_4_ = fVar255;
    auVar23._0_4_ = fVar223;
    fVar228 = fVar232 * auVar10._8_4_ * 3.0;
    auVar23._8_4_ = fVar228;
    fVar261 = fVar261 * auVar10._12_4_ * 3.0;
    auVar23._12_4_ = fVar261;
    fVar293 = fVar293 * auVar10._16_4_ * 3.0;
    auVar23._16_4_ = fVar293;
    fVar297 = fVar297 * auVar10._20_4_ * 3.0;
    auVar23._20_4_ = fVar297;
    fVar232 = fVar232 * auVar10._24_4_ * 3.0;
    auVar23._24_4_ = fVar232;
    auVar23._28_4_ = auVar214._28_4_;
    auVar97 = vperm2f128_avx(auVar388,auVar388,1);
    auVar97 = vshufps_avx(auVar97,auVar388,0x30);
    auVar11 = vshufps_avx(auVar388,auVar97,0x29);
    auVar97 = vperm2f128_avx(local_2e0,local_2e0,1);
    auVar97 = vshufps_avx(auVar97,local_2e0,0x30);
    auVar12 = vshufps_avx(local_2e0,auVar97,0x29);
    auVar108 = vsubps_avx(auVar276,auVar23);
    auVar97 = vperm2f128_avx(auVar108,auVar108,1);
    auVar97 = vshufps_avx(auVar97,auVar108,0x30);
    auVar13 = vshufps_avx(auVar108,auVar97,0x29);
    local_6c0 = vsubps_avx(auVar11,auVar388);
    local_300 = vsubps_avx(auVar12,local_2e0);
    fVar221 = local_6c0._0_4_;
    fVar224 = local_6c0._4_4_;
    auVar24._4_4_ = fVar374 * fVar224;
    auVar24._0_4_ = fVar369 * fVar221;
    fVar263 = local_6c0._8_4_;
    auVar24._8_4_ = fVar376 * fVar263;
    fVar301 = local_6c0._12_4_;
    auVar24._12_4_ = fVar378 * fVar301;
    fVar254 = local_6c0._16_4_;
    auVar24._16_4_ = fVar380 * fVar254;
    fVar282 = local_6c0._20_4_;
    auVar24._20_4_ = fVar382 * fVar282;
    fVar350 = local_6c0._24_4_;
    auVar24._24_4_ = fVar384 * fVar350;
    auVar24._28_4_ = auVar108._28_4_;
    fVar251 = local_300._0_4_;
    fVar257 = local_300._4_4_;
    auVar25._4_4_ = fVar348 * fVar257;
    auVar25._0_4_ = fVar342 * fVar251;
    fVar281 = local_300._8_4_;
    auVar25._8_4_ = fVar349 * fVar281;
    fVar225 = local_300._12_4_;
    auVar25._12_4_ = fVar351 * fVar225;
    fVar256 = local_300._16_4_;
    auVar25._16_4_ = fVar352 * fVar256;
    fVar286 = local_300._20_4_;
    auVar25._20_4_ = fVar353 * fVar286;
    fVar17 = local_300._24_4_;
    auVar25._24_4_ = fVar354 * fVar17;
    auVar25._28_4_ = auVar97._28_4_;
    auVar15 = vsubps_avx(auVar25,auVar24);
    auVar69._4_4_ = fVar283;
    auVar69._0_4_ = fVar265;
    auVar69._8_4_ = fVar287;
    auVar69._12_4_ = fVar291;
    auVar69._16_4_ = fVar295;
    auVar69._20_4_ = fVar299;
    auVar69._24_4_ = fVar303;
    auVar69._28_4_ = fVar305;
    auVar97 = vperm2f128_avx(auVar69,auVar69,1);
    auVar97 = vshufps_avx(auVar97,auVar69,0x30);
    auVar14 = vshufps_avx(auVar69,auVar97,0x29);
    local_520 = vsubps_avx(auVar14,auVar69);
    auVar26._4_4_ = fVar362 * fVar257;
    auVar26._0_4_ = fVar355 * fVar251;
    auVar26._8_4_ = fVar363 * fVar281;
    auVar26._12_4_ = fVar364 * fVar225;
    auVar26._16_4_ = fVar365 * fVar256;
    auVar26._20_4_ = fVar366 * fVar286;
    auVar26._24_4_ = fVar367 * fVar17;
    auVar26._28_4_ = auVar14._28_4_;
    fVar222 = local_520._0_4_;
    fVar226 = local_520._4_4_;
    auVar27._4_4_ = fVar374 * fVar226;
    auVar27._0_4_ = fVar369 * fVar222;
    fVar285 = local_520._8_4_;
    auVar27._8_4_ = fVar376 * fVar285;
    fVar227 = local_520._12_4_;
    auVar27._12_4_ = fVar378 * fVar227;
    fVar258 = local_520._16_4_;
    auVar27._16_4_ = fVar380 * fVar258;
    fVar290 = local_520._20_4_;
    auVar27._20_4_ = fVar382 * fVar290;
    fVar18 = local_520._24_4_;
    auVar27._24_4_ = fVar384 * fVar18;
    auVar27._28_4_ = auVar321._28_4_;
    auVar244 = vsubps_avx(auVar27,auVar26);
    auVar28._4_4_ = fVar348 * fVar226;
    auVar28._0_4_ = fVar342 * fVar222;
    auVar28._8_4_ = fVar349 * fVar285;
    auVar28._12_4_ = fVar351 * fVar227;
    auVar28._16_4_ = fVar352 * fVar258;
    auVar28._20_4_ = fVar353 * fVar290;
    auVar28._24_4_ = fVar354 * fVar18;
    auVar28._28_4_ = auVar321._28_4_;
    auVar29._4_4_ = fVar362 * fVar224;
    auVar29._0_4_ = fVar355 * fVar221;
    auVar29._8_4_ = fVar363 * fVar263;
    auVar29._12_4_ = fVar364 * fVar301;
    auVar29._16_4_ = fVar365 * fVar254;
    auVar29._20_4_ = fVar366 * fVar282;
    auVar29._24_4_ = fVar367 * fVar350;
    auVar29._28_4_ = auVar333._28_4_;
    auVar215 = vsubps_avx(auVar29,auVar28);
    fVar231 = auVar215._28_4_;
    auVar197._0_4_ = fVar222 * fVar222 + fVar221 * fVar221 + fVar251 * fVar251;
    auVar197._4_4_ = fVar226 * fVar226 + fVar224 * fVar224 + fVar257 * fVar257;
    auVar197._8_4_ = fVar285 * fVar285 + fVar263 * fVar263 + fVar281 * fVar281;
    auVar197._12_4_ = fVar227 * fVar227 + fVar301 * fVar301 + fVar225 * fVar225;
    auVar197._16_4_ = fVar258 * fVar258 + fVar254 * fVar254 + fVar256 * fVar256;
    auVar197._20_4_ = fVar290 * fVar290 + fVar282 * fVar282 + fVar286 * fVar286;
    auVar197._24_4_ = fVar18 * fVar18 + fVar350 * fVar350 + fVar17 * fVar17;
    auVar197._28_4_ = fVar231 + fVar231 + auVar15._28_4_;
    auVar97 = vrcpps_avx(auVar197);
    fVar252 = auVar97._0_4_;
    fVar262 = auVar97._4_4_;
    auVar30._4_4_ = fVar262 * auVar197._4_4_;
    auVar30._0_4_ = fVar252 * auVar197._0_4_;
    fVar264 = auVar97._8_4_;
    auVar30._8_4_ = fVar264 * auVar197._8_4_;
    fVar298 = auVar97._12_4_;
    auVar30._12_4_ = fVar298 * auVar197._12_4_;
    fVar302 = auVar97._16_4_;
    auVar30._16_4_ = fVar302 * auVar197._16_4_;
    fVar324 = auVar97._20_4_;
    auVar30._20_4_ = fVar324 * auVar197._20_4_;
    fVar325 = auVar97._24_4_;
    auVar30._24_4_ = fVar325 * auVar197._24_4_;
    auVar30._28_4_ = auVar333._28_4_;
    auVar102._8_4_ = 0x3f800000;
    auVar102._0_8_ = 0x3f8000003f800000;
    auVar102._12_4_ = 0x3f800000;
    auVar102._16_4_ = 0x3f800000;
    auVar102._20_4_ = 0x3f800000;
    auVar102._24_4_ = 0x3f800000;
    auVar102._28_4_ = 0x3f800000;
    auVar98 = vsubps_avx(auVar102,auVar30);
    fVar252 = fVar252 + fVar252 * auVar98._0_4_;
    fVar262 = fVar262 + fVar262 * auVar98._4_4_;
    fVar264 = fVar264 + fVar264 * auVar98._8_4_;
    fVar298 = fVar298 + fVar298 * auVar98._12_4_;
    fVar302 = fVar302 + fVar302 * auVar98._16_4_;
    fVar324 = fVar324 + fVar324 * auVar98._20_4_;
    fVar325 = fVar325 + fVar325 * auVar98._24_4_;
    auVar108 = vperm2f128_avx(local_940,local_940,1);
    auVar108 = vshufps_avx(auVar108,local_940,0x30);
    auVar108 = vshufps_avx(local_940,auVar108,0x29);
    auVar10 = vperm2f128_avx(auVar22,auVar22,1);
    auVar10 = vshufps_avx(auVar10,auVar22,0x30);
    local_900 = vshufps_avx(auVar22,auVar10,0x29);
    fVar84 = local_900._0_4_;
    fVar115 = local_900._4_4_;
    auVar31._4_4_ = fVar115 * fVar224;
    auVar31._0_4_ = fVar84 * fVar221;
    fVar117 = local_900._8_4_;
    auVar31._8_4_ = fVar117 * fVar263;
    fVar119 = local_900._12_4_;
    auVar31._12_4_ = fVar119 * fVar301;
    fVar120 = local_900._16_4_;
    auVar31._16_4_ = fVar120 * fVar254;
    fVar121 = local_900._20_4_;
    auVar31._20_4_ = fVar121 * fVar282;
    fVar122 = local_900._24_4_;
    auVar31._24_4_ = fVar122 * fVar350;
    auVar31._28_4_ = auVar10._28_4_;
    fVar253 = auVar108._0_4_;
    fVar259 = auVar108._4_4_;
    auVar32._4_4_ = fVar257 * fVar259;
    auVar32._0_4_ = fVar251 * fVar253;
    fVar289 = auVar108._8_4_;
    auVar32._8_4_ = fVar281 * fVar289;
    fVar229 = auVar108._12_4_;
    auVar32._12_4_ = fVar225 * fVar229;
    fVar260 = auVar108._16_4_;
    auVar32._16_4_ = fVar256 * fVar260;
    fVar294 = auVar108._20_4_;
    auVar32._20_4_ = fVar286 * fVar294;
    fVar19 = auVar108._24_4_;
    auVar32._24_4_ = fVar17 * fVar19;
    auVar32._28_4_ = auVar344._28_4_;
    auVar10 = vsubps_avx(auVar32,auVar31);
    auVar108 = vperm2f128_avx(auVar21,auVar21,1);
    auVar108 = vshufps_avx(auVar108,auVar21,0x30);
    local_a80 = vshufps_avx(auVar21,auVar108,0x29);
    fVar370 = local_a80._0_4_;
    fVar375 = local_a80._4_4_;
    auVar33._4_4_ = fVar375 * fVar257;
    auVar33._0_4_ = fVar370 * fVar251;
    fVar377 = local_a80._8_4_;
    auVar33._8_4_ = fVar377 * fVar281;
    fVar379 = local_a80._12_4_;
    auVar33._12_4_ = fVar379 * fVar225;
    fVar381 = local_a80._16_4_;
    auVar33._16_4_ = fVar381 * fVar256;
    fVar383 = local_a80._20_4_;
    auVar33._20_4_ = fVar383 * fVar286;
    fVar385 = local_a80._24_4_;
    auVar33._24_4_ = fVar385 * fVar17;
    auVar33._28_4_ = auVar108._28_4_;
    auVar34._4_4_ = fVar226 * fVar115;
    auVar34._0_4_ = fVar222 * fVar84;
    auVar34._8_4_ = fVar285 * fVar117;
    auVar34._12_4_ = fVar227 * fVar119;
    auVar34._16_4_ = fVar258 * fVar120;
    auVar34._20_4_ = fVar290 * fVar121;
    auVar34._24_4_ = fVar18 * fVar122;
    auVar34._28_4_ = fVar368;
    auVar108 = vsubps_avx(auVar34,auVar33);
    auVar35._4_4_ = fVar226 * fVar259;
    auVar35._0_4_ = fVar222 * fVar253;
    auVar35._8_4_ = fVar285 * fVar289;
    auVar35._12_4_ = fVar227 * fVar229;
    auVar35._16_4_ = fVar258 * fVar260;
    auVar35._20_4_ = fVar290 * fVar294;
    auVar35._24_4_ = fVar18 * fVar19;
    auVar35._28_4_ = fVar368;
    auVar36._4_4_ = fVar375 * fVar224;
    auVar36._0_4_ = fVar370 * fVar221;
    auVar36._8_4_ = fVar377 * fVar263;
    auVar36._12_4_ = fVar379 * fVar301;
    auVar36._16_4_ = fVar381 * fVar254;
    auVar36._20_4_ = fVar383 * fVar282;
    fVar368 = local_a80._28_4_;
    auVar36._24_4_ = fVar385 * fVar350;
    auVar36._28_4_ = fVar368;
    auVar99 = vsubps_avx(auVar36,auVar35);
    auVar37._4_4_ =
         fVar262 * (auVar15._4_4_ * auVar15._4_4_ +
                   auVar215._4_4_ * auVar215._4_4_ + auVar244._4_4_ * auVar244._4_4_);
    auVar37._0_4_ =
         fVar252 * (auVar15._0_4_ * auVar15._0_4_ +
                   auVar215._0_4_ * auVar215._0_4_ + auVar244._0_4_ * auVar244._0_4_);
    auVar37._8_4_ =
         fVar264 * (auVar15._8_4_ * auVar15._8_4_ +
                   auVar215._8_4_ * auVar215._8_4_ + auVar244._8_4_ * auVar244._8_4_);
    auVar37._12_4_ =
         fVar298 * (auVar15._12_4_ * auVar15._12_4_ +
                   auVar215._12_4_ * auVar215._12_4_ + auVar244._12_4_ * auVar244._12_4_);
    auVar37._16_4_ =
         fVar302 * (auVar15._16_4_ * auVar15._16_4_ +
                   auVar215._16_4_ * auVar215._16_4_ + auVar244._16_4_ * auVar244._16_4_);
    auVar37._20_4_ =
         fVar324 * (auVar15._20_4_ * auVar15._20_4_ +
                   auVar215._20_4_ * auVar215._20_4_ + auVar244._20_4_ * auVar244._20_4_);
    auVar37._24_4_ =
         fVar325 * (auVar15._24_4_ * auVar15._24_4_ +
                   auVar215._24_4_ * auVar215._24_4_ + auVar244._24_4_ * auVar244._24_4_);
    auVar37._28_4_ = auVar15._28_4_ + fVar231 + auVar244._28_4_;
    auVar38._4_4_ =
         (auVar10._4_4_ * auVar10._4_4_ +
         auVar108._4_4_ * auVar108._4_4_ + auVar99._4_4_ * auVar99._4_4_) * fVar262;
    auVar38._0_4_ =
         (auVar10._0_4_ * auVar10._0_4_ +
         auVar108._0_4_ * auVar108._0_4_ + auVar99._0_4_ * auVar99._0_4_) * fVar252;
    auVar38._8_4_ =
         (auVar10._8_4_ * auVar10._8_4_ +
         auVar108._8_4_ * auVar108._8_4_ + auVar99._8_4_ * auVar99._8_4_) * fVar264;
    auVar38._12_4_ =
         (auVar10._12_4_ * auVar10._12_4_ +
         auVar108._12_4_ * auVar108._12_4_ + auVar99._12_4_ * auVar99._12_4_) * fVar298;
    auVar38._16_4_ =
         (auVar10._16_4_ * auVar10._16_4_ +
         auVar108._16_4_ * auVar108._16_4_ + auVar99._16_4_ * auVar99._16_4_) * fVar302;
    auVar38._20_4_ =
         (auVar10._20_4_ * auVar10._20_4_ +
         auVar108._20_4_ * auVar108._20_4_ + auVar99._20_4_ * auVar99._20_4_) * fVar324;
    auVar38._24_4_ =
         (auVar10._24_4_ * auVar10._24_4_ +
         auVar108._24_4_ * auVar108._24_4_ + auVar99._24_4_ * auVar99._24_4_) * fVar325;
    auVar38._28_4_ = auVar97._28_4_ + auVar98._28_4_;
    auVar97 = vmaxps_avx(auVar37,auVar38);
    auVar108 = vperm2f128_avx(auVar276,auVar276,1);
    auVar108 = vshufps_avx(auVar108,auVar276,0x30);
    auVar15 = vshufps_avx(auVar276,auVar108,0x29);
    local_600._0_4_ = auVar276._0_4_ + fVar223;
    local_600._4_4_ = auVar276._4_4_ + fVar255;
    local_600._8_4_ = auVar276._8_4_ + fVar228;
    local_600._12_4_ = auVar276._12_4_ + fVar261;
    local_600._16_4_ = auVar276._16_4_ + fVar293;
    local_600._20_4_ = auVar276._20_4_ + fVar297;
    local_600._24_4_ = auVar276._24_4_ + fVar232;
    local_600._28_4_ = auVar276._28_4_ + auVar214._28_4_;
    auVar108 = vmaxps_avx(auVar276,local_600);
    auVar10 = vmaxps_avx(auVar13,auVar15);
    auVar108 = vmaxps_avx(auVar108,auVar10);
    auVar10 = vrsqrtps_avx(auVar197);
    fVar231 = auVar10._0_4_;
    fVar223 = auVar10._4_4_;
    fVar255 = auVar10._8_4_;
    fVar228 = auVar10._12_4_;
    fVar261 = auVar10._16_4_;
    fVar293 = auVar10._20_4_;
    fVar297 = auVar10._24_4_;
    local_5a0 = fVar231 * 1.5 + fVar231 * fVar231 * fVar231 * auVar197._0_4_ * -0.5;
    fStack_59c = fVar223 * 1.5 + fVar223 * fVar223 * fVar223 * auVar197._4_4_ * -0.5;
    fStack_598 = fVar255 * 1.5 + fVar255 * fVar255 * fVar255 * auVar197._8_4_ * -0.5;
    fStack_594 = fVar228 * 1.5 + fVar228 * fVar228 * fVar228 * auVar197._12_4_ * -0.5;
    fStack_590 = fVar261 * 1.5 + fVar261 * fVar261 * fVar261 * auVar197._16_4_ * -0.5;
    fStack_58c = fVar293 * 1.5 + fVar293 * fVar293 * fVar293 * auVar197._20_4_ * -0.5;
    fStack_588 = fVar297 * 1.5 + fVar297 * fVar297 * fVar297 * auVar197._24_4_ * -0.5;
    fVar230 = 0.0;
    auVar214 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_a00 = vsubps_avx(auVar214,auVar388);
    auVar214 = vsubps_avx(auVar214,local_2e0);
    fVar331 = auVar214._0_4_;
    fVar336 = auVar214._4_4_;
    fVar337 = auVar214._8_4_;
    fVar338 = auVar214._12_4_;
    fVar339 = auVar214._16_4_;
    fVar340 = auVar214._20_4_;
    fVar341 = auVar214._24_4_;
    fVar223 = local_a00._0_4_;
    fVar228 = local_a00._4_4_;
    fVar293 = local_a00._8_4_;
    fVar232 = local_a00._12_4_;
    fVar262 = local_a00._16_4_;
    fVar298 = local_a00._20_4_;
    fVar324 = local_a00._24_4_;
    auVar70._4_4_ = fVar283;
    auVar70._0_4_ = fVar265;
    auVar70._8_4_ = fVar287;
    auVar70._12_4_ = fVar291;
    auVar70._16_4_ = fVar295;
    auVar70._20_4_ = fVar299;
    auVar70._24_4_ = fVar303;
    auVar70._28_4_ = fVar305;
    auVar215 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar214 = vsubps_avx(auVar215,auVar70);
    fVar255 = auVar214._0_4_;
    fVar261 = auVar214._4_4_;
    fVar297 = auVar214._8_4_;
    fVar252 = auVar214._12_4_;
    fVar264 = auVar214._16_4_;
    fVar302 = auVar214._20_4_;
    fVar325 = auVar214._24_4_;
    auVar358._0_4_ =
         (float)local_a20._0_4_ * fVar255 +
         (float)local_680._0_4_ * fVar223 + fVar331 * (float)local_920._0_4_;
    auVar358._4_4_ =
         (float)local_a20._4_4_ * fVar261 +
         (float)local_680._4_4_ * fVar228 + fVar336 * (float)local_920._4_4_;
    auVar358._8_4_ = fStack_a18 * fVar297 + fStack_678 * fVar293 + fVar337 * fStack_918;
    auVar358._12_4_ = fStack_a14 * fVar252 + fStack_674 * fVar232 + fVar338 * fStack_914;
    auVar358._16_4_ = fStack_a10 * fVar264 + fStack_670 * fVar262 + fVar339 * fStack_910;
    auVar358._20_4_ = fStack_a0c * fVar302 + fStack_66c * fVar298 + fVar340 * fStack_90c;
    auVar358._24_4_ = fStack_a08 * fVar325 + fStack_668 * fVar324 + fVar341 * fStack_908;
    auVar358._28_4_ = fVar368 + auVar99._28_4_ + auVar197._28_4_;
    auVar373._0_4_ = fVar255 * fVar255 + fVar223 * fVar223 + fVar331 * fVar331;
    auVar373._4_4_ = fVar261 * fVar261 + fVar228 * fVar228 + fVar336 * fVar336;
    auVar373._8_4_ = fVar297 * fVar297 + fVar293 * fVar293 + fVar337 * fVar337;
    auVar373._12_4_ = fVar252 * fVar252 + fVar232 * fVar232 + fVar338 * fVar338;
    auVar373._16_4_ = fVar264 * fVar264 + fVar262 * fVar262 + fVar339 * fVar339;
    auVar373._20_4_ = fVar302 * fVar302 + fVar298 * fVar298 + fVar340 * fVar340;
    auVar373._24_4_ = fVar325 * fVar325 + fVar324 * fVar324 + fVar341 * fVar341;
    auVar373._28_4_ = local_2e0._28_4_ + local_2e0._28_4_ + fVar368;
    local_540 = (float)local_a20._0_4_ * fVar222 * local_5a0 +
                local_5a0 * fVar221 * (float)local_680._0_4_ +
                fVar251 * local_5a0 * (float)local_920._0_4_;
    fStack_53c = (float)local_a20._4_4_ * fVar226 * fStack_59c +
                 fStack_59c * fVar224 * (float)local_680._4_4_ +
                 fVar257 * fStack_59c * (float)local_920._4_4_;
    fStack_538 = fStack_a18 * fVar285 * fStack_598 +
                 fStack_598 * fVar263 * fStack_678 + fVar281 * fStack_598 * fStack_918;
    fStack_534 = fStack_a14 * fVar227 * fStack_594 +
                 fStack_594 * fVar301 * fStack_674 + fVar225 * fStack_594 * fStack_914;
    fStack_530 = fStack_a10 * fVar258 * fStack_590 +
                 fStack_590 * fVar254 * fStack_670 + fVar256 * fStack_590 * fStack_910;
    fStack_52c = fStack_a0c * fVar290 * fStack_58c +
                 fStack_58c * fVar282 * fStack_66c + fVar286 * fStack_58c * fStack_90c;
    fStack_528 = fStack_a08 * fVar18 * fStack_588 +
                 fStack_588 * fVar350 * fStack_668 + fVar17 * fStack_588 * fStack_908;
    fVar231 = fStack_a04 + fStack_664 + fStack_904;
    local_5c0 = fVar255 * fVar222 * local_5a0 +
                local_5a0 * fVar221 * fVar223 + fVar331 * fVar251 * local_5a0;
    fStack_5bc = fVar261 * fVar226 * fStack_59c +
                 fStack_59c * fVar224 * fVar228 + fVar336 * fVar257 * fStack_59c;
    fStack_5b8 = fVar297 * fVar285 * fStack_598 +
                 fStack_598 * fVar263 * fVar293 + fVar337 * fVar281 * fStack_598;
    fStack_5b4 = fVar252 * fVar227 * fStack_594 +
                 fStack_594 * fVar301 * fVar232 + fVar338 * fVar225 * fStack_594;
    fStack_5b0 = fVar264 * fVar258 * fStack_590 +
                 fStack_590 * fVar254 * fVar262 + fVar339 * fVar256 * fStack_590;
    fStack_5ac = fVar302 * fVar290 * fStack_58c +
                 fStack_58c * fVar282 * fVar298 + fVar340 * fVar286 * fStack_58c;
    fStack_5a8 = fVar325 * fVar18 * fStack_588 +
                 fStack_588 * fVar350 * fVar324 + fVar341 * fVar17 * fStack_588;
    fStack_5a4 = fStack_664 + fVar231;
    auVar39._4_4_ = fStack_53c * fStack_5bc;
    auVar39._0_4_ = local_540 * local_5c0;
    auVar39._8_4_ = fStack_538 * fStack_5b8;
    auVar39._12_4_ = fStack_534 * fStack_5b4;
    auVar39._16_4_ = fStack_530 * fStack_5b0;
    auVar39._20_4_ = fStack_52c * fStack_5ac;
    auVar39._24_4_ = fStack_528 * fStack_5a8;
    auVar39._28_4_ = fVar231;
    auVar214 = vsubps_avx(auVar358,auVar39);
    auVar40._4_4_ = fStack_5bc * fStack_5bc;
    auVar40._0_4_ = local_5c0 * local_5c0;
    auVar40._8_4_ = fStack_5b8 * fStack_5b8;
    auVar40._12_4_ = fStack_5b4 * fStack_5b4;
    auVar40._16_4_ = fStack_5b0 * fStack_5b0;
    auVar40._20_4_ = fStack_5ac * fStack_5ac;
    auVar40._24_4_ = fStack_5a8 * fStack_5a8;
    auVar40._28_4_ = fStack_664;
    local_620 = vsubps_avx(auVar373,auVar40);
    local_660 = vsqrtps_avx(auVar97);
    fVar231 = (local_660._0_4_ + auVar108._0_4_) * 1.0000002;
    fVar368 = (local_660._4_4_ + auVar108._4_4_) * 1.0000002;
    fVar171 = (local_660._8_4_ + auVar108._8_4_) * 1.0000002;
    fVar172 = (local_660._12_4_ + auVar108._12_4_) * 1.0000002;
    fVar173 = (local_660._16_4_ + auVar108._16_4_) * 1.0000002;
    fVar174 = (local_660._20_4_ + auVar108._20_4_) * 1.0000002;
    fVar175 = (local_660._24_4_ + auVar108._24_4_) * 1.0000002;
    auVar41._4_4_ = fVar368 * fVar368;
    auVar41._0_4_ = fVar231 * fVar231;
    auVar41._8_4_ = fVar171 * fVar171;
    auVar41._12_4_ = fVar172 * fVar172;
    auVar41._16_4_ = fVar173 * fVar173;
    auVar41._20_4_ = fVar174 * fVar174;
    auVar41._24_4_ = fVar175 * fVar175;
    auVar41._28_4_ = local_660._28_4_ + auVar108._28_4_;
    local_9a0._0_4_ = auVar214._0_4_ + auVar214._0_4_;
    local_9a0._4_4_ = auVar214._4_4_ + auVar214._4_4_;
    local_9a0._8_4_ = auVar214._8_4_ + auVar214._8_4_;
    local_9a0._12_4_ = auVar214._12_4_ + auVar214._12_4_;
    local_9a0._16_4_ = auVar214._16_4_ + auVar214._16_4_;
    local_9a0._20_4_ = auVar214._20_4_ + auVar214._20_4_;
    local_9a0._24_4_ = auVar214._24_4_ + auVar214._24_4_;
    fVar231 = auVar214._28_4_;
    local_9a0._28_4_ = fVar231 + fVar231;
    auVar108 = vsubps_avx(local_620,auVar41);
    auVar42._4_4_ = fStack_53c * fStack_53c;
    auVar42._0_4_ = local_540 * local_540;
    auVar42._8_4_ = fStack_538 * fStack_538;
    auVar42._12_4_ = fStack_534 * fStack_534;
    auVar42._16_4_ = fStack_530 * fStack_530;
    auVar42._20_4_ = fStack_52c * fStack_52c;
    auVar42._24_4_ = fStack_528 * fStack_528;
    auVar42._28_4_ = fVar231;
    auVar214 = vsubps_avx(local_2c0,auVar42);
    auVar43._4_4_ = local_9a0._4_4_ * local_9a0._4_4_;
    auVar43._0_4_ = (float)local_9a0._0_4_ * (float)local_9a0._0_4_;
    auVar43._8_4_ = local_9a0._8_4_ * local_9a0._8_4_;
    auVar43._12_4_ = local_9a0._12_4_ * local_9a0._12_4_;
    auVar43._16_4_ = local_9a0._16_4_ * local_9a0._16_4_;
    auVar43._20_4_ = local_9a0._20_4_ * local_9a0._20_4_;
    auVar43._24_4_ = local_9a0._24_4_ * local_9a0._24_4_;
    auVar43._28_4_ = local_2c0._28_4_;
    fVar231 = auVar214._0_4_;
    local_640._0_4_ = fVar231 * 4.0;
    fVar368 = auVar214._4_4_;
    local_640._4_4_ = fVar368 * 4.0;
    fVar171 = auVar214._8_4_;
    fStack_638 = fVar171 * 4.0;
    fVar172 = auVar214._12_4_;
    fStack_634 = fVar172 * 4.0;
    fVar173 = auVar214._16_4_;
    fStack_630 = fVar173 * 4.0;
    fVar174 = auVar214._20_4_;
    fStack_62c = fVar174 * 4.0;
    fVar175 = auVar214._24_4_;
    fStack_628 = fVar175 * 4.0;
    uStack_624 = 0x40800000;
    auVar44._4_4_ = auVar108._4_4_ * (float)local_640._4_4_;
    auVar44._0_4_ = auVar108._0_4_ * (float)local_640._0_4_;
    auVar44._8_4_ = auVar108._8_4_ * fStack_638;
    auVar44._12_4_ = auVar108._12_4_ * fStack_634;
    auVar44._16_4_ = auVar108._16_4_ * fStack_630;
    auVar44._20_4_ = auVar108._20_4_ * fStack_62c;
    auVar44._24_4_ = auVar108._24_4_ * fStack_628;
    auVar44._28_4_ = 0x40800000;
    auVar244 = vsubps_avx(auVar43,auVar44);
    auVar97 = vcmpps_avx(auVar244,auVar215,5);
    auVar335 = ZEXT3264(auVar97);
    auVar103._8_4_ = 0x7fffffff;
    auVar103._0_8_ = 0x7fffffff7fffffff;
    auVar103._12_4_ = 0x7fffffff;
    auVar103._16_4_ = 0x7fffffff;
    auVar103._20_4_ = 0x7fffffff;
    auVar103._24_4_ = 0x7fffffff;
    auVar103._28_4_ = 0x7fffffff;
    local_440 = vandps_avx(auVar42,auVar103);
    local_340._0_4_ = fVar231 + fVar231;
    local_340._4_4_ = fVar368 + fVar368;
    local_340._8_4_ = fVar171 + fVar171;
    local_340._12_4_ = fVar172 + fVar172;
    local_340._16_4_ = fVar173 + fVar173;
    local_340._20_4_ = fVar174 + fVar174;
    local_340._24_4_ = fVar175 + fVar175;
    local_340._28_4_ = auVar214._28_4_ + auVar214._28_4_;
    local_980 = vandps_avx(auVar214,auVar103);
    uVar77 = CONCAT44(local_9a0._4_4_,local_9a0._0_4_);
    local_320._0_8_ = uVar77 ^ 0x8000000080000000;
    local_320._8_4_ = -local_9a0._8_4_;
    local_320._12_4_ = -local_9a0._12_4_;
    local_320._16_4_ = -local_9a0._16_4_;
    local_320._20_4_ = -local_9a0._20_4_;
    local_320._24_4_ = -local_9a0._24_4_;
    local_320._28_4_ = -local_9a0._28_4_;
    fStack_524 = fStack_a04 + fStack_664 + fStack_904;
    if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar97 >> 0x7f,0) == '\0') &&
          (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar97 >> 0xbf,0) == '\0') &&
        (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar97[0x1f]) {
      auVar389._8_4_ = 0x7f800000;
      auVar389._0_8_ = 0x7f8000007f800000;
      auVar389._12_4_ = 0x7f800000;
      auVar389._16_4_ = 0x7f800000;
      auVar389._20_4_ = 0x7f800000;
      auVar389._24_4_ = 0x7f800000;
      auVar389._28_4_ = 0x7f800000;
      auVar165._8_4_ = 0xff800000;
      auVar165._0_8_ = 0xff800000ff800000;
      auVar165._12_4_ = 0xff800000;
      auVar165._16_4_ = 0xff800000;
      auVar165._20_4_ = 0xff800000;
      auVar165._24_4_ = 0xff800000;
      auVar165._28_4_ = 0xff800000;
    }
    else {
      auVar98 = vsqrtps_avx(auVar244);
      auVar214 = vrcpps_avx(local_340);
      auVar97 = vcmpps_avx(auVar244,auVar215,5);
      fVar230 = auVar97._28_4_;
      fVar231 = auVar214._0_4_;
      fVar368 = auVar214._4_4_;
      auVar45._4_4_ = local_340._4_4_ * fVar368;
      auVar45._0_4_ = local_340._0_4_ * fVar231;
      fVar171 = auVar214._8_4_;
      auVar45._8_4_ = local_340._8_4_ * fVar171;
      fVar172 = auVar214._12_4_;
      auVar45._12_4_ = local_340._12_4_ * fVar172;
      fVar173 = auVar214._16_4_;
      auVar45._16_4_ = local_340._16_4_ * fVar173;
      fVar174 = auVar214._20_4_;
      auVar45._20_4_ = local_340._20_4_ * fVar174;
      fVar175 = auVar214._24_4_;
      auVar45._24_4_ = local_340._24_4_ * fVar175;
      auVar45._28_4_ = auVar244._28_4_;
      auVar104._8_4_ = 0x3f800000;
      auVar104._0_8_ = 0x3f8000003f800000;
      auVar104._12_4_ = 0x3f800000;
      auVar104._16_4_ = 0x3f800000;
      auVar104._20_4_ = 0x3f800000;
      auVar104._24_4_ = 0x3f800000;
      auVar104._28_4_ = 0x3f800000;
      auVar244 = vsubps_avx(auVar104,auVar45);
      fVar231 = fVar231 + fVar231 * auVar244._0_4_;
      fVar368 = fVar368 + fVar368 * auVar244._4_4_;
      fVar171 = fVar171 + fVar171 * auVar244._8_4_;
      fVar172 = fVar172 + fVar172 * auVar244._12_4_;
      fVar173 = fVar173 + fVar173 * auVar244._16_4_;
      fVar174 = fVar174 + fVar174 * auVar244._20_4_;
      fVar175 = fVar175 + fVar175 * auVar244._24_4_;
      auVar215 = vsubps_avx(local_320,auVar98);
      fVar266 = auVar215._0_4_ * fVar231;
      fVar284 = auVar215._4_4_ * fVar368;
      auVar46._4_4_ = fVar284;
      auVar46._0_4_ = fVar266;
      fVar288 = auVar215._8_4_ * fVar171;
      auVar46._8_4_ = fVar288;
      fVar292 = auVar215._12_4_ * fVar172;
      auVar46._12_4_ = fVar292;
      fVar296 = auVar215._16_4_ * fVar173;
      auVar46._16_4_ = fVar296;
      fVar300 = auVar215._20_4_ * fVar174;
      auVar46._20_4_ = fVar300;
      fVar304 = auVar215._24_4_ * fVar175;
      auVar46._24_4_ = fVar304;
      auVar46._28_4_ = auVar215._28_4_;
      auVar215 = vsubps_avx(auVar98,local_9a0);
      fVar231 = auVar215._0_4_ * fVar231;
      fVar368 = auVar215._4_4_ * fVar368;
      auVar47._4_4_ = fVar368;
      auVar47._0_4_ = fVar231;
      fVar171 = auVar215._8_4_ * fVar171;
      auVar47._8_4_ = fVar171;
      fVar172 = auVar215._12_4_ * fVar172;
      auVar47._12_4_ = fVar172;
      fVar173 = auVar215._16_4_ * fVar173;
      auVar47._16_4_ = fVar173;
      fVar174 = auVar215._20_4_ * fVar174;
      auVar47._20_4_ = fVar174;
      fVar175 = auVar215._24_4_ * fVar175;
      auVar47._24_4_ = fVar175;
      auVar47._28_4_ = auVar214._28_4_ + auVar244._28_4_;
      fStack_404 = fStack_5a4 + auVar215._28_4_;
      local_420 = local_5a0 * (local_5c0 + local_540 * fVar266);
      fStack_41c = fStack_59c * (fStack_5bc + fStack_53c * fVar284);
      fStack_418 = fStack_598 * (fStack_5b8 + fStack_538 * fVar288);
      fStack_414 = fStack_594 * (fStack_5b4 + fStack_534 * fVar292);
      fStack_410 = fStack_590 * (fStack_5b0 + fStack_530 * fVar296);
      fStack_40c = fStack_58c * (fStack_5ac + fStack_52c * fVar300);
      fStack_408 = fStack_588 * (fStack_5a8 + fStack_528 * fVar304);
      local_400 = local_5a0 * (local_5c0 + local_540 * fVar231);
      fStack_3fc = fStack_59c * (fStack_5bc + fStack_53c * fVar368);
      fStack_3f8 = fStack_598 * (fStack_5b8 + fStack_538 * fVar171);
      fStack_3f4 = fStack_594 * (fStack_5b4 + fStack_534 * fVar172);
      fStack_3f0 = fStack_590 * (fStack_5b0 + fStack_530 * fVar173);
      fStack_3ec = fStack_58c * (fStack_5ac + fStack_52c * fVar174);
      fStack_3e8 = fStack_588 * (fStack_5a8 + fStack_528 * fVar175);
      fStack_3e4 = fStack_5a4 + fStack_404;
      auVar241._8_4_ = 0x7f800000;
      auVar241._0_8_ = 0x7f8000007f800000;
      auVar241._12_4_ = 0x7f800000;
      auVar241._16_4_ = 0x7f800000;
      auVar241._20_4_ = 0x7f800000;
      auVar241._24_4_ = 0x7f800000;
      auVar241._28_4_ = 0x7f800000;
      auVar389 = vblendvps_avx(auVar241,auVar46,auVar97);
      auVar242._8_4_ = 0xff800000;
      auVar242._0_8_ = 0xff800000ff800000;
      auVar242._12_4_ = 0xff800000;
      auVar242._16_4_ = 0xff800000;
      auVar242._20_4_ = 0xff800000;
      auVar242._24_4_ = 0xff800000;
      auVar242._28_4_ = 0xff800000;
      auVar165 = vblendvps_avx(auVar242,auVar47,auVar97);
      auVar214 = vmaxps_avx(local_580,local_440);
      auVar48._4_4_ = auVar214._4_4_ * 1.9073486e-06;
      auVar48._0_4_ = auVar214._0_4_ * 1.9073486e-06;
      auVar48._8_4_ = auVar214._8_4_ * 1.9073486e-06;
      auVar48._12_4_ = auVar214._12_4_ * 1.9073486e-06;
      auVar48._16_4_ = auVar214._16_4_ * 1.9073486e-06;
      auVar48._20_4_ = auVar214._20_4_ * 1.9073486e-06;
      auVar48._24_4_ = auVar214._24_4_ * 1.9073486e-06;
      auVar48._28_4_ = auVar214._28_4_;
      auVar214 = vcmpps_avx(local_980,auVar48,1);
      auVar244 = auVar97 & auVar214;
      if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar244 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar244 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar244 >> 0x7f,0) != '\0') ||
            (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar244 >> 0xbf,0) != '\0') ||
          (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar244[0x1f] < '\0') {
        auVar214 = vandps_avx(auVar214,auVar97);
        auVar181 = vpackssdw_avx(auVar214._0_16_,auVar214._16_16_);
        auVar244 = vcmpps_avx(auVar108,_DAT_01f7b000,2);
        auVar330._8_4_ = 0xff800000;
        auVar330._0_8_ = 0xff800000ff800000;
        auVar330._12_4_ = 0xff800000;
        auVar330._16_4_ = 0xff800000;
        auVar330._20_4_ = 0xff800000;
        auVar330._24_4_ = 0xff800000;
        auVar330._28_4_ = 0xff800000;
        auVar360._8_4_ = 0x7f800000;
        auVar360._0_8_ = 0x7f8000007f800000;
        auVar360._12_4_ = 0x7f800000;
        auVar360._16_4_ = 0x7f800000;
        auVar360._20_4_ = 0x7f800000;
        auVar360._24_4_ = 0x7f800000;
        auVar360._28_4_ = 0x7f800000;
        auVar108 = vblendvps_avx(auVar360,auVar330,auVar244);
        auVar269 = vpmovsxwd_avx(auVar181);
        auVar181 = vpunpckhwd_avx(auVar181,auVar181);
        auVar279._16_16_ = auVar181;
        auVar279._0_16_ = auVar269;
        auVar389 = vblendvps_avx(auVar389,auVar108,auVar279);
        auVar108 = vblendvps_avx(auVar330,auVar360,auVar244);
        auVar165 = vblendvps_avx(auVar165,auVar108,auVar279);
        auVar250._0_8_ = auVar214._0_8_ ^ 0xffffffffffffffff;
        auVar250._8_4_ = auVar214._8_4_ ^ 0xffffffff;
        auVar250._12_4_ = auVar214._12_4_ ^ 0xffffffff;
        auVar250._16_4_ = auVar214._16_4_ ^ 0xffffffff;
        auVar250._20_4_ = auVar214._20_4_ ^ 0xffffffff;
        auVar250._24_4_ = auVar214._24_4_ ^ 0xffffffff;
        auVar250._28_4_ = auVar214._28_4_ ^ 0xffffffff;
        auVar108 = vorps_avx(auVar244,auVar250);
        auVar97 = vandps_avx(auVar97,auVar108);
        auVar335 = ZEXT3264(auVar97);
      }
    }
    auVar317 = ZEXT3264(local_aa0);
    auVar97 = local_500 & auVar335._0_32_;
    auVar280 = ZEXT3264(local_960);
    fVar231 = (float)local_880._0_4_;
    fVar368 = (float)local_880._4_4_;
    fVar171 = fStack_878;
    fVar172 = fStack_874;
    fVar173 = fStack_870;
    fVar174 = fStack_86c;
    fVar175 = fStack_868;
    fVar266 = fStack_864;
    if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar97 >> 0x7f,0) == '\0') &&
          (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar97 >> 0xbf,0) == '\0') &&
        (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar97[0x1f]) {
      auVar361 = ZEXT3264(local_820);
      auVar335 = ZEXT3264(local_9e0);
    }
    else {
      fStack_584 = auVar10._28_4_ + auVar197._28_4_;
      auVar317 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      auVar181 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8d0._0_4_));
      auVar181 = vshufps_avx(auVar181,auVar181,0);
      auVar243._16_16_ = auVar181;
      auVar243._0_16_ = auVar181;
      auVar214 = vminps_avx(auVar243,auVar165);
      auVar105._0_4_ =
           (float)local_a20._0_4_ * fVar355 +
           (float)local_680._0_4_ * fVar342 + fVar369 * (float)local_920._0_4_;
      auVar105._4_4_ =
           (float)local_a20._4_4_ * fVar362 +
           (float)local_680._4_4_ * fVar348 + fVar374 * (float)local_920._4_4_;
      auVar105._8_4_ = fStack_a18 * fVar363 + fStack_678 * fVar349 + fVar376 * fStack_918;
      auVar105._12_4_ = fStack_a14 * fVar364 + fStack_674 * fVar351 + fVar378 * fStack_914;
      auVar105._16_4_ = fStack_a10 * fVar365 + fStack_670 * fVar352 + fVar380 * fStack_910;
      auVar105._20_4_ = fStack_a0c * fVar366 + fStack_66c * fVar353 + fVar382 * fStack_90c;
      auVar105._24_4_ = fStack_a08 * fVar367 + fStack_668 * fVar354 + fVar384 * fStack_908;
      auVar105._28_4_ = fVar386 + auVar344._28_4_ + fVar386;
      auVar10 = vrcpps_avx(auVar105);
      fVar386 = auVar10._0_4_;
      fVar284 = auVar10._4_4_;
      auVar49._4_4_ = auVar105._4_4_ * fVar284;
      auVar49._0_4_ = auVar105._0_4_ * fVar386;
      fVar288 = auVar10._8_4_;
      auVar49._8_4_ = auVar105._8_4_ * fVar288;
      fVar292 = auVar10._12_4_;
      auVar49._12_4_ = auVar105._12_4_ * fVar292;
      fVar296 = auVar10._16_4_;
      auVar49._16_4_ = auVar105._16_4_ * fVar296;
      fVar300 = auVar10._20_4_;
      auVar49._20_4_ = auVar105._20_4_ * fVar300;
      fVar304 = auVar10._24_4_;
      auVar49._24_4_ = auVar105._24_4_ * fVar304;
      auVar49._28_4_ = fVar230 + auVar181._12_4_;
      auVar334._8_4_ = 0x3f800000;
      auVar334._0_8_ = 0x3f8000003f800000;
      auVar334._12_4_ = 0x3f800000;
      auVar334._16_4_ = 0x3f800000;
      auVar334._20_4_ = 0x3f800000;
      auVar334._24_4_ = 0x3f800000;
      auVar334._28_4_ = 0x3f800000;
      auVar244 = vsubps_avx(auVar334,auVar49);
      auVar277._8_4_ = 0x7fffffff;
      auVar277._0_8_ = 0x7fffffff7fffffff;
      auVar277._12_4_ = 0x7fffffff;
      auVar277._16_4_ = 0x7fffffff;
      auVar277._20_4_ = 0x7fffffff;
      auVar277._24_4_ = 0x7fffffff;
      auVar277._28_4_ = 0x7fffffff;
      auVar97 = vandps_avx(auVar105,auVar277);
      auVar314._8_4_ = 0x219392ef;
      auVar314._0_8_ = 0x219392ef219392ef;
      auVar314._12_4_ = 0x219392ef;
      auVar314._16_4_ = 0x219392ef;
      auVar314._20_4_ = 0x219392ef;
      auVar314._24_4_ = 0x219392ef;
      auVar314._28_4_ = 0x219392ef;
      auVar108 = vcmpps_avx(auVar97,auVar314,1);
      auVar50._4_4_ =
           (fVar284 + fVar284 * auVar244._4_4_) *
           -(fVar261 * fVar362 + fVar348 * fVar228 + fVar336 * fVar374);
      auVar50._0_4_ =
           (fVar386 + fVar386 * auVar244._0_4_) *
           -(fVar255 * fVar355 + fVar342 * fVar223 + fVar331 * fVar369);
      auVar50._8_4_ =
           (fVar288 + fVar288 * auVar244._8_4_) *
           -(fVar297 * fVar363 + fVar349 * fVar293 + fVar337 * fVar376);
      auVar50._12_4_ =
           (fVar292 + fVar292 * auVar244._12_4_) *
           -(fVar252 * fVar364 + fVar351 * fVar232 + fVar338 * fVar378);
      auVar50._16_4_ =
           (fVar296 + fVar296 * auVar244._16_4_) *
           -(fVar264 * fVar365 + fVar352 * fVar262 + fVar339 * fVar380);
      auVar50._20_4_ =
           (fVar300 + fVar300 * auVar244._20_4_) *
           -(fVar302 * fVar366 + fVar353 * fVar298 + fVar340 * fVar382);
      auVar50._24_4_ =
           (fVar304 + fVar304 * auVar244._24_4_) *
           -(fVar325 * fVar367 + fVar354 * fVar324 + fVar341 * fVar384);
      auVar50._28_4_ = auVar10._28_4_ + auVar244._28_4_;
      auVar97 = vcmpps_avx(auVar105,ZEXT832(0) << 0x20,1);
      auVar97 = vorps_avx(auVar108,auVar97);
      auVar329._8_4_ = 0xff800000;
      auVar329._0_8_ = 0xff800000ff800000;
      auVar329._12_4_ = 0xff800000;
      auVar329._16_4_ = 0xff800000;
      auVar329._20_4_ = 0xff800000;
      auVar329._24_4_ = 0xff800000;
      auVar329._28_4_ = 0xff800000;
      auVar97 = vblendvps_avx(auVar50,auVar329,auVar97);
      auVar10 = vcmpps_avx(auVar105,ZEXT832(0) << 0x20,6);
      auVar108 = vorps_avx(auVar108,auVar10);
      auVar359._8_4_ = 0x7f800000;
      auVar359._0_8_ = 0x7f8000007f800000;
      auVar359._12_4_ = 0x7f800000;
      auVar359._16_4_ = 0x7f800000;
      auVar359._20_4_ = 0x7f800000;
      auVar359._24_4_ = 0x7f800000;
      auVar359._28_4_ = 0x7f800000;
      auVar108 = vblendvps_avx(auVar50,auVar359,auVar108);
      auVar10 = vmaxps_avx(local_3c0,auVar389);
      auVar10 = vmaxps_avx(auVar10,auVar97);
      auVar214 = vminps_avx(auVar214,auVar108);
      auVar244 = ZEXT832(0) << 0x20;
      auVar97 = vsubps_avx(auVar244,auVar11);
      auVar108 = vsubps_avx(auVar244,auVar12);
      auVar51._4_4_ = auVar108._4_4_ * -fVar115;
      auVar51._0_4_ = auVar108._0_4_ * -fVar84;
      auVar51._8_4_ = auVar108._8_4_ * -fVar117;
      auVar51._12_4_ = auVar108._12_4_ * -fVar119;
      auVar51._16_4_ = auVar108._16_4_ * -fVar120;
      auVar51._20_4_ = auVar108._20_4_ * -fVar121;
      auVar51._24_4_ = auVar108._24_4_ * -fVar122;
      auVar51._28_4_ = auVar108._28_4_;
      auVar52._4_4_ = fVar259 * auVar97._4_4_;
      auVar52._0_4_ = fVar253 * auVar97._0_4_;
      auVar52._8_4_ = fVar289 * auVar97._8_4_;
      auVar52._12_4_ = fVar229 * auVar97._12_4_;
      auVar52._16_4_ = fVar260 * auVar97._16_4_;
      auVar52._20_4_ = fVar294 * auVar97._20_4_;
      auVar52._24_4_ = fVar19 * auVar97._24_4_;
      auVar52._28_4_ = auVar97._28_4_;
      auVar97 = vsubps_avx(auVar51,auVar52);
      auVar108 = vsubps_avx(auVar244,auVar14);
      auVar53._4_4_ = fVar375 * auVar108._4_4_;
      auVar53._0_4_ = fVar370 * auVar108._0_4_;
      auVar53._8_4_ = fVar377 * auVar108._8_4_;
      auVar53._12_4_ = fVar379 * auVar108._12_4_;
      auVar53._16_4_ = fVar381 * auVar108._16_4_;
      auVar53._20_4_ = fVar383 * auVar108._20_4_;
      uVar80 = auVar108._28_4_;
      auVar53._24_4_ = fVar385 * auVar108._24_4_;
      auVar53._28_4_ = uVar80;
      auVar11 = vsubps_avx(auVar97,auVar53);
      auVar54._4_4_ = -fVar115 * (float)local_920._4_4_;
      auVar54._0_4_ = -fVar84 * (float)local_920._0_4_;
      auVar54._8_4_ = -fVar117 * fStack_918;
      auVar54._12_4_ = -fVar119 * fStack_914;
      auVar54._16_4_ = -fVar120 * fStack_910;
      auVar54._20_4_ = -fVar121 * fStack_90c;
      auVar54._24_4_ = -fVar122 * fStack_908;
      auVar54._28_4_ = local_900._28_4_ ^ 0x80000000;
      auVar55._4_4_ = (float)local_680._4_4_ * fVar259;
      auVar55._0_4_ = (float)local_680._0_4_ * fVar253;
      auVar55._8_4_ = fStack_678 * fVar289;
      auVar55._12_4_ = fStack_674 * fVar229;
      auVar55._16_4_ = fStack_670 * fVar260;
      auVar55._20_4_ = fStack_66c * fVar294;
      auVar55._24_4_ = fStack_668 * fVar19;
      auVar55._28_4_ = uVar80;
      auVar345._8_4_ = 0x3f800000;
      auVar345._0_8_ = 0x3f8000003f800000;
      auVar345._12_4_ = 0x3f800000;
      auVar345._16_4_ = 0x3f800000;
      auVar345._20_4_ = 0x3f800000;
      auVar345._24_4_ = 0x3f800000;
      auVar345._28_4_ = 0x3f800000;
      auVar97 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = (float)local_a20._4_4_ * fVar375;
      auVar56._0_4_ = (float)local_a20._0_4_ * fVar370;
      auVar56._8_4_ = fStack_a18 * fVar377;
      auVar56._12_4_ = fStack_a14 * fVar379;
      auVar56._16_4_ = fStack_a10 * fVar381;
      auVar56._20_4_ = fStack_a0c * fVar383;
      auVar56._24_4_ = fStack_a08 * fVar385;
      auVar56._28_4_ = uVar80;
      auVar12 = vsubps_avx(auVar97,auVar56);
      auVar97 = vrcpps_avx(auVar12);
      fVar253 = auVar97._0_4_;
      auVar245._0_4_ = auVar12._0_4_ * fVar253;
      fVar223 = auVar97._4_4_;
      auVar245._4_4_ = auVar12._4_4_ * fVar223;
      fVar255 = auVar97._8_4_;
      auVar245._8_4_ = auVar12._8_4_ * fVar255;
      fVar259 = auVar97._12_4_;
      auVar245._12_4_ = auVar12._12_4_ * fVar259;
      fVar228 = auVar97._16_4_;
      auVar245._16_4_ = auVar12._16_4_ * fVar228;
      fVar261 = auVar97._20_4_;
      auVar245._20_4_ = auVar12._20_4_ * fVar261;
      fVar289 = auVar97._24_4_;
      auVar245._24_4_ = auVar12._24_4_ * fVar289;
      auVar245._28_4_ = 0;
      auVar244 = vsubps_avx(auVar345,auVar245);
      auVar106._8_4_ = 0x7fffffff;
      auVar106._0_8_ = 0x7fffffff7fffffff;
      auVar106._12_4_ = 0x7fffffff;
      auVar106._16_4_ = 0x7fffffff;
      auVar106._20_4_ = 0x7fffffff;
      auVar106._24_4_ = 0x7fffffff;
      auVar106._28_4_ = 0x7fffffff;
      auVar97 = vandps_avx(auVar12,auVar106);
      auVar108 = vcmpps_avx(auVar97,auVar314,1);
      auVar57._4_4_ = (fVar223 + fVar223 * auVar244._4_4_) * -auVar11._4_4_;
      auVar57._0_4_ = (fVar253 + fVar253 * auVar244._0_4_) * -auVar11._0_4_;
      auVar57._8_4_ = (fVar255 + fVar255 * auVar244._8_4_) * -auVar11._8_4_;
      auVar57._12_4_ = (fVar259 + fVar259 * auVar244._12_4_) * -auVar11._12_4_;
      auVar57._16_4_ = (fVar228 + fVar228 * auVar244._16_4_) * -auVar11._16_4_;
      auVar57._20_4_ = (fVar261 + fVar261 * auVar244._20_4_) * -auVar11._20_4_;
      auVar57._24_4_ = (fVar289 + fVar289 * auVar244._24_4_) * -auVar11._24_4_;
      auVar57._28_4_ = auVar11._28_4_ ^ 0x80000000;
      auVar97 = vcmpps_avx(auVar12,ZEXT832(0) << 0x20,1);
      auVar97 = vorps_avx(auVar108,auVar97);
      auVar97 = vblendvps_avx(auVar57,auVar329,auVar97);
      local_6a0 = vmaxps_avx(auVar10,auVar97);
      auVar97 = vcmpps_avx(auVar12,ZEXT832(0) << 0x20,6);
      auVar97 = vorps_avx(auVar108,auVar97);
      auVar108 = vblendvps_avx(auVar57,auVar359,auVar97);
      auVar97 = vandps_avx(auVar335._0_32_,local_500);
      local_460 = vminps_avx(auVar214,auVar108);
      auVar108 = vcmpps_avx(local_6a0,local_460,2);
      auVar10 = auVar97 & auVar108;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') {
        auVar10 = vminps_avx(auVar276,local_600);
        auVar11 = vminps_avx(auVar13,auVar15);
        auVar10 = vminps_avx(auVar10,auVar11);
        auVar10 = vsubps_avx(auVar10,local_660);
        auVar97 = vandps_avx(auVar108,auVar97);
        auVar71._4_4_ = fStack_41c;
        auVar71._0_4_ = local_420;
        auVar71._8_4_ = fStack_418;
        auVar71._12_4_ = fStack_414;
        auVar71._16_4_ = fStack_410;
        auVar71._20_4_ = fStack_40c;
        auVar71._24_4_ = fStack_408;
        auVar71._28_4_ = fStack_404;
        auVar108 = vminps_avx(auVar71,auVar345);
        auVar211 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar108 = vmaxps_avx(auVar108,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar83 + fVar123 * (auVar108._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar114 + fVar155 * (auVar108._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar116 + fVar156 * (auVar108._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar118 + fVar157 * (auVar108._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar83 + fVar123 * (auVar108._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar114 + fVar155 * (auVar108._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar116 + fVar156 * (auVar108._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar118 + auVar108._28_4_ + 7.0;
        auVar72._4_4_ = fStack_3fc;
        auVar72._0_4_ = local_400;
        auVar72._8_4_ = fStack_3f8;
        auVar72._12_4_ = fStack_3f4;
        auVar72._16_4_ = fStack_3f0;
        auVar72._20_4_ = fStack_3ec;
        auVar72._24_4_ = fStack_3e8;
        auVar72._28_4_ = fStack_3e4;
        auVar108 = vminps_avx(auVar72,auVar345);
        auVar108 = vmaxps_avx(auVar108,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar83 + fVar123 * (auVar108._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar114 + fVar155 * (auVar108._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar116 + fVar156 * (auVar108._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar118 + fVar157 * (auVar108._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar83 + fVar123 * (auVar108._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar114 + fVar155 * (auVar108._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar116 + fVar156 * (auVar108._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar118 + auVar108._28_4_ + 7.0;
        auVar58._4_4_ = auVar10._4_4_ * 0.99999976;
        auVar58._0_4_ = auVar10._0_4_ * 0.99999976;
        auVar58._8_4_ = auVar10._8_4_ * 0.99999976;
        auVar58._12_4_ = auVar10._12_4_ * 0.99999976;
        auVar58._16_4_ = auVar10._16_4_ * 0.99999976;
        auVar58._20_4_ = auVar10._20_4_ * 0.99999976;
        auVar58._24_4_ = auVar10._24_4_ * 0.99999976;
        auVar58._28_4_ = 0x3f7ffffc;
        auVar108 = vmaxps_avx(ZEXT832(0) << 0x20,auVar58);
        auVar59._4_4_ = auVar108._4_4_ * auVar108._4_4_;
        auVar59._0_4_ = auVar108._0_4_ * auVar108._0_4_;
        auVar59._8_4_ = auVar108._8_4_ * auVar108._8_4_;
        auVar59._12_4_ = auVar108._12_4_ * auVar108._12_4_;
        auVar59._16_4_ = auVar108._16_4_ * auVar108._16_4_;
        auVar59._20_4_ = auVar108._20_4_ * auVar108._20_4_;
        auVar59._24_4_ = auVar108._24_4_ * auVar108._24_4_;
        auVar59._28_4_ = auVar108._28_4_;
        local_a60 = vsubps_avx(local_620,auVar59);
        auVar60._4_4_ = local_a60._4_4_ * (float)local_640._4_4_;
        auVar60._0_4_ = local_a60._0_4_ * (float)local_640._0_4_;
        auVar60._8_4_ = local_a60._8_4_ * fStack_638;
        auVar60._12_4_ = local_a60._12_4_ * fStack_634;
        auVar60._16_4_ = local_a60._16_4_ * fStack_630;
        auVar60._20_4_ = local_a60._20_4_ * fStack_62c;
        auVar60._24_4_ = local_a60._24_4_ * fStack_628;
        auVar60._28_4_ = auVar108._28_4_;
        auVar10 = vsubps_avx(auVar43,auVar60);
        auVar108 = vcmpps_avx(auVar10,ZEXT832(0) << 0x20,5);
        if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar108 >> 0x7f,0) == '\0') &&
              (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar108 >> 0xbf,0) == '\0') &&
            (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar108[0x1f]) {
          auVar272 = ZEXT828(0) << 0x20;
          auVar238 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar392 = ZEXT1628(ZEXT816(0) << 0x40);
          _local_ae0 = ZEXT832(0) << 0x20;
          auVar315._8_4_ = 0x7f800000;
          auVar315._0_8_ = 0x7f8000007f800000;
          auVar315._12_4_ = 0x7f800000;
          auVar315._16_4_ = 0x7f800000;
          auVar315._20_4_ = 0x7f800000;
          auVar315._24_4_ = 0x7f800000;
          auVar315._28_4_ = 0x7f800000;
          auVar346._8_4_ = 0xff800000;
          auVar346._0_8_ = 0xff800000ff800000;
          auVar346._12_4_ = 0xff800000;
          auVar346._16_4_ = 0xff800000;
          auVar346._20_4_ = 0xff800000;
          auVar346._24_4_ = 0xff800000;
          auVar346._28_4_ = 0xff800000;
          _local_ac0 = _local_ae0;
          local_a60 = auVar14;
        }
        else {
          auVar11 = vrcpps_avx(local_340);
          fVar253 = auVar11._0_4_;
          auVar216._0_4_ = local_340._0_4_ * fVar253;
          fVar223 = auVar11._4_4_;
          auVar216._4_4_ = local_340._4_4_ * fVar223;
          fVar255 = auVar11._8_4_;
          auVar216._8_4_ = local_340._8_4_ * fVar255;
          fVar259 = auVar11._12_4_;
          auVar216._12_4_ = local_340._12_4_ * fVar259;
          fVar228 = auVar11._16_4_;
          auVar216._16_4_ = local_340._16_4_ * fVar228;
          fVar261 = auVar11._20_4_;
          auVar216._20_4_ = local_340._20_4_ * fVar261;
          fVar289 = auVar11._24_4_;
          auVar216._24_4_ = local_340._24_4_ * fVar289;
          auVar216._28_4_ = 0;
          auVar13 = vsubps_avx(auVar345,auVar216);
          auVar12 = vsqrtps_avx(auVar10);
          fVar253 = fVar253 + fVar253 * auVar13._0_4_;
          fVar223 = fVar223 + fVar223 * auVar13._4_4_;
          fVar255 = fVar255 + fVar255 * auVar13._8_4_;
          fVar259 = fVar259 + fVar259 * auVar13._12_4_;
          fVar228 = fVar228 + fVar228 * auVar13._16_4_;
          fVar261 = fVar261 + fVar261 * auVar13._20_4_;
          fVar289 = fVar289 + fVar289 * auVar13._24_4_;
          auVar14 = vsubps_avx(local_320,auVar12);
          auVar280._0_4_ = auVar14._0_4_ * fVar253;
          auVar280._4_4_ = auVar14._4_4_ * fVar223;
          auVar280._8_4_ = auVar14._8_4_ * fVar255;
          auVar280._12_4_ = auVar14._12_4_ * fVar259;
          auVar280._16_4_ = auVar14._16_4_ * fVar228;
          auVar280._20_4_ = auVar14._20_4_ * fVar261;
          auVar280._28_36_ = auVar335._28_36_;
          auVar280._24_4_ = auVar14._24_4_ * fVar289;
          auVar14 = vsubps_avx(auVar12,local_9a0);
          fVar253 = auVar14._0_4_ * fVar253;
          fVar223 = auVar14._4_4_ * fVar223;
          auVar61._4_4_ = fVar223;
          auVar61._0_4_ = fVar253;
          fVar255 = auVar14._8_4_ * fVar255;
          auVar61._8_4_ = fVar255;
          fVar259 = auVar14._12_4_ * fVar259;
          auVar61._12_4_ = fVar259;
          fVar228 = auVar14._16_4_ * fVar228;
          auVar61._16_4_ = fVar228;
          fVar261 = auVar14._20_4_ * fVar261;
          auVar61._20_4_ = fVar261;
          fVar289 = auVar14._24_4_ * fVar289;
          auVar61._24_4_ = fVar289;
          auVar61._28_4_ = fVar157;
          fVar293 = (auVar280._0_4_ * local_540 + local_5c0) * local_5a0;
          fVar297 = (auVar280._4_4_ * fStack_53c + fStack_5bc) * fStack_59c;
          fVar229 = (auVar280._8_4_ * fStack_538 + fStack_5b8) * fStack_598;
          fVar232 = (auVar280._12_4_ * fStack_534 + fStack_5b4) * fStack_594;
          fVar252 = (auVar280._16_4_ * fStack_530 + fStack_5b0) * fStack_590;
          fVar260 = (auVar280._20_4_ * fStack_52c + fStack_5ac) * fStack_58c;
          fVar262 = (auVar280._24_4_ * fStack_528 + fStack_5a8) * fStack_588;
          auVar166._0_4_ = fVar265 + fVar293 * fVar222;
          auVar166._4_4_ = fVar283 + fVar297 * fVar226;
          auVar166._8_4_ = fVar287 + fVar229 * fVar285;
          auVar166._12_4_ = fVar291 + fVar232 * fVar227;
          auVar166._16_4_ = fVar295 + fVar252 * fVar258;
          auVar166._20_4_ = fVar299 + fVar260 * fVar290;
          auVar166._24_4_ = fVar303 + fVar262 * fVar18;
          auVar166._28_4_ = fVar305 + auVar11._28_4_ + auVar13._28_4_ + fStack_5a4;
          auVar62._4_4_ = auVar280._4_4_ * (float)local_a20._4_4_;
          auVar62._0_4_ = auVar280._0_4_ * (float)local_a20._0_4_;
          auVar62._8_4_ = auVar280._8_4_ * fStack_a18;
          auVar62._12_4_ = auVar280._12_4_ * fStack_a14;
          auVar62._16_4_ = auVar280._16_4_ * fStack_a10;
          auVar62._20_4_ = auVar280._20_4_ * fStack_a0c;
          auVar62._24_4_ = auVar280._24_4_ * fStack_a08;
          auVar62._28_4_ = auVar12._28_4_;
          local_940 = vsubps_avx(auVar62,auVar166);
          auVar246._0_4_ = auVar388._0_4_ + fVar293 * fVar221;
          auVar246._4_4_ = auVar388._4_4_ + fVar297 * fVar224;
          auVar246._8_4_ = auVar388._8_4_ + fVar229 * fVar263;
          auVar246._12_4_ = auVar388._12_4_ + fVar232 * fVar301;
          auVar246._16_4_ = auVar388._16_4_ + fVar252 * fVar254;
          auVar246._20_4_ = auVar388._20_4_ + fVar260 * fVar282;
          auVar246._24_4_ = auVar388._24_4_ + fVar262 * fVar350;
          auVar246._28_4_ = auVar388._28_4_ + auVar12._28_4_;
          auVar63._4_4_ = (float)local_680._4_4_ * auVar280._4_4_;
          auVar63._0_4_ = (float)local_680._0_4_ * auVar280._0_4_;
          auVar63._8_4_ = fStack_678 * auVar280._8_4_;
          auVar63._12_4_ = fStack_674 * auVar280._12_4_;
          auVar63._16_4_ = fStack_670 * auVar280._16_4_;
          auVar63._20_4_ = fStack_66c * auVar280._20_4_;
          auVar63._24_4_ = fStack_668 * auVar280._24_4_;
          auVar63._28_4_ = 0x3e000000;
          _local_ac0 = vsubps_avx(auVar63,auVar246);
          auVar217._0_4_ = local_2e0._0_4_ + fVar251 * fVar293;
          auVar217._4_4_ = local_2e0._4_4_ + fVar257 * fVar297;
          auVar217._8_4_ = local_2e0._8_4_ + fVar281 * fVar229;
          auVar217._12_4_ = local_2e0._12_4_ + fVar225 * fVar232;
          auVar217._16_4_ = local_2e0._16_4_ + fVar256 * fVar252;
          auVar217._20_4_ = local_2e0._20_4_ + fVar286 * fVar260;
          auVar217._24_4_ = local_2e0._24_4_ + fVar17 * fVar262;
          auVar217._28_4_ = local_2e0._28_4_ + auVar14._28_4_;
          auVar64._4_4_ = auVar280._4_4_ * (float)local_920._4_4_;
          auVar64._0_4_ = auVar280._0_4_ * (float)local_920._0_4_;
          auVar64._8_4_ = auVar280._8_4_ * fStack_918;
          auVar64._12_4_ = auVar280._12_4_ * fStack_914;
          auVar64._16_4_ = auVar280._16_4_ * fStack_910;
          auVar64._20_4_ = auVar280._20_4_ * fStack_90c;
          auVar64._24_4_ = auVar280._24_4_ * fStack_908;
          auVar64._28_4_ = auVar246._28_4_;
          _local_ae0 = vsubps_avx(auVar64,auVar217);
          fVar293 = (fVar253 * local_540 + local_5c0) * local_5a0;
          fVar297 = (fVar223 * fStack_53c + fStack_5bc) * fStack_59c;
          fVar229 = (fVar255 * fStack_538 + fStack_5b8) * fStack_598;
          fVar232 = (fVar259 * fStack_534 + fStack_5b4) * fStack_594;
          fVar252 = (fVar228 * fStack_530 + fStack_5b0) * fStack_590;
          fVar260 = (fVar261 * fStack_52c + fStack_5ac) * fStack_58c;
          fVar262 = (fVar289 * fStack_528 + fStack_5a8) * fStack_588;
          auVar218._0_4_ = fVar265 + fVar293 * fVar222;
          auVar218._4_4_ = fVar283 + fVar297 * fVar226;
          auVar218._8_4_ = fVar287 + fVar229 * fVar285;
          auVar218._12_4_ = fVar291 + fVar232 * fVar227;
          auVar218._16_4_ = fVar295 + fVar252 * fVar258;
          auVar218._20_4_ = fVar299 + fVar260 * fVar290;
          auVar218._24_4_ = fVar303 + fVar262 * fVar18;
          auVar218._28_4_ = fVar305 + local_ae0._28_4_ + fStack_5a4;
          auVar65._4_4_ = fVar223 * (float)local_a20._4_4_;
          auVar65._0_4_ = fVar253 * (float)local_a20._0_4_;
          auVar65._8_4_ = fVar255 * fStack_a18;
          auVar65._12_4_ = fVar259 * fStack_a14;
          auVar65._16_4_ = fVar228 * fStack_a10;
          auVar65._20_4_ = fVar261 * fStack_a0c;
          auVar65._24_4_ = fVar289 * fStack_a08;
          auVar65._28_4_ = 0x3e000000;
          auVar11 = vsubps_avx(auVar65,auVar218);
          auVar211 = auVar11._0_28_;
          auVar278._0_4_ = auVar388._0_4_ + fVar293 * fVar221;
          auVar278._4_4_ = auVar388._4_4_ + fVar297 * fVar224;
          auVar278._8_4_ = auVar388._8_4_ + fVar229 * fVar263;
          auVar278._12_4_ = auVar388._12_4_ + fVar232 * fVar301;
          auVar278._16_4_ = auVar388._16_4_ + fVar252 * fVar254;
          auVar278._20_4_ = auVar388._20_4_ + fVar260 * fVar282;
          auVar278._24_4_ = auVar388._24_4_ + fVar262 * fVar350;
          auVar278._28_4_ = auVar388._28_4_ + 0.125;
          auVar66._4_4_ = (float)local_680._4_4_ * fVar223;
          auVar66._0_4_ = (float)local_680._0_4_ * fVar253;
          auVar66._8_4_ = fStack_678 * fVar255;
          auVar66._12_4_ = fStack_674 * fVar259;
          auVar66._16_4_ = fStack_670 * fVar228;
          auVar66._20_4_ = fStack_66c * fVar261;
          auVar66._24_4_ = fStack_668 * fVar289;
          auVar66._28_4_ = fStack_a04;
          auVar11 = vsubps_avx(auVar66,auVar278);
          auVar272 = auVar11._0_28_;
          auVar247._0_4_ = local_2e0._0_4_ + fVar251 * fVar293;
          auVar247._4_4_ = local_2e0._4_4_ + fVar257 * fVar297;
          auVar247._8_4_ = local_2e0._8_4_ + fVar281 * fVar229;
          auVar247._12_4_ = local_2e0._12_4_ + fVar225 * fVar232;
          auVar247._16_4_ = local_2e0._16_4_ + fVar256 * fVar252;
          auVar247._20_4_ = local_2e0._20_4_ + fVar286 * fVar260;
          auVar247._24_4_ = local_2e0._24_4_ + fVar17 * fVar262;
          auVar247._28_4_ = local_2e0._28_4_ + auVar246._28_4_;
          auVar67._4_4_ = fVar223 * (float)local_920._4_4_;
          auVar67._0_4_ = fVar253 * (float)local_920._0_4_;
          auVar67._8_4_ = fVar255 * fStack_918;
          auVar67._12_4_ = fVar259 * fStack_914;
          auVar67._16_4_ = fVar228 * fStack_910;
          auVar67._20_4_ = fVar261 * fStack_90c;
          auVar67._24_4_ = fVar289 * fStack_908;
          auVar67._28_4_ = fStack_a04;
          auVar11 = vsubps_avx(auVar67,auVar247);
          auVar238 = auVar11._0_28_;
          auVar10 = vcmpps_avx(auVar10,ZEXT832(0) << 0x20,5);
          auVar316._8_4_ = 0x7f800000;
          auVar316._0_8_ = 0x7f8000007f800000;
          auVar316._12_4_ = 0x7f800000;
          auVar316._16_4_ = 0x7f800000;
          auVar316._20_4_ = 0x7f800000;
          auVar316._24_4_ = 0x7f800000;
          auVar316._28_4_ = 0x7f800000;
          auVar315 = vblendvps_avx(auVar316,auVar280._0_32_,auVar10);
          auVar11 = vmaxps_avx(local_580,local_440);
          auVar68._4_4_ = auVar11._4_4_ * 1.9073486e-06;
          auVar68._0_4_ = auVar11._0_4_ * 1.9073486e-06;
          auVar68._8_4_ = auVar11._8_4_ * 1.9073486e-06;
          auVar68._12_4_ = auVar11._12_4_ * 1.9073486e-06;
          auVar68._16_4_ = auVar11._16_4_ * 1.9073486e-06;
          auVar68._20_4_ = auVar11._20_4_ * 1.9073486e-06;
          auVar68._24_4_ = auVar11._24_4_ * 1.9073486e-06;
          auVar68._28_4_ = auVar11._28_4_;
          auVar11 = vcmpps_avx(local_980,auVar68,1);
          auVar347._8_4_ = 0xff800000;
          auVar347._0_8_ = 0xff800000ff800000;
          auVar347._12_4_ = 0xff800000;
          auVar347._16_4_ = 0xff800000;
          auVar347._20_4_ = 0xff800000;
          auVar347._24_4_ = 0xff800000;
          auVar347._28_4_ = 0xff800000;
          auVar346 = vblendvps_avx(auVar347,auVar61,auVar10);
          auVar12 = auVar10 & auVar11;
          if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar12 >> 0x7f,0) != '\0') ||
                (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar12 >> 0xbf,0) != '\0') ||
              (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar12[0x1f] < '\0') {
            auVar108 = vandps_avx(auVar11,auVar10);
            auVar181 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
            auVar12 = vcmpps_avx(local_a60,_DAT_01f7b000,2);
            auVar154._8_4_ = 0xff800000;
            auVar154._0_8_ = 0xff800000ff800000;
            auVar154._12_4_ = 0xff800000;
            auVar154._16_4_ = 0xff800000;
            auVar154._20_4_ = 0xff800000;
            auVar154._24_4_ = 0xff800000;
            auVar154._28_4_ = 0xff800000;
            auVar170._8_4_ = 0x7f800000;
            auVar170._0_8_ = 0x7f8000007f800000;
            auVar170._12_4_ = 0x7f800000;
            auVar170._16_4_ = 0x7f800000;
            auVar170._20_4_ = 0x7f800000;
            auVar170._24_4_ = 0x7f800000;
            auVar170._28_4_ = 0x7f800000;
            auVar11 = vblendvps_avx(auVar170,auVar154,auVar12);
            auVar269 = vpmovsxwd_avx(auVar181);
            auVar181 = vpunpckhwd_avx(auVar181,auVar181);
            auVar390._16_16_ = auVar181;
            auVar390._0_16_ = auVar269;
            auVar315 = vblendvps_avx(auVar315,auVar11,auVar390);
            auVar11 = vblendvps_avx(auVar154,auVar170,auVar12);
            auVar346 = vblendvps_avx(auVar346,auVar11,auVar390);
            auVar199._0_8_ = auVar108._0_8_ ^ 0xffffffffffffffff;
            auVar199._8_4_ = auVar108._8_4_ ^ 0xffffffff;
            auVar199._12_4_ = auVar108._12_4_ ^ 0xffffffff;
            auVar199._16_4_ = auVar108._16_4_ ^ 0xffffffff;
            auVar199._20_4_ = auVar108._20_4_ ^ 0xffffffff;
            auVar199._24_4_ = auVar108._24_4_ ^ 0xffffffff;
            auVar199._28_4_ = auVar108._28_4_ ^ 0xffffffff;
            auVar108 = vorps_avx(auVar12,auVar199);
            auVar108 = vandps_avx(auVar10,auVar108);
          }
          auVar392 = local_940._0_28_;
        }
        _local_4c0 = local_6a0;
        local_4a0 = vminps_avx(local_460,auVar315);
        _local_7e0 = vmaxps_avx(local_6a0,auVar346);
        _local_480 = _local_7e0;
        auVar10 = vcmpps_avx(local_6a0,local_4a0,2);
        local_600 = vandps_avx(auVar97,auVar10);
        auVar10 = vcmpps_avx(_local_7e0,local_460,2);
        local_840 = vandps_avx(auVar97,auVar10);
        auVar97 = vorps_avx(local_840,local_600);
        if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar97 >> 0x7f,0) != '\0') ||
              (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar97 >> 0xbf,0) != '\0') ||
            (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar97[0x1f] < '\0') {
          auStack_898 = auVar15._8_24_;
          auVar146._0_8_ = auVar108._0_8_ ^ 0xffffffffffffffff;
          auVar146._8_4_ = auVar108._8_4_ ^ 0xffffffff;
          auVar146._12_4_ = auVar108._12_4_ ^ 0xffffffff;
          auVar146._16_4_ = auVar108._16_4_ ^ 0xffffffff;
          auVar146._20_4_ = auVar108._20_4_ ^ 0xffffffff;
          auVar146._24_4_ = auVar108._24_4_ ^ 0xffffffff;
          fVar231 = auVar108._28_4_;
          auVar146._28_4_ = (uint)fVar231 ^ 0xffffffff;
          auVar109._0_4_ =
               (float)local_a20._0_4_ * auVar211._0_4_ +
               (float)local_680._0_4_ * auVar272._0_4_ + (float)local_920._0_4_ * auVar238._0_4_;
          auVar109._4_4_ =
               (float)local_a20._4_4_ * auVar211._4_4_ +
               (float)local_680._4_4_ * auVar272._4_4_ + (float)local_920._4_4_ * auVar238._4_4_;
          auVar109._8_4_ =
               fStack_a18 * auVar211._8_4_ +
               fStack_678 * auVar272._8_4_ + fStack_918 * auVar238._8_4_;
          auVar109._12_4_ =
               fStack_a14 * auVar211._12_4_ +
               fStack_674 * auVar272._12_4_ + fStack_914 * auVar238._12_4_;
          auVar109._16_4_ =
               fStack_a10 * auVar211._16_4_ +
               fStack_670 * auVar272._16_4_ + fStack_910 * auVar238._16_4_;
          auVar109._20_4_ =
               fStack_a0c * auVar211._20_4_ +
               fStack_66c * auVar272._20_4_ + fStack_90c * auVar238._20_4_;
          auVar109._24_4_ =
               fStack_a08 * auVar211._24_4_ +
               fStack_668 * auVar272._24_4_ + fStack_908 * auVar238._24_4_;
          auVar109._28_4_ = fVar231 + local_840._28_4_ + auVar97._28_4_;
          auVar219._8_4_ = 0x7fffffff;
          auVar219._0_8_ = 0x7fffffff7fffffff;
          auVar219._12_4_ = 0x7fffffff;
          auVar219._16_4_ = 0x7fffffff;
          auVar219._20_4_ = 0x7fffffff;
          auVar219._24_4_ = 0x7fffffff;
          auVar219._28_4_ = 0x7fffffff;
          auVar97 = vandps_avx(auVar109,auVar219);
          auVar248._8_4_ = 0x3e99999a;
          auVar248._0_8_ = 0x3e99999a3e99999a;
          auVar248._12_4_ = 0x3e99999a;
          auVar248._16_4_ = 0x3e99999a;
          auVar248._20_4_ = 0x3e99999a;
          auVar248._24_4_ = 0x3e99999a;
          auVar248._28_4_ = 0x3e99999a;
          auVar97 = vcmpps_avx(auVar97,auVar248,1);
          _local_640 = vorps_avx(auVar97,auVar146);
          auVar110._0_4_ =
               auVar392._0_4_ * (float)local_a20._0_4_ +
               (float)local_680._0_4_ * (float)local_ac0._0_4_ +
               (float)local_920._0_4_ * (float)local_ae0._0_4_;
          auVar110._4_4_ =
               auVar392._4_4_ * (float)local_a20._4_4_ +
               (float)local_680._4_4_ * (float)local_ac0._4_4_ +
               (float)local_920._4_4_ * (float)local_ae0._4_4_;
          auVar110._8_4_ =
               auVar392._8_4_ * fStack_a18 + fStack_678 * fStack_ab8 + fStack_918 * fStack_ad8;
          auVar110._12_4_ =
               auVar392._12_4_ * fStack_a14 + fStack_674 * fStack_ab4 + fStack_914 * fStack_ad4;
          auVar110._16_4_ =
               auVar392._16_4_ * fStack_a10 + fStack_670 * fStack_ab0 + fStack_910 * fStack_ad0;
          auVar110._20_4_ =
               auVar392._20_4_ * fStack_a0c + fStack_66c * fStack_aac + fStack_90c * fStack_acc;
          auVar110._24_4_ =
               auVar392._24_4_ * fStack_a08 + fStack_668 * fStack_aa8 + fStack_908 * fStack_ac8;
          auVar110._28_4_ = local_640._28_4_ + local_600._28_4_ + fVar231;
          auVar97 = vandps_avx(auVar110,auVar219);
          auVar97 = vcmpps_avx(auVar97,auVar248,1);
          auVar97 = vorps_avx(auVar97,auVar146);
          auVar147._8_4_ = 3;
          auVar147._0_8_ = 0x300000003;
          auVar147._12_4_ = 3;
          auVar147._16_4_ = 3;
          auVar147._20_4_ = 3;
          auVar147._24_4_ = 3;
          auVar147._28_4_ = 3;
          auVar168._8_4_ = 2;
          auVar168._0_8_ = 0x200000002;
          auVar168._12_4_ = 2;
          auVar168._16_4_ = 2;
          auVar168._20_4_ = 2;
          auVar168._24_4_ = 2;
          auVar168._28_4_ = 2;
          auVar97 = vblendvps_avx(auVar168,auVar147,auVar97);
          local_660 = ZEXT432(local_c68);
          auVar269 = vpshufd_avx(ZEXT416(local_c68),0);
          auVar181 = vpcmpgtd_avx(auVar97._16_16_,auVar269);
          local_6c0._0_16_ = auVar269;
          auVar269 = vpcmpgtd_avx(auVar97._0_16_,auVar269);
          auVar148._16_16_ = auVar181;
          auVar148._0_16_ = auVar269;
          local_620 = vblendps_avx(ZEXT1632(auVar269),auVar148,0xf0);
          auVar97 = vandnps_avx(local_620,local_600);
          local_800._4_4_ = local_6a0._4_4_ + (float)local_880._4_4_;
          local_800._0_4_ = local_6a0._0_4_ + (float)local_880._0_4_;
          fStack_7f8 = local_6a0._8_4_ + fStack_878;
          fStack_7f4 = local_6a0._12_4_ + fStack_874;
          fStack_7f0 = local_6a0._16_4_ + fStack_870;
          fStack_7ec = local_6a0._20_4_ + fStack_86c;
          fStack_7e8 = local_6a0._24_4_ + fStack_868;
          fStack_7e4 = local_6a0._28_4_ + fStack_864;
          while( true ) {
            local_4e0 = auVar97;
            local_b40 = auVar4._0_4_;
            fStack_b3c = auVar4._4_4_;
            fStack_b38 = auVar4._8_4_;
            fStack_b34 = auVar4._12_4_;
            local_b20 = auVar2._0_4_;
            fStack_b1c = auVar2._4_4_;
            fStack_b18 = auVar2._8_4_;
            fStack_b14 = auVar2._12_4_;
            local_b30 = auVar3._0_4_;
            fStack_b2c = auVar3._4_4_;
            fStack_b28 = auVar3._8_4_;
            fStack_b24 = auVar3._12_4_;
            local_b50 = auVar5._0_4_;
            fStack_b4c = auVar5._4_4_;
            fStack_b48 = auVar5._8_4_;
            fStack_b44 = auVar5._12_4_;
            if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar97 >> 0x7f,0) == '\0') &&
                  (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar97 >> 0xbf,0) == '\0') &&
                (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar97[0x1f]) break;
            auVar149._8_4_ = 0x7f800000;
            auVar149._0_8_ = 0x7f8000007f800000;
            auVar149._12_4_ = 0x7f800000;
            auVar149._16_4_ = 0x7f800000;
            auVar149._20_4_ = 0x7f800000;
            auVar149._24_4_ = 0x7f800000;
            auVar149._28_4_ = 0x7f800000;
            auVar108 = vblendvps_avx(auVar149,local_6a0,auVar97);
            auVar10 = vshufps_avx(auVar108,auVar108,0xb1);
            auVar10 = vminps_avx(auVar108,auVar10);
            auVar11 = vshufpd_avx(auVar10,auVar10,5);
            auVar10 = vminps_avx(auVar10,auVar11);
            auVar11 = vperm2f128_avx(auVar10,auVar10,1);
            auVar10 = vminps_avx(auVar10,auVar11);
            auVar108 = vcmpps_avx(auVar108,auVar10,0);
            auVar10 = auVar97 & auVar108;
            if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0x7f,0) != '\0') ||
                  (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0xbf,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar10[0x1f] < '\0') {
              auVar97 = vandps_avx(auVar108,auVar97);
            }
            uVar73 = vmovmskps_avx(auVar97);
            uVar81 = 0;
            if (uVar73 != 0) {
              for (; (uVar73 >> uVar81 & 1) == 0; uVar81 = uVar81 + 1) {
              }
            }
            uVar77 = (ulong)uVar81;
            *(undefined4 *)(local_4e0 + uVar77 * 4) = 0;
            fVar231 = local_1a0[uVar77];
            uVar81 = *(uint *)(local_4c0 + uVar77 * 4);
            fVar221 = auVar126._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              fVar221 = sqrtf((float)local_9c0._0_4_);
            }
            auVar269 = vminps_avx(auVar2,auVar4);
            auVar181 = vmaxps_avx(auVar2,auVar4);
            auVar184 = vminps_avx(auVar3,auVar5);
            auVar89 = vminps_avx(auVar269,auVar184);
            auVar269 = vmaxps_avx(auVar3,auVar5);
            auVar184 = vmaxps_avx(auVar181,auVar269);
            auVar177._8_4_ = 0x7fffffff;
            auVar177._0_8_ = 0x7fffffff7fffffff;
            auVar177._12_4_ = 0x7fffffff;
            auVar181 = vandps_avx(auVar89,auVar177);
            auVar269 = vandps_avx(auVar184,auVar177);
            auVar181 = vmaxps_avx(auVar181,auVar269);
            auVar269 = vmovshdup_avx(auVar181);
            auVar269 = vmaxss_avx(auVar269,auVar181);
            auVar181 = vshufpd_avx(auVar181,auVar181,1);
            auVar181 = vmaxss_avx(auVar181,auVar269);
            local_ac0._0_4_ = auVar181._0_4_ * 1.9073486e-06;
            local_a60._0_4_ = fVar221 * 1.9073486e-06;
            local_7c0._0_16_ = vshufps_avx(auVar184,auVar184,0xff);
            auVar181 = vinsertps_avx(ZEXT416(uVar81),ZEXT416((uint)fVar231),0x10);
            auVar280 = ZEXT1664(auVar181);
            lVar76 = 5;
            do {
              do {
                bVar82 = lVar76 == 0;
                lVar76 = lVar76 + -1;
                if (bVar82) goto LAB_009d651b;
                auVar269 = auVar280._0_16_;
                auVar181 = vmovshdup_avx(auVar269);
                fVar263 = auVar181._0_4_;
                fVar253 = 1.0 - fVar263;
                auVar181 = vshufps_avx(auVar269,auVar269,0x55);
                fVar231 = auVar181._0_4_;
                fVar221 = auVar181._4_4_;
                fVar251 = auVar181._8_4_;
                fVar222 = auVar181._12_4_;
                auVar181 = vshufps_avx(ZEXT416((uint)fVar253),ZEXT416((uint)fVar253),0);
                fVar223 = auVar181._0_4_;
                fVar255 = auVar181._4_4_;
                fVar224 = auVar181._8_4_;
                fVar257 = auVar181._12_4_;
                fVar226 = local_b30 * fVar231 + local_b40 * fVar223;
                fVar259 = fStack_b2c * fVar221 + fStack_b3c * fVar255;
                fVar228 = fStack_b28 * fVar251 + fStack_b38 * fVar224;
                fVar261 = fStack_b24 * fVar222 + fStack_b34 * fVar257;
                auVar233._0_4_ =
                     fVar223 * (local_b40 * fVar231 + fVar223 * local_b20) + fVar231 * fVar226;
                auVar233._4_4_ =
                     fVar255 * (fStack_b3c * fVar221 + fVar255 * fStack_b1c) + fVar221 * fVar259;
                auVar233._8_4_ =
                     fVar224 * (fStack_b38 * fVar251 + fVar224 * fStack_b18) + fVar251 * fVar228;
                auVar233._12_4_ =
                     fVar257 * (fStack_b34 * fVar222 + fVar257 * fStack_b14) + fVar222 * fVar261;
                auVar178._0_4_ =
                     fVar223 * fVar226 + fVar231 * (fVar231 * local_b50 + local_b30 * fVar223);
                auVar178._4_4_ =
                     fVar255 * fVar259 + fVar221 * (fVar221 * fStack_b4c + fStack_b2c * fVar255);
                auVar178._8_4_ =
                     fVar224 * fVar228 + fVar251 * (fVar251 * fStack_b48 + fStack_b28 * fVar224);
                auVar178._12_4_ =
                     fVar257 * fVar261 + fVar222 * (fVar222 * fStack_b44 + fStack_b24 * fVar257);
                auVar181 = vshufps_avx(auVar269,auVar269,0);
                auVar128._0_4_ = auVar181._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar128._4_4_ = auVar181._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar128._8_4_ = auVar181._8_4_ * fStack_9a8 + 0.0;
                auVar128._12_4_ = auVar181._12_4_ * fStack_9a4 + 0.0;
                auVar88._0_4_ = fVar223 * auVar233._0_4_ + fVar231 * auVar178._0_4_;
                auVar88._4_4_ = fVar255 * auVar233._4_4_ + fVar221 * auVar178._4_4_;
                auVar88._8_4_ = fVar224 * auVar233._8_4_ + fVar251 * auVar178._8_4_;
                auVar88._12_4_ = fVar257 * auVar233._12_4_ + fVar222 * auVar178._12_4_;
                local_940._0_16_ = auVar88;
                auVar181 = vsubps_avx(auVar128,auVar88);
                _local_ae0 = auVar181;
                auVar181 = vdpps_avx(auVar181,auVar181,0x7f);
                fVar231 = auVar181._0_4_;
                if (fVar231 < 0.0) {
                  local_a80._0_16_ = auVar178;
                  fVar221 = sqrtf(fVar231);
                  auVar280 = ZEXT1664(auVar269);
                  auVar178 = local_a80._0_16_;
                }
                else {
                  auVar184 = vsqrtss_avx(auVar181,auVar181);
                  fVar221 = auVar184._0_4_;
                }
                auVar184 = vsubps_avx(auVar178,auVar233);
                auVar306._0_4_ = auVar184._0_4_ * 3.0;
                auVar306._4_4_ = auVar184._4_4_ * 3.0;
                auVar306._8_4_ = auVar184._8_4_ * 3.0;
                auVar306._12_4_ = auVar184._12_4_ * 3.0;
                auVar184 = vshufps_avx(ZEXT416((uint)(fVar263 * 6.0)),ZEXT416((uint)(fVar263 * 6.0))
                                       ,0);
                auVar89 = ZEXT416((uint)((fVar253 - (fVar263 + fVar263)) * 6.0));
                auVar158 = vshufps_avx(auVar89,auVar89,0);
                auVar89 = ZEXT416((uint)((fVar263 - (fVar253 + fVar253)) * 6.0));
                auVar85 = vshufps_avx(auVar89,auVar89,0);
                auVar124 = vshufps_avx(ZEXT416((uint)(fVar253 * 6.0)),ZEXT416((uint)(fVar253 * 6.0))
                                       ,0);
                auVar89 = vdpps_avx(auVar306,auVar306,0x7f);
                auVar129._0_4_ =
                     auVar124._0_4_ * local_b20 +
                     auVar85._0_4_ * local_b40 +
                     auVar184._0_4_ * local_b50 + auVar158._0_4_ * local_b30;
                auVar129._4_4_ =
                     auVar124._4_4_ * fStack_b1c +
                     auVar85._4_4_ * fStack_b3c +
                     auVar184._4_4_ * fStack_b4c + auVar158._4_4_ * fStack_b2c;
                auVar129._8_4_ =
                     auVar124._8_4_ * fStack_b18 +
                     auVar85._8_4_ * fStack_b38 +
                     auVar184._8_4_ * fStack_b48 + auVar158._8_4_ * fStack_b28;
                auVar129._12_4_ =
                     auVar124._12_4_ * fStack_b14 +
                     auVar85._12_4_ * fStack_b34 +
                     auVar184._12_4_ * fStack_b44 + auVar158._12_4_ * fStack_b24;
                auVar184 = vblendps_avx(auVar89,_DAT_01f45a50,0xe);
                auVar158 = vrsqrtss_avx(auVar184,auVar184);
                fVar222 = auVar158._0_4_;
                fVar251 = auVar89._0_4_;
                auVar158 = vdpps_avx(auVar306,auVar129,0x7f);
                auVar85 = vshufps_avx(auVar89,auVar89,0);
                auVar130._0_4_ = auVar129._0_4_ * auVar85._0_4_;
                auVar130._4_4_ = auVar129._4_4_ * auVar85._4_4_;
                auVar130._8_4_ = auVar129._8_4_ * auVar85._8_4_;
                auVar130._12_4_ = auVar129._12_4_ * auVar85._12_4_;
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar203._0_4_ = auVar306._0_4_ * auVar158._0_4_;
                auVar203._4_4_ = auVar306._4_4_ * auVar158._4_4_;
                auVar203._8_4_ = auVar306._8_4_ * auVar158._8_4_;
                auVar203._12_4_ = auVar306._12_4_ * auVar158._12_4_;
                auVar124 = vsubps_avx(auVar130,auVar203);
                auVar158 = vrcpss_avx(auVar184,auVar184);
                auVar184 = vmaxss_avx(ZEXT416((uint)local_ac0._0_4_),
                                      ZEXT416((uint)(auVar280._0_4_ * (float)local_a60._0_4_)));
                auVar158 = ZEXT416((uint)(auVar158._0_4_ * (2.0 - fVar251 * auVar158._0_4_)));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                uVar77 = CONCAT44(auVar306._4_4_,auVar306._0_4_);
                auVar234._0_8_ = uVar77 ^ 0x8000000080000000;
                auVar234._8_4_ = -auVar306._8_4_;
                auVar234._12_4_ = -auVar306._12_4_;
                auVar85 = ZEXT416((uint)(fVar222 * 1.5 +
                                        fVar251 * -0.5 * fVar222 * fVar222 * fVar222));
                auVar85 = vshufps_avx(auVar85,auVar85,0);
                auVar179._0_4_ = auVar85._0_4_ * auVar124._0_4_ * auVar158._0_4_;
                auVar179._4_4_ = auVar85._4_4_ * auVar124._4_4_ * auVar158._4_4_;
                auVar179._8_4_ = auVar85._8_4_ * auVar124._8_4_ * auVar158._8_4_;
                auVar179._12_4_ = auVar85._12_4_ * auVar124._12_4_ * auVar158._12_4_;
                auVar270._0_4_ = auVar306._0_4_ * auVar85._0_4_;
                auVar270._4_4_ = auVar306._4_4_ * auVar85._4_4_;
                auVar270._8_4_ = auVar306._8_4_ * auVar85._8_4_;
                auVar270._12_4_ = auVar306._12_4_ * auVar85._12_4_;
                if (fVar251 < 0.0) {
                  local_a80._0_16_ = auVar234;
                  local_900._0_16_ = auVar270;
                  local_a00._0_16_ = auVar179;
                  fVar251 = sqrtf(fVar251);
                  auVar179 = local_a00._0_16_;
                  auVar234 = local_a80._0_16_;
                  auVar270 = local_900._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar89,auVar89);
                  fVar251 = auVar89._0_4_;
                }
                auVar89 = vdpps_avx(_local_ae0,auVar270,0x7f);
                fVar221 = ((float)local_ac0._0_4_ / fVar251) * (fVar221 + 1.0) +
                          auVar184._0_4_ + fVar221 * (float)local_ac0._0_4_;
                auVar158 = vdpps_avx(auVar234,auVar270,0x7f);
                auVar85 = vdpps_avx(_local_ae0,auVar179,0x7f);
                auVar124 = vdpps_avx(_local_9b0,auVar270,0x7f);
                auVar125 = vdpps_avx(_local_ae0,auVar234,0x7f);
                fVar251 = auVar158._0_4_ + auVar85._0_4_;
                fVar222 = auVar89._0_4_;
                auVar90._0_4_ = fVar222 * fVar222;
                auVar90._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                auVar90._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                auVar90._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                auVar85 = vsubps_avx(auVar181,auVar90);
                auVar158 = vdpps_avx(_local_ae0,_local_9b0,0x7f);
                fVar253 = auVar125._0_4_ - fVar222 * fVar251;
                fVar223 = auVar158._0_4_ - fVar222 * auVar124._0_4_;
                auVar158 = vrsqrtss_avx(auVar85,auVar85);
                fVar255 = auVar85._0_4_;
                fVar222 = auVar158._0_4_;
                fVar222 = fVar222 * 1.5 + fVar255 * -0.5 * fVar222 * fVar222 * fVar222;
                if (fVar255 < 0.0) {
                  local_a80._0_4_ = fVar221;
                  local_900._0_16_ = auVar124;
                  local_a00._0_16_ = ZEXT416((uint)fVar251);
                  local_980._0_4_ = fVar253;
                  local_9a0._0_4_ = fVar223;
                  local_7a0._0_4_ = fVar222;
                  fVar255 = sqrtf(fVar255);
                  fVar222 = (float)local_7a0._0_4_;
                  fVar253 = (float)local_980._0_4_;
                  fVar223 = (float)local_9a0._0_4_;
                  auVar124 = local_900._0_16_;
                  fVar221 = (float)local_a80._0_4_;
                  auVar158 = local_a00._0_16_;
                }
                else {
                  auVar158 = vsqrtss_avx(auVar85,auVar85);
                  fVar255 = auVar158._0_4_;
                  auVar158 = ZEXT416((uint)fVar251);
                }
                auVar125 = vpermilps_avx(local_940._0_16_,0xff);
                auVar95 = vshufps_avx(auVar306,auVar306,0xff);
                fVar251 = fVar253 * fVar222 - auVar95._0_4_;
                auVar204._0_8_ = auVar124._0_8_ ^ 0x8000000080000000;
                auVar204._8_4_ = auVar124._8_4_ ^ 0x80000000;
                auVar204._12_4_ = auVar124._12_4_ ^ 0x80000000;
                auVar235._0_4_ = -fVar251;
                auVar235._4_4_ = 0x80000000;
                auVar235._8_4_ = 0x80000000;
                auVar235._12_4_ = 0x80000000;
                auVar85 = vinsertps_avx(auVar235,ZEXT416((uint)(fVar223 * fVar222)),0x1c);
                auVar124 = vmovsldup_avx(ZEXT416((uint)(auVar158._0_4_ * fVar223 * fVar222 -
                                                       auVar124._0_4_ * fVar251)));
                auVar85 = vdivps_avx(auVar85,auVar124);
                auVar158 = vinsertps_avx(auVar158,auVar204,0x10);
                auVar158 = vdivps_avx(auVar158,auVar124);
                auVar124 = vmovsldup_avx(auVar89);
                auVar91 = ZEXT416((uint)(fVar255 - auVar125._0_4_));
                auVar125 = vmovsldup_avx(auVar91);
                auVar159._0_4_ = auVar124._0_4_ * auVar85._0_4_ + auVar125._0_4_ * auVar158._0_4_;
                auVar159._4_4_ = auVar124._4_4_ * auVar85._4_4_ + auVar125._4_4_ * auVar158._4_4_;
                auVar159._8_4_ = auVar124._8_4_ * auVar85._8_4_ + auVar125._8_4_ * auVar158._8_4_;
                auVar159._12_4_ =
                     auVar124._12_4_ * auVar85._12_4_ + auVar125._12_4_ * auVar158._12_4_;
                auVar158 = vsubps_avx(auVar269,auVar159);
                auVar280 = ZEXT1664(auVar158);
                auVar160._8_4_ = 0x7fffffff;
                auVar160._0_8_ = 0x7fffffff7fffffff;
                auVar160._12_4_ = 0x7fffffff;
                auVar269 = vandps_avx(auVar89,auVar160);
              } while (fVar221 <= auVar269._0_4_);
              auVar180._8_4_ = 0x7fffffff;
              auVar180._0_8_ = 0x7fffffff7fffffff;
              auVar180._12_4_ = 0x7fffffff;
              auVar269 = vandps_avx(auVar91,auVar180);
            } while ((float)local_7c0._0_4_ * 1.9073486e-06 + auVar184._0_4_ + fVar221 <=
                     auVar269._0_4_);
            fVar221 = auVar158._0_4_ + (float)local_8d0._0_4_;
            if ((fVar200 <= fVar221) &&
               (fVar251 = *(float *)(ray + k * 4 + 0x80), fVar221 <= fVar251)) {
              auVar269 = vmovshdup_avx(auVar158);
              fVar222 = auVar269._0_4_;
              if ((0.0 <= fVar222) && (fVar222 <= 1.0)) {
                auVar181 = vrsqrtss_avx(auVar181,auVar181);
                fVar253 = auVar181._0_4_;
                pGVar7 = (context->scene->geometries).items[uVar79].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar181 = ZEXT416((uint)(fVar253 * 1.5 +
                                           fVar231 * -0.5 * fVar253 * fVar253 * fVar253));
                  auVar181 = vshufps_avx(auVar181,auVar181,0);
                  auVar182._0_4_ = auVar181._0_4_ * (float)local_ae0._0_4_;
                  auVar182._4_4_ = auVar181._4_4_ * (float)local_ae0._4_4_;
                  auVar182._8_4_ = auVar181._8_4_ * fStack_ad8;
                  auVar182._12_4_ = auVar181._12_4_ * fStack_ad4;
                  auVar131._0_4_ = auVar306._0_4_ + auVar95._0_4_ * auVar182._0_4_;
                  auVar131._4_4_ = auVar306._4_4_ + auVar95._4_4_ * auVar182._4_4_;
                  auVar131._8_4_ = auVar306._8_4_ + auVar95._8_4_ * auVar182._8_4_;
                  auVar131._12_4_ = auVar306._12_4_ + auVar95._12_4_ * auVar182._12_4_;
                  auVar181 = vshufps_avx(auVar182,auVar182,0xc9);
                  auVar269 = vshufps_avx(auVar306,auVar306,0xc9);
                  auVar183._0_4_ = auVar269._0_4_ * auVar182._0_4_;
                  auVar183._4_4_ = auVar269._4_4_ * auVar182._4_4_;
                  auVar183._8_4_ = auVar269._8_4_ * auVar182._8_4_;
                  auVar183._12_4_ = auVar269._12_4_ * auVar182._12_4_;
                  auVar205._0_4_ = auVar306._0_4_ * auVar181._0_4_;
                  auVar205._4_4_ = auVar306._4_4_ * auVar181._4_4_;
                  auVar205._8_4_ = auVar306._8_4_ * auVar181._8_4_;
                  auVar205._12_4_ = auVar306._12_4_ * auVar181._12_4_;
                  auVar184 = vsubps_avx(auVar205,auVar183);
                  auVar181 = vshufps_avx(auVar184,auVar184,0xc9);
                  auVar269 = vshufps_avx(auVar131,auVar131,0xc9);
                  auVar206._0_4_ = auVar269._0_4_ * auVar181._0_4_;
                  auVar206._4_4_ = auVar269._4_4_ * auVar181._4_4_;
                  auVar206._8_4_ = auVar269._8_4_ * auVar181._8_4_;
                  auVar206._12_4_ = auVar269._12_4_ * auVar181._12_4_;
                  auVar181 = vshufps_avx(auVar184,auVar184,0xd2);
                  auVar132._0_4_ = auVar131._0_4_ * auVar181._0_4_;
                  auVar132._4_4_ = auVar131._4_4_ * auVar181._4_4_;
                  auVar132._8_4_ = auVar131._8_4_ * auVar181._8_4_;
                  auVar132._12_4_ = auVar131._12_4_ * auVar181._12_4_;
                  auVar181 = vsubps_avx(auVar206,auVar132);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar221;
                    uVar80 = vextractps_avx(auVar181,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar80;
                    uVar80 = vextractps_avx(auVar181,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar80;
                    *(int *)(ray + k * 4 + 0xe0) = auVar181._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar222;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_8a0;
                    *(uint *)(ray + k * 4 + 0x120) = uVar79;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_730 = vshufps_avx(auVar158,auVar158,0x55);
                    auVar269 = vshufps_avx(auVar181,auVar181,0x55);
                    auStack_750 = vshufps_avx(auVar181,auVar181,0xaa);
                    local_740 = vshufps_avx(auVar181,auVar181,0);
                    local_760 = (RTCHitN  [16])auVar269;
                    local_720 = ZEXT816(0) << 0x20;
                    local_710 = local_780._0_8_;
                    uStack_708 = local_780._8_8_;
                    local_700 = local_770;
                    vcmpps_avx(ZEXT1632(local_770),ZEXT1632(local_770),0xf);
                    uStack_6ec = context->user->instID[0];
                    local_6f0 = uStack_6ec;
                    uStack_6e8 = uStack_6ec;
                    uStack_6e4 = uStack_6ec;
                    uVar81 = context->user->instPrimID[0];
                    auVar133._4_4_ = uVar81;
                    auVar133._0_4_ = uVar81;
                    auVar133._8_4_ = uVar81;
                    auVar133._12_4_ = uVar81;
                    auStack_6e0 = auVar133;
                    *(float *)(ray + k * 4 + 0x80) = fVar221;
                    local_860._0_16_ = *local_a28;
                    local_b10.valid = (int *)local_860;
                    local_b10.geometryUserPtr = pGVar7->userPtr;
                    local_b10.context = context->user;
                    local_b10.hit = local_760;
                    local_b10.N = 4;
                    auVar181 = *local_a28;
                    local_b10.ray = (RTCRayN *)ray;
                    if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar7->intersectionFilterN)(&local_b10);
                      auVar335._8_56_ = extraout_var;
                      auVar335._0_8_ = extraout_XMM1_Qa;
                      auVar133 = auVar335._0_16_;
                      auVar181 = local_860._0_16_;
                    }
                    if (auVar181 == (undefined1  [16])0x0) {
                      auVar269 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar181 = vpcmpeqd_avx(auVar133,auVar133);
                      auVar269 = auVar269 ^ auVar181;
                    }
                    else {
                      p_Var9 = context->args->filter;
                      auVar184 = vpcmpeqd_avx(auVar269,auVar269);
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var9)(&local_b10);
                        auVar184 = vpcmpeqd_avx(auVar184,auVar184);
                        auVar181 = local_860._0_16_;
                      }
                      auVar89 = vpcmpeqd_avx(auVar181,_DAT_01f45a50);
                      auVar269 = auVar89 ^ auVar184;
                      if (auVar181 != (undefined1  [16])0x0) {
                        auVar89 = auVar89 ^ auVar184;
                        auVar181 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])local_b10.hit);
                        *(undefined1 (*) [16])(local_b10.ray + 0xc0) = auVar181;
                        auVar181 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x10));
                        *(undefined1 (*) [16])(local_b10.ray + 0xd0) = auVar181;
                        auVar181 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x20));
                        *(undefined1 (*) [16])(local_b10.ray + 0xe0) = auVar181;
                        auVar181 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x30));
                        *(undefined1 (*) [16])(local_b10.ray + 0xf0) = auVar181;
                        auVar181 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x40));
                        *(undefined1 (*) [16])(local_b10.ray + 0x100) = auVar181;
                        auVar181 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x50));
                        *(undefined1 (*) [16])(local_b10.ray + 0x110) = auVar181;
                        auVar181 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x60));
                        *(undefined1 (*) [16])(local_b10.ray + 0x120) = auVar181;
                        auVar181 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x70));
                        *(undefined1 (*) [16])(local_b10.ray + 0x130) = auVar181;
                        auVar181 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x80));
                        *(undefined1 (*) [16])(local_b10.ray + 0x140) = auVar181;
                      }
                    }
                    auVar92._8_8_ = 0x100000001;
                    auVar92._0_8_ = 0x100000001;
                    if ((auVar92 & auVar269) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar251;
                    }
                  }
                }
              }
            }
LAB_009d651b:
            uVar80 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar322._4_4_ = uVar80;
            auVar322._0_4_ = uVar80;
            auVar322._8_4_ = uVar80;
            auVar322._12_4_ = uVar80;
            auVar322._16_4_ = uVar80;
            auVar322._20_4_ = uVar80;
            auVar322._24_4_ = uVar80;
            auVar322._28_4_ = uVar80;
            auVar317 = ZEXT3264(auVar322);
            auVar97 = vcmpps_avx(_local_800,auVar322,2);
            auVar97 = vandps_avx(auVar97,local_4e0);
          }
          auVar111._0_4_ = (float)local_880._0_4_ + (float)local_7e0._0_4_;
          auVar111._4_4_ = (float)local_880._4_4_ + (float)local_7e0._4_4_;
          auVar111._8_4_ = fStack_878 + fStack_7d8;
          auVar111._12_4_ = fStack_874 + fStack_7d4;
          auVar111._16_4_ = fStack_870 + fStack_7d0;
          auVar111._20_4_ = fStack_86c + fStack_7cc;
          auVar111._24_4_ = fStack_868 + fStack_7c8;
          auVar111._28_4_ = fStack_864 + fStack_7c4;
          auVar181 = vshufps_avx(auVar317._0_16_,auVar317._0_16_,0);
          auVar150._16_16_ = auVar181;
          auVar150._0_16_ = auVar181;
          auVar97 = vcmpps_avx(auVar111,auVar150,2);
          _local_800 = vandps_avx(auVar97,local_840);
          auVar112._8_4_ = 3;
          auVar112._0_8_ = 0x300000003;
          auVar112._12_4_ = 3;
          auVar112._16_4_ = 3;
          auVar112._20_4_ = 3;
          auVar112._24_4_ = 3;
          auVar112._28_4_ = 3;
          auVar151._8_4_ = 2;
          auVar151._0_8_ = 0x200000002;
          auVar151._12_4_ = 2;
          auVar151._16_4_ = 2;
          auVar151._20_4_ = 2;
          auVar151._24_4_ = 2;
          auVar151._28_4_ = 2;
          auVar97 = vblendvps_avx(auVar151,auVar112,_local_640);
          auVar181 = vpcmpgtd_avx(auVar97._16_16_,local_6c0._0_16_);
          auVar269 = vpshufd_avx(local_660._0_16_,0);
          auVar269 = vpcmpgtd_avx(auVar97._0_16_,auVar269);
          auVar152._16_16_ = auVar181;
          auVar152._0_16_ = auVar269;
          local_840 = vblendps_avx(ZEXT1632(auVar269),auVar152,0xf0);
          local_860 = vandnps_avx(local_840,_local_800);
          local_6a0 = _local_480;
          local_7e0._4_4_ = (float)local_880._4_4_ + (float)local_480._4_4_;
          local_7e0._0_4_ = (float)local_880._0_4_ + (float)local_480._0_4_;
          fStack_7d8 = fStack_878 + fStack_478;
          fStack_7d4 = fStack_874 + fStack_474;
          fStack_7d0 = fStack_870 + fStack_470;
          fStack_7cc = fStack_86c + fStack_46c;
          fStack_7c8 = fStack_868 + fStack_468;
          fStack_7c4 = fStack_864 + fStack_464;
          auVar335 = ZEXT3264(local_9e0);
          auVar361 = ZEXT3264(local_aa0);
          auVar280 = ZEXT3264(local_960);
          for (; (((((((local_860 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_860 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_860 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_860 >> 0x7f,0) != '\0') ||
                   (local_860 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_860 >> 0xbf,0) != '\0') ||
                 (local_860 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_860[0x1f] < '\0'; local_860 = vandps_avx(auVar97,local_860)) {
            auVar153._8_4_ = 0x7f800000;
            auVar153._0_8_ = 0x7f8000007f800000;
            auVar153._12_4_ = 0x7f800000;
            auVar153._16_4_ = 0x7f800000;
            auVar153._20_4_ = 0x7f800000;
            auVar153._24_4_ = 0x7f800000;
            auVar153._28_4_ = 0x7f800000;
            auVar97 = vblendvps_avx(auVar153,local_6a0,local_860);
            auVar108 = vshufps_avx(auVar97,auVar97,0xb1);
            auVar108 = vminps_avx(auVar97,auVar108);
            auVar10 = vshufpd_avx(auVar108,auVar108,5);
            auVar108 = vminps_avx(auVar108,auVar10);
            auVar10 = vperm2f128_avx(auVar108,auVar108,1);
            auVar108 = vminps_avx(auVar108,auVar10);
            auVar108 = vcmpps_avx(auVar97,auVar108,0);
            auVar10 = local_860 & auVar108;
            auVar97 = local_860;
            if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0x7f,0) != '\0') ||
                  (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0xbf,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar10[0x1f] < '\0') {
              auVar97 = vandps_avx(auVar108,local_860);
            }
            uVar73 = vmovmskps_avx(auVar97);
            uVar81 = 0;
            if (uVar73 != 0) {
              for (; (uVar73 >> uVar81 & 1) == 0; uVar81 = uVar81 + 1) {
              }
            }
            uVar77 = (ulong)uVar81;
            *(undefined4 *)(local_860 + uVar77 * 4) = 0;
            fVar231 = local_1c0[uVar77];
            uVar81 = *(uint *)(local_460 + uVar77 * 4);
            fVar221 = auVar20._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              fVar221 = sqrtf((float)local_9c0._0_4_);
              auVar280 = ZEXT3264(local_960);
              auVar361 = ZEXT3264(local_aa0);
              auVar335 = ZEXT3264(local_9e0);
            }
            auVar269 = vminps_avx(auVar2,auVar4);
            auVar181 = vmaxps_avx(auVar2,auVar4);
            auVar184 = vminps_avx(auVar3,auVar5);
            auVar89 = vminps_avx(auVar269,auVar184);
            auVar269 = vmaxps_avx(auVar3,auVar5);
            auVar184 = vmaxps_avx(auVar181,auVar269);
            auVar185._8_4_ = 0x7fffffff;
            auVar185._0_8_ = 0x7fffffff7fffffff;
            auVar185._12_4_ = 0x7fffffff;
            auVar181 = vandps_avx(auVar89,auVar185);
            auVar269 = vandps_avx(auVar184,auVar185);
            auVar181 = vmaxps_avx(auVar181,auVar269);
            auVar269 = vmovshdup_avx(auVar181);
            auVar269 = vmaxss_avx(auVar269,auVar181);
            auVar181 = vshufpd_avx(auVar181,auVar181,1);
            auVar181 = vmaxss_avx(auVar181,auVar269);
            local_ac0._0_4_ = auVar181._0_4_ * 1.9073486e-06;
            local_900._0_4_ = fVar221 * 1.9073486e-06;
            local_7c0._0_16_ = vshufps_avx(auVar184,auVar184,0xff);
            auVar181 = vinsertps_avx(ZEXT416(uVar81),ZEXT416((uint)fVar231),0x10);
            auVar317 = ZEXT1664(auVar181);
            lVar76 = 5;
            do {
              do {
                bVar82 = lVar76 == 0;
                lVar76 = lVar76 + -1;
                if (bVar82) goto LAB_009d7099;
                auVar269 = auVar317._0_16_;
                auVar181 = vmovshdup_avx(auVar269);
                fVar263 = auVar181._0_4_;
                fVar253 = 1.0 - fVar263;
                auVar181 = vshufps_avx(auVar269,auVar269,0x55);
                fVar231 = auVar181._0_4_;
                fVar221 = auVar181._4_4_;
                fVar251 = auVar181._8_4_;
                fVar222 = auVar181._12_4_;
                auVar181 = vshufps_avx(ZEXT416((uint)fVar253),ZEXT416((uint)fVar253),0);
                fVar223 = auVar181._0_4_;
                fVar255 = auVar181._4_4_;
                fVar224 = auVar181._8_4_;
                fVar257 = auVar181._12_4_;
                fVar226 = local_b30 * fVar231 + local_b40 * fVar223;
                fVar259 = fStack_b2c * fVar221 + fStack_b3c * fVar255;
                fVar228 = fStack_b28 * fVar251 + fStack_b38 * fVar224;
                fVar261 = fStack_b24 * fVar222 + fStack_b34 * fVar257;
                auVar236._0_4_ =
                     fVar223 * (local_b40 * fVar231 + fVar223 * local_b20) + fVar231 * fVar226;
                auVar236._4_4_ =
                     fVar255 * (fStack_b3c * fVar221 + fVar255 * fStack_b1c) + fVar221 * fVar259;
                auVar236._8_4_ =
                     fVar224 * (fStack_b38 * fVar251 + fVar224 * fStack_b18) + fVar251 * fVar228;
                auVar236._12_4_ =
                     fVar257 * (fStack_b34 * fVar222 + fVar257 * fStack_b14) + fVar222 * fVar261;
                auVar186._0_4_ =
                     fVar223 * fVar226 + fVar231 * (fVar231 * local_b50 + local_b30 * fVar223);
                auVar186._4_4_ =
                     fVar255 * fVar259 + fVar221 * (fVar221 * fStack_b4c + fStack_b2c * fVar255);
                auVar186._8_4_ =
                     fVar224 * fVar228 + fVar251 * (fVar251 * fStack_b48 + fStack_b28 * fVar224);
                auVar186._12_4_ =
                     fVar257 * fVar261 + fVar222 * (fVar222 * fStack_b44 + fStack_b24 * fVar257);
                auVar181 = vshufps_avx(auVar269,auVar269,0);
                auVar134._0_4_ = auVar181._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar134._4_4_ = auVar181._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar134._8_4_ = auVar181._8_4_ * fStack_9a8 + 0.0;
                auVar134._12_4_ = auVar181._12_4_ * fStack_9a4 + 0.0;
                auVar93._0_4_ = fVar223 * auVar236._0_4_ + fVar231 * auVar186._0_4_;
                auVar93._4_4_ = fVar255 * auVar236._4_4_ + fVar221 * auVar186._4_4_;
                auVar93._8_4_ = fVar224 * auVar236._8_4_ + fVar251 * auVar186._8_4_;
                auVar93._12_4_ = fVar257 * auVar236._12_4_ + fVar222 * auVar186._12_4_;
                local_940._0_16_ = auVar93;
                auVar181 = vsubps_avx(auVar134,auVar93);
                _local_ae0 = auVar181;
                auVar181 = vdpps_avx(auVar181,auVar181,0x7f);
                fVar231 = auVar181._0_4_;
                if (fVar231 < 0.0) {
                  local_a60._0_16_ = auVar236;
                  fVar221 = sqrtf(fVar231);
                  auVar317 = ZEXT1664(auVar269);
                  auVar236 = local_a60._0_16_;
                }
                else {
                  auVar184 = vsqrtss_avx(auVar181,auVar181);
                  fVar221 = auVar184._0_4_;
                }
                auVar184 = vsubps_avx(auVar186,auVar236);
                auVar271._0_4_ = auVar184._0_4_ * 3.0;
                auVar271._4_4_ = auVar184._4_4_ * 3.0;
                auVar271._8_4_ = auVar184._8_4_ * 3.0;
                auVar271._12_4_ = auVar184._12_4_ * 3.0;
                auVar184 = vshufps_avx(ZEXT416((uint)(fVar263 * 6.0)),ZEXT416((uint)(fVar263 * 6.0))
                                       ,0);
                auVar89 = ZEXT416((uint)((fVar253 - (fVar263 + fVar263)) * 6.0));
                auVar158 = vshufps_avx(auVar89,auVar89,0);
                auVar89 = ZEXT416((uint)((fVar263 - (fVar253 + fVar253)) * 6.0));
                auVar85 = vshufps_avx(auVar89,auVar89,0);
                auVar124 = vshufps_avx(ZEXT416((uint)(fVar253 * 6.0)),ZEXT416((uint)(fVar253 * 6.0))
                                       ,0);
                auVar89 = vdpps_avx(auVar271,auVar271,0x7f);
                auVar135._0_4_ =
                     auVar124._0_4_ * local_b20 +
                     auVar85._0_4_ * local_b40 +
                     auVar184._0_4_ * local_b50 + auVar158._0_4_ * local_b30;
                auVar135._4_4_ =
                     auVar124._4_4_ * fStack_b1c +
                     auVar85._4_4_ * fStack_b3c +
                     auVar184._4_4_ * fStack_b4c + auVar158._4_4_ * fStack_b2c;
                auVar135._8_4_ =
                     auVar124._8_4_ * fStack_b18 +
                     auVar85._8_4_ * fStack_b38 +
                     auVar184._8_4_ * fStack_b48 + auVar158._8_4_ * fStack_b28;
                auVar135._12_4_ =
                     auVar124._12_4_ * fStack_b14 +
                     auVar85._12_4_ * fStack_b34 +
                     auVar184._12_4_ * fStack_b44 + auVar158._12_4_ * fStack_b24;
                auVar184 = vblendps_avx(auVar89,_DAT_01f45a50,0xe);
                auVar158 = vrsqrtss_avx(auVar184,auVar184);
                fVar222 = auVar158._0_4_;
                fVar251 = auVar89._0_4_;
                auVar158 = vdpps_avx(auVar271,auVar135,0x7f);
                auVar85 = vshufps_avx(auVar89,auVar89,0);
                auVar136._0_4_ = auVar135._0_4_ * auVar85._0_4_;
                auVar136._4_4_ = auVar135._4_4_ * auVar85._4_4_;
                auVar136._8_4_ = auVar135._8_4_ * auVar85._8_4_;
                auVar136._12_4_ = auVar135._12_4_ * auVar85._12_4_;
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar207._0_4_ = auVar271._0_4_ * auVar158._0_4_;
                auVar207._4_4_ = auVar271._4_4_ * auVar158._4_4_;
                auVar207._8_4_ = auVar271._8_4_ * auVar158._8_4_;
                auVar207._12_4_ = auVar271._12_4_ * auVar158._12_4_;
                auVar124 = vsubps_avx(auVar136,auVar207);
                auVar158 = vrcpss_avx(auVar184,auVar184);
                auVar184 = vmaxss_avx(ZEXT416((uint)local_ac0._0_4_),
                                      ZEXT416((uint)(auVar317._0_4_ * (float)local_900._0_4_)));
                auVar158 = ZEXT416((uint)(auVar158._0_4_ * (2.0 - fVar251 * auVar158._0_4_)));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                uVar77 = CONCAT44(auVar271._4_4_,auVar271._0_4_);
                auVar318._0_8_ = uVar77 ^ 0x8000000080000000;
                auVar318._8_4_ = -auVar271._8_4_;
                auVar318._12_4_ = -auVar271._12_4_;
                auVar85 = ZEXT416((uint)(fVar222 * 1.5 +
                                        fVar251 * -0.5 * fVar222 * fVar222 * fVar222));
                auVar85 = vshufps_avx(auVar85,auVar85,0);
                auVar187._0_4_ = auVar85._0_4_ * auVar124._0_4_ * auVar158._0_4_;
                auVar187._4_4_ = auVar85._4_4_ * auVar124._4_4_ * auVar158._4_4_;
                auVar187._8_4_ = auVar85._8_4_ * auVar124._8_4_ * auVar158._8_4_;
                auVar187._12_4_ = auVar85._12_4_ * auVar124._12_4_ * auVar158._12_4_;
                local_a80._0_4_ = auVar271._0_4_ * auVar85._0_4_;
                local_a80._4_4_ = auVar271._4_4_ * auVar85._4_4_;
                local_a80._8_4_ = auVar271._8_4_ * auVar85._8_4_;
                local_a80._12_4_ = auVar271._12_4_ * auVar85._12_4_;
                if (fVar251 < 0.0) {
                  local_a60._0_4_ = fVar221;
                  local_a00._0_16_ = auVar187;
                  fVar251 = sqrtf(fVar251);
                  auVar187 = local_a00._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar89,auVar89);
                  fVar251 = auVar89._0_4_;
                  local_a60._0_4_ = fVar221;
                }
                auVar89 = vdpps_avx(_local_ae0,local_a80._0_16_,0x7f);
                fVar221 = ((float)local_ac0._0_4_ / fVar251) * ((float)local_a60._0_4_ + 1.0) +
                          auVar184._0_4_ + (float)local_a60._0_4_ * (float)local_ac0._0_4_;
                auVar158 = vdpps_avx(auVar318,local_a80._0_16_,0x7f);
                auVar85 = vdpps_avx(_local_ae0,auVar187,0x7f);
                auVar124 = vdpps_avx(_local_9b0,local_a80._0_16_,0x7f);
                auVar125 = vdpps_avx(_local_ae0,auVar318,0x7f);
                fVar251 = auVar158._0_4_ + auVar85._0_4_;
                fVar222 = auVar89._0_4_;
                auVar94._0_4_ = fVar222 * fVar222;
                auVar94._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                auVar94._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                auVar94._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                auVar85 = vsubps_avx(auVar181,auVar94);
                local_a80._0_16_ = ZEXT416((uint)fVar251);
                auVar158 = vdpps_avx(_local_ae0,_local_9b0,0x7f);
                fVar253 = auVar125._0_4_ - fVar222 * fVar251;
                local_a60._0_16_ = auVar89;
                fVar222 = auVar158._0_4_ - fVar222 * auVar124._0_4_;
                auVar89 = vrsqrtss_avx(auVar85,auVar85);
                fVar223 = auVar85._0_4_;
                fVar251 = auVar89._0_4_;
                fVar251 = fVar251 * 1.5 + fVar223 * -0.5 * fVar251 * fVar251 * fVar251;
                if (fVar223 < 0.0) {
                  local_a00._0_16_ = auVar124;
                  local_980._0_4_ = fVar253;
                  local_9a0._0_4_ = fVar222;
                  local_7a0._0_4_ = fVar251;
                  fVar223 = sqrtf(fVar223);
                  fVar251 = (float)local_7a0._0_4_;
                  fVar253 = (float)local_980._0_4_;
                  fVar222 = (float)local_9a0._0_4_;
                  auVar124 = local_a00._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar85,auVar85);
                  fVar223 = auVar89._0_4_;
                }
                auVar335 = ZEXT3264(local_9e0);
                auVar361 = ZEXT3264(local_aa0);
                auVar95 = vpermilps_avx(local_940._0_16_,0xff);
                auVar125 = vshufps_avx(auVar271,auVar271,0xff);
                fVar253 = fVar253 * fVar251 - auVar125._0_4_;
                auVar208._0_8_ = auVar124._0_8_ ^ 0x8000000080000000;
                auVar208._8_4_ = auVar124._8_4_ ^ 0x80000000;
                auVar208._12_4_ = auVar124._12_4_ ^ 0x80000000;
                auVar237._0_4_ = -fVar253;
                auVar237._4_4_ = 0x80000000;
                auVar237._8_4_ = 0x80000000;
                auVar237._12_4_ = 0x80000000;
                auVar89 = vinsertps_avx(auVar237,ZEXT416((uint)(fVar222 * fVar251)),0x1c);
                auVar85 = vmovsldup_avx(ZEXT416((uint)(local_a80._0_4_ * fVar222 * fVar251 -
                                                      auVar124._0_4_ * fVar253)));
                auVar89 = vdivps_avx(auVar89,auVar85);
                auVar158 = vinsertps_avx(local_a80._0_16_,auVar208,0x10);
                auVar158 = vdivps_avx(auVar158,auVar85);
                auVar85 = vmovsldup_avx(local_a60._0_16_);
                auVar95 = ZEXT416((uint)(fVar223 - auVar95._0_4_));
                auVar124 = vmovsldup_avx(auVar95);
                auVar161._0_4_ = auVar85._0_4_ * auVar89._0_4_ + auVar124._0_4_ * auVar158._0_4_;
                auVar161._4_4_ = auVar85._4_4_ * auVar89._4_4_ + auVar124._4_4_ * auVar158._4_4_;
                auVar161._8_4_ = auVar85._8_4_ * auVar89._8_4_ + auVar124._8_4_ * auVar158._8_4_;
                auVar161._12_4_ =
                     auVar85._12_4_ * auVar89._12_4_ + auVar124._12_4_ * auVar158._12_4_;
                auVar89 = vsubps_avx(auVar269,auVar161);
                auVar317 = ZEXT1664(auVar89);
                auVar162._8_4_ = 0x7fffffff;
                auVar162._0_8_ = 0x7fffffff7fffffff;
                auVar162._12_4_ = 0x7fffffff;
                auVar269 = vandps_avx(local_a60._0_16_,auVar162);
                auVar280 = ZEXT3264(local_960);
              } while (fVar221 <= auVar269._0_4_);
              auVar188._8_4_ = 0x7fffffff;
              auVar188._0_8_ = 0x7fffffff7fffffff;
              auVar188._12_4_ = 0x7fffffff;
              auVar269 = vandps_avx(auVar95,auVar188);
            } while ((float)local_7c0._0_4_ * 1.9073486e-06 + auVar184._0_4_ + fVar221 <=
                     auVar269._0_4_);
            fVar221 = auVar89._0_4_ + (float)local_8d0._0_4_;
            if ((fVar200 <= fVar221) &&
               (fVar251 = *(float *)(ray + k * 4 + 0x80), fVar221 <= fVar251)) {
              auVar269 = vmovshdup_avx(auVar89);
              fVar222 = auVar269._0_4_;
              if ((0.0 <= fVar222) && (fVar222 <= 1.0)) {
                auVar181 = vrsqrtss_avx(auVar181,auVar181);
                fVar253 = auVar181._0_4_;
                pGVar7 = (context->scene->geometries).items[uVar79].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar181 = ZEXT416((uint)(fVar253 * 1.5 +
                                           fVar231 * -0.5 * fVar253 * fVar253 * fVar253));
                  auVar181 = vshufps_avx(auVar181,auVar181,0);
                  auVar189._0_4_ = auVar181._0_4_ * (float)local_ae0._0_4_;
                  auVar189._4_4_ = auVar181._4_4_ * (float)local_ae0._4_4_;
                  auVar189._8_4_ = auVar181._8_4_ * fStack_ad8;
                  auVar189._12_4_ = auVar181._12_4_ * fStack_ad4;
                  auVar137._0_4_ = auVar271._0_4_ + auVar125._0_4_ * auVar189._0_4_;
                  auVar137._4_4_ = auVar271._4_4_ + auVar125._4_4_ * auVar189._4_4_;
                  auVar137._8_4_ = auVar271._8_4_ + auVar125._8_4_ * auVar189._8_4_;
                  auVar137._12_4_ = auVar271._12_4_ + auVar125._12_4_ * auVar189._12_4_;
                  auVar181 = vshufps_avx(auVar189,auVar189,0xc9);
                  auVar269 = vshufps_avx(auVar271,auVar271,0xc9);
                  auVar190._0_4_ = auVar269._0_4_ * auVar189._0_4_;
                  auVar190._4_4_ = auVar269._4_4_ * auVar189._4_4_;
                  auVar190._8_4_ = auVar269._8_4_ * auVar189._8_4_;
                  auVar190._12_4_ = auVar269._12_4_ * auVar189._12_4_;
                  auVar209._0_4_ = auVar271._0_4_ * auVar181._0_4_;
                  auVar209._4_4_ = auVar271._4_4_ * auVar181._4_4_;
                  auVar209._8_4_ = auVar271._8_4_ * auVar181._8_4_;
                  auVar209._12_4_ = auVar271._12_4_ * auVar181._12_4_;
                  auVar184 = vsubps_avx(auVar209,auVar190);
                  auVar181 = vshufps_avx(auVar184,auVar184,0xc9);
                  auVar269 = vshufps_avx(auVar137,auVar137,0xc9);
                  auVar210._0_4_ = auVar269._0_4_ * auVar181._0_4_;
                  auVar210._4_4_ = auVar269._4_4_ * auVar181._4_4_;
                  auVar210._8_4_ = auVar269._8_4_ * auVar181._8_4_;
                  auVar210._12_4_ = auVar269._12_4_ * auVar181._12_4_;
                  auVar181 = vshufps_avx(auVar184,auVar184,0xd2);
                  auVar138._0_4_ = auVar137._0_4_ * auVar181._0_4_;
                  auVar138._4_4_ = auVar137._4_4_ * auVar181._4_4_;
                  auVar138._8_4_ = auVar137._8_4_ * auVar181._8_4_;
                  auVar138._12_4_ = auVar137._12_4_ * auVar181._12_4_;
                  auVar181 = vsubps_avx(auVar210,auVar138);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar221;
                    uVar80 = vextractps_avx(auVar181,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar80;
                    uVar80 = vextractps_avx(auVar181,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar80;
                    *(int *)(ray + k * 4 + 0xe0) = auVar181._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar222;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_8a0;
                    *(uint *)(ray + k * 4 + 0x120) = uVar79;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_730 = vshufps_avx(auVar89,auVar89,0x55);
                    auVar269 = vshufps_avx(auVar181,auVar181,0x55);
                    auStack_750 = vshufps_avx(auVar181,auVar181,0xaa);
                    local_740 = vshufps_avx(auVar181,auVar181,0);
                    local_760 = (RTCHitN  [16])auVar269;
                    local_720 = ZEXT816(0) << 0x20;
                    local_710 = local_780._0_8_;
                    uStack_708 = local_780._8_8_;
                    local_700 = local_770;
                    vcmpps_avx(ZEXT1632(local_770),ZEXT1632(local_770),0xf);
                    uStack_6ec = context->user->instID[0];
                    local_6f0 = uStack_6ec;
                    uStack_6e8 = uStack_6ec;
                    uStack_6e4 = uStack_6ec;
                    uVar81 = context->user->instPrimID[0];
                    auVar139._4_4_ = uVar81;
                    auVar139._0_4_ = uVar81;
                    auVar139._8_4_ = uVar81;
                    auVar139._12_4_ = uVar81;
                    auStack_6e0 = auVar139;
                    *(float *)(ray + k * 4 + 0x80) = fVar221;
                    local_8c0 = *local_a28;
                    local_b10.valid = (int *)local_8c0;
                    local_b10.geometryUserPtr = pGVar7->userPtr;
                    local_b10.context = context->user;
                    local_b10.hit = local_760;
                    local_b10.N = 4;
                    local_b10.ray = (RTCRayN *)ray;
                    if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar7->intersectionFilterN)(&local_b10);
                      auVar317._8_56_ = extraout_var_00;
                      auVar317._0_8_ = extraout_XMM1_Qa_00;
                      auVar139 = auVar317._0_16_;
                      auVar280 = ZEXT3264(local_960);
                      auVar361 = ZEXT3264(local_aa0);
                      auVar335 = ZEXT3264(local_9e0);
                    }
                    if (local_8c0 == (undefined1  [16])0x0) {
                      auVar181 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar269 = vpcmpeqd_avx(auVar139,auVar139);
                      auVar181 = auVar181 ^ auVar269;
                    }
                    else {
                      p_Var9 = context->args->filter;
                      auVar269 = vpcmpeqd_avx(auVar269,auVar269);
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var9)(&local_b10);
                        auVar280 = ZEXT3264(local_960);
                        auVar361 = ZEXT3264(local_aa0);
                        auVar335 = ZEXT3264(local_9e0);
                        auVar269 = vpcmpeqd_avx(auVar269,auVar269);
                      }
                      auVar184 = vpcmpeqd_avx(local_8c0,_DAT_01f45a50);
                      auVar181 = auVar184 ^ auVar269;
                      if (local_8c0 != (undefined1  [16])0x0) {
                        auVar184 = auVar184 ^ auVar269;
                        auVar269 = vmaskmovps_avx(auVar184,*(undefined1 (*) [16])local_b10.hit);
                        *(undefined1 (*) [16])(local_b10.ray + 0xc0) = auVar269;
                        auVar269 = vmaskmovps_avx(auVar184,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x10));
                        *(undefined1 (*) [16])(local_b10.ray + 0xd0) = auVar269;
                        auVar269 = vmaskmovps_avx(auVar184,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x20));
                        *(undefined1 (*) [16])(local_b10.ray + 0xe0) = auVar269;
                        auVar269 = vmaskmovps_avx(auVar184,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x30));
                        *(undefined1 (*) [16])(local_b10.ray + 0xf0) = auVar269;
                        auVar269 = vmaskmovps_avx(auVar184,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x40));
                        *(undefined1 (*) [16])(local_b10.ray + 0x100) = auVar269;
                        auVar269 = vmaskmovps_avx(auVar184,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x50));
                        *(undefined1 (*) [16])(local_b10.ray + 0x110) = auVar269;
                        auVar269 = vmaskmovps_avx(auVar184,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x60));
                        *(undefined1 (*) [16])(local_b10.ray + 0x120) = auVar269;
                        auVar269 = vmaskmovps_avx(auVar184,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x70));
                        *(undefined1 (*) [16])(local_b10.ray + 0x130) = auVar269;
                        auVar269 = vmaskmovps_avx(auVar184,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x80));
                        *(undefined1 (*) [16])(local_b10.ray + 0x140) = auVar269;
                      }
                    }
                    auVar96._8_8_ = 0x100000001;
                    auVar96._0_8_ = 0x100000001;
                    if ((auVar96 & auVar181) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar251;
                    }
                  }
                }
              }
            }
LAB_009d7099:
            uVar80 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar323._4_4_ = uVar80;
            auVar323._0_4_ = uVar80;
            auVar323._8_4_ = uVar80;
            auVar323._12_4_ = uVar80;
            auVar323._16_4_ = uVar80;
            auVar323._20_4_ = uVar80;
            auVar323._24_4_ = uVar80;
            auVar323._28_4_ = uVar80;
            auVar317 = ZEXT3264(auVar323);
            auVar97 = vcmpps_avx(_local_7e0,auVar323,2);
          }
          auVar97 = vandps_avx(local_620,local_600);
          auVar108 = vandps_avx(local_840,_local_800);
          auVar169._0_4_ = (float)local_880._0_4_ + local_4c0._0_4_;
          auVar169._4_4_ = (float)local_880._4_4_ + local_4c0._4_4_;
          auVar169._8_4_ = fStack_878 + local_4c0._8_4_;
          auVar169._12_4_ = fStack_874 + local_4c0._12_4_;
          auVar169._16_4_ = fStack_870 + local_4c0._16_4_;
          auVar169._20_4_ = fStack_86c + local_4c0._20_4_;
          auVar169._24_4_ = fStack_868 + local_4c0._24_4_;
          auVar169._28_4_ = fStack_864 + local_4c0._28_4_;
          auVar181 = vshufps_avx(auVar317._0_16_,auVar317._0_16_,0);
          auVar220._16_16_ = auVar181;
          auVar220._0_16_ = auVar181;
          auVar10 = vcmpps_avx(auVar169,auVar220,2);
          auVar97 = vandps_avx(auVar10,auVar97);
          auVar249._0_4_ = (float)local_880._0_4_ + local_480._0_4_;
          auVar249._4_4_ = (float)local_880._4_4_ + local_480._4_4_;
          auVar249._8_4_ = fStack_878 + local_480._8_4_;
          auVar249._12_4_ = fStack_874 + local_480._12_4_;
          auVar249._16_4_ = fStack_870 + local_480._16_4_;
          auVar249._20_4_ = fStack_86c + local_480._20_4_;
          auVar249._24_4_ = fStack_868 + local_480._24_4_;
          auVar249._28_4_ = fStack_864 + local_480._28_4_;
          auVar10 = vcmpps_avx(auVar249,auVar220,2);
          auVar108 = vandps_avx(auVar10,auVar108);
          auVar108 = vorps_avx(auVar97,auVar108);
          if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar108 >> 0x7f,0) != '\0') ||
                (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar108 >> 0xbf,0) != '\0') ||
              (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar108[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar75 * 0x60) = auVar108;
            auVar97 = vblendvps_avx(_local_480,_local_4c0,auVar97);
            *(undefined1 (*) [32])(auStack_160 + uVar75 * 0x60) = auVar97;
            uVar77 = vmovlps_avx(local_5d0);
            (&uStack_140)[uVar75 * 0xc] = uVar77;
            auStack_138[uVar75 * 0x18] = local_c68 + 1;
            uVar75 = (ulong)((int)uVar75 + 1);
          }
          auVar317 = ZEXT3264(auVar361._0_32_);
          auVar361 = ZEXT3264(local_820);
          fVar231 = (float)local_880._0_4_;
          fVar368 = (float)local_880._4_4_;
          fVar171 = fStack_878;
          fVar172 = fStack_874;
          fVar173 = fStack_870;
          fVar174 = fStack_86c;
          fVar175 = fStack_868;
          fVar266 = fStack_864;
          goto LAB_009d5b00;
        }
      }
      auVar361 = ZEXT3264(local_820);
      auVar335 = ZEXT3264(local_9e0);
      auVar317 = ZEXT3264(local_aa0);
      auVar280 = ZEXT3264(local_960);
    }
LAB_009d5b00:
    while( true ) {
      auVar275 = local_560;
      uVar81 = (uint)uVar75;
      if (uVar81 == 0) {
        uVar80 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar113._4_4_ = uVar80;
        auVar113._0_4_ = uVar80;
        auVar113._8_4_ = uVar80;
        auVar113._12_4_ = uVar80;
        auVar113._16_4_ = uVar80;
        auVar113._20_4_ = uVar80;
        auVar113._24_4_ = uVar80;
        auVar113._28_4_ = uVar80;
        auVar97 = vcmpps_avx(local_3e0,auVar113,2);
        uVar79 = vmovmskps_avx(auVar97);
        uVar74 = (ulong)((uint)uVar74 - 1 & (uint)uVar74 & uVar79);
        goto LAB_009d4a1b;
      }
      uVar75 = (ulong)(uVar81 - 1);
      lVar76 = uVar75 * 0x60;
      auVar97 = *(undefined1 (*) [32])(auStack_160 + lVar76);
      auVar107._0_4_ = fVar231 + auVar97._0_4_;
      auVar107._4_4_ = fVar368 + auVar97._4_4_;
      auVar107._8_4_ = fVar171 + auVar97._8_4_;
      auVar107._12_4_ = fVar172 + auVar97._12_4_;
      auVar107._16_4_ = fVar173 + auVar97._16_4_;
      auVar107._20_4_ = fVar174 + auVar97._20_4_;
      auVar107._24_4_ = fVar175 + auVar97._24_4_;
      auVar107._28_4_ = fVar266 + auVar97._28_4_;
      uVar80 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar198._4_4_ = uVar80;
      auVar198._0_4_ = uVar80;
      auVar198._8_4_ = uVar80;
      auVar198._12_4_ = uVar80;
      auVar198._16_4_ = uVar80;
      auVar198._20_4_ = uVar80;
      auVar198._24_4_ = uVar80;
      auVar198._28_4_ = uVar80;
      auVar10 = vcmpps_avx(auVar107,auVar198,2);
      auVar108 = vandps_avx(auVar10,*(undefined1 (*) [32])(auStack_180 + lVar76));
      _local_760 = auVar108;
      auVar10 = *(undefined1 (*) [32])(auStack_180 + lVar76) & auVar10;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') break;
      uVar75 = (ulong)(uVar81 - 1);
    }
    auVar167._8_4_ = 0x7f800000;
    auVar167._0_8_ = 0x7f8000007f800000;
    auVar167._12_4_ = 0x7f800000;
    auVar167._16_4_ = 0x7f800000;
    auVar167._20_4_ = 0x7f800000;
    auVar167._24_4_ = 0x7f800000;
    auVar167._28_4_ = 0x7f800000;
    auVar97 = vblendvps_avx(auVar167,auVar97,auVar108);
    auVar10 = vshufps_avx(auVar97,auVar97,0xb1);
    auVar10 = vminps_avx(auVar97,auVar10);
    auVar11 = vshufpd_avx(auVar10,auVar10,5);
    auVar10 = vminps_avx(auVar10,auVar11);
    auVar11 = vperm2f128_avx(auVar10,auVar10,1);
    auVar10 = vminps_avx(auVar10,auVar11);
    auVar97 = vcmpps_avx(auVar97,auVar10,0);
    auVar10 = auVar108 & auVar97;
    if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0x7f,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar10 >> 0xbf,0) != '\0') ||
        (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar10[0x1f] < '\0')
    {
      auVar108 = vandps_avx(auVar97,auVar108);
    }
    auVar127._8_8_ = 0;
    auVar127._0_8_ = (&uStack_140)[uVar75 * 0xc];
    local_c68 = auStack_138[uVar75 * 0x18];
    uVar78 = vmovmskps_avx(auVar108);
    uVar73 = 0;
    if (uVar78 != 0) {
      for (; (uVar78 >> uVar73 & 1) == 0; uVar73 = uVar73 + 1) {
      }
    }
    *(undefined4 *)(local_760 + (ulong)uVar73 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar76) = _local_760;
    uVar78 = uVar81 - 1;
    if ((((((((_local_760 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_760 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_760 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_760 >> 0x7f,0) != '\0') ||
          (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_760 >> 0xbf,0) != '\0') ||
        (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_760[0x1f] < '\0') {
      uVar78 = uVar81;
    }
    auVar181 = vshufps_avx(auVar127,auVar127,0);
    auVar269 = vshufps_avx(auVar127,auVar127,0x55);
    auVar269 = vsubps_avx(auVar269,auVar181);
    local_4c0._4_4_ = auVar181._4_4_ + auVar269._4_4_ * 0.14285715;
    local_4c0._0_4_ = auVar181._0_4_ + auVar269._0_4_ * 0.0;
    fStack_4b8 = auVar181._8_4_ + auVar269._8_4_ * 0.2857143;
    fStack_4b4 = auVar181._12_4_ + auVar269._12_4_ * 0.42857146;
    fStack_4b0 = auVar181._0_4_ + auVar269._0_4_ * 0.5714286;
    fStack_4ac = auVar181._4_4_ + auVar269._4_4_ * 0.71428573;
    fStack_4a8 = auVar181._8_4_ + auVar269._8_4_ * 0.8571429;
    fStack_4a4 = auVar181._12_4_ + auVar269._12_4_;
    local_5d0._8_8_ = 0;
    local_5d0._0_8_ = *(ulong *)(local_4c0 + (ulong)uVar73 * 4);
    uVar75 = (ulong)uVar78;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }